

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_fp16s.h
# Opt level: O0

void ncnn::innerproduct_transform_kernel_fp16s_sse
               (Mat *weight_data,Mat *weight_data_tm,int num_input,int num_output,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 *puVar14;
  unsigned_short uVar15;
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  long in_R8;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  Mat weight_data_r2_3;
  __m128i _r23_fp16;
  __m128i _r01_fp16;
  __m256 _r23;
  __m256 _r01;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  __m128 _r3_4;
  __m128 _r2_4;
  __m128 _r1_4;
  __m128 _r0_4;
  int p_2;
  float *k3_2;
  float *k2_2;
  float *k1_2;
  float *k0_2;
  unsigned_short *g0_2;
  int q_2;
  Mat weight_data_r2_2;
  __m128i _tmpf_1;
  __m128i _tmpe_1;
  __m128i _tmpd_1;
  __m128i _tmpc_1;
  __m128i _tmpb_1;
  __m128i _tmpa_1;
  __m128i _tmp9_1;
  __m128i _tmp8_1;
  __m128i _tmp7_3;
  __m128i _tmp6_3;
  __m128i _tmp5_3;
  __m128i _tmp4_3;
  __m128i _tmp3_3;
  __m128i _tmp2_3;
  __m128i _tmp1_3;
  __m128i _tmp0_3;
  __m128i _r7_3;
  __m128i _r6_3;
  __m128i _r5_3;
  __m128i _r4_3;
  __m128i _r3_3;
  __m128i _r2_3;
  __m128i _r1_3;
  __m128i _r0_3;
  __m256i _tmpn_2;
  __m256i _tmpm_2;
  __m256i _tmpl_2;
  __m256i _tmpk_2;
  __m256i _tmpj_2;
  __m256i _tmpi_2;
  __m256i _tmph_2;
  __m256i _tmpg_2;
  __m256i _tmp7_2;
  __m256i _tmp6_2;
  __m256i _tmp5_2;
  __m256i _tmp4_2;
  __m256i _tmp3_2;
  __m256i _tmp2_2;
  __m256i _tmp1_2;
  __m256i _tmp0_2;
  __m256i _r7_2;
  __m256i _r6_2;
  __m256i _r5_2;
  __m256i _r4_2;
  __m256i _r3_2;
  __m256i _r2_2;
  __m256i _r1_2;
  __m256i _r0_2;
  int p_1;
  float *k7_1;
  float *k6_1;
  float *k5_1;
  float *k4_1;
  float *k3_1;
  float *k2_1;
  float *k1_1;
  float *k0_1;
  unsigned_short *g0_1;
  int q_1;
  Mat weight_data_r2_1;
  __m256i _tmpn_1;
  __m256i _tmpm_1;
  __m256i _tmpl_1;
  __m256i _tmpk_1;
  __m256i _tmpj_1;
  __m256i _tmpi_1;
  __m256i _tmph_1;
  __m256i _tmpg_1;
  __m256i _tmp7_1;
  __m256i _tmp6_1;
  __m256i _tmp5_1;
  __m256i _tmp4_1;
  __m256i _tmp3_1;
  __m256i _tmp2_1;
  __m256i _tmp1_1;
  __m256i _tmp0_1;
  __m256i _r7f;
  __m256i _r6e;
  __m256i _r5d;
  __m256i _r4c;
  __m256i _r3b;
  __m256i _r2a;
  __m256i _r19;
  __m256i _r08;
  __m128i _rf_1;
  __m128i _re_1;
  __m128i _rd_1;
  __m128i _rc_1;
  __m128i _rb_1;
  __m128i _ra_1;
  __m128i _r9_1;
  __m128i _r8_1;
  __m128i _r7_1;
  __m128i _r6_1;
  __m128i _r5_1;
  __m128i _r4_1;
  __m128i _r3_1;
  __m128i _r2_1;
  __m128i _r1_1;
  __m128i _r0_1;
  __m256i _tmpv;
  __m256i _tmpu;
  __m256i _tmpt;
  __m256i _tmps;
  __m256i _tmpr;
  __m256i _tmpq;
  __m256i _tmpp;
  __m256i _tmpo;
  __m256i _tmpn;
  __m256i _tmpm;
  __m256i _tmpl;
  __m256i _tmpk;
  __m256i _tmpj;
  __m256i _tmpi;
  __m256i _tmph;
  __m256i _tmpg;
  __m256i _tmpf;
  __m256i _tmpe;
  __m256i _tmpd;
  __m256i _tmpc;
  __m256i _tmpb;
  __m256i _tmpa;
  __m256i _tmp9;
  __m256i _tmp8;
  __m256i _tmp7;
  __m256i _tmp6;
  __m256i _tmp5;
  __m256i _tmp4;
  __m256i _tmp3;
  __m256i _tmp2;
  __m256i _tmp1;
  __m256i _tmp0;
  __m256i _rf;
  __m256i _re;
  __m256i _rd;
  __m256i _rc;
  __m256i _rb;
  __m256i _ra;
  __m256i _r9;
  __m256i _r8;
  __m256i _r7;
  __m256i _r6;
  __m256i _r5;
  __m256i _r4;
  __m256i _r3;
  __m256i _r2;
  __m256i _r1;
  __m256i _r0;
  int p;
  float *kf;
  float *ke;
  float *kd;
  float *kc;
  float *kb;
  float *ka;
  float *k9;
  float *k8;
  float *k7;
  float *k6;
  float *k5;
  float *k4;
  float *k3;
  float *k2;
  float *k1;
  float *k0;
  unsigned_short *g0;
  int q;
  Mat weight_data_r2;
  int out_elempack;
  Allocator *in_stack_ffffffffffffad98;
  void **ppvVar35;
  undefined8 in_stack_ffffffffffffada0;
  int _elempack;
  size_t in_stack_ffffffffffffada8;
  int in_stack_ffffffffffffadb0;
  int in_stack_ffffffffffffadb4;
  Mat *in_stack_ffffffffffffadb8;
  Mat *in_stack_ffffffffffffadc0;
  Mat *in_stack_ffffffffffffadc8;
  Allocator *in_stack_ffffffffffffae00;
  unsigned_short *in_stack_ffffffffffffae08;
  Mat *in_stack_ffffffffffffae10;
  undefined8 local_51d0;
  undefined8 uStack_51c8;
  undefined8 local_51c0;
  undefined8 uStack_51b8;
  undefined8 local_51b0;
  undefined8 uStack_51a8;
  undefined8 local_51a0;
  undefined8 uStack_5198;
  undefined8 local_5190;
  undefined8 uStack_5188;
  undefined8 local_5180;
  undefined8 uStack_5178;
  undefined8 local_5170;
  undefined8 uStack_5168;
  undefined8 local_5160;
  undefined8 uStack_5158;
  undefined8 local_5150;
  undefined8 uStack_5148;
  undefined8 local_5140;
  undefined8 uStack_5138;
  undefined8 local_5130;
  undefined8 uStack_5128;
  undefined8 local_5120;
  undefined8 uStack_5118;
  undefined8 local_5110;
  undefined8 uStack_5108;
  undefined8 local_5100;
  undefined8 uStack_50f8;
  undefined8 local_50f0;
  undefined8 uStack_50e8;
  undefined8 local_50e0;
  undefined8 uStack_50d8;
  undefined8 local_50d0;
  undefined8 uStack_50c8;
  undefined8 local_50c0;
  undefined8 uStack_50b8;
  undefined8 local_50b0;
  undefined8 uStack_50a8;
  undefined8 local_50a0;
  undefined8 uStack_5098;
  undefined8 local_5090;
  undefined8 uStack_5088;
  undefined8 local_5080;
  undefined8 uStack_5078;
  undefined8 local_5070;
  undefined8 uStack_5068;
  undefined8 local_5060;
  undefined8 uStack_5058;
  undefined8 local_5040;
  undefined8 uStack_5038;
  undefined8 uStack_5030;
  undefined8 uStack_5028;
  undefined8 local_5020;
  undefined8 uStack_5018;
  undefined8 uStack_5010;
  undefined8 uStack_5008;
  undefined8 local_5000;
  undefined8 uStack_4ff8;
  undefined8 uStack_4ff0;
  undefined8 uStack_4fe8;
  undefined8 local_4fe0;
  undefined8 uStack_4fd8;
  undefined8 uStack_4fd0;
  undefined8 uStack_4fc8;
  undefined8 local_4fc0;
  undefined8 uStack_4fb8;
  undefined8 uStack_4fb0;
  undefined8 uStack_4fa8;
  undefined8 local_4fa0;
  undefined8 uStack_4f98;
  undefined8 uStack_4f90;
  undefined8 uStack_4f88;
  undefined8 local_4f80;
  undefined8 uStack_4f78;
  undefined8 uStack_4f70;
  undefined8 uStack_4f68;
  undefined8 local_4f60;
  undefined8 uStack_4f58;
  undefined8 uStack_4f50;
  undefined8 uStack_4f48;
  undefined8 local_4f40;
  undefined8 uStack_4f38;
  undefined8 uStack_4f30;
  undefined8 uStack_4f28;
  undefined8 local_4f20;
  undefined8 uStack_4f18;
  undefined8 uStack_4f10;
  undefined8 uStack_4f08;
  undefined8 local_4f00;
  undefined8 uStack_4ef8;
  undefined8 uStack_4ef0;
  undefined8 uStack_4ee8;
  undefined8 local_4ee0;
  undefined8 uStack_4ed8;
  undefined8 uStack_4ed0;
  undefined8 uStack_4ec8;
  undefined8 local_4ec0;
  undefined8 uStack_4eb8;
  undefined8 uStack_4eb0;
  undefined8 uStack_4ea8;
  undefined8 local_4ea0;
  undefined8 uStack_4e98;
  undefined8 uStack_4e90;
  undefined8 uStack_4e88;
  undefined8 local_4e80;
  undefined8 uStack_4e78;
  undefined8 uStack_4e70;
  undefined8 uStack_4e68;
  undefined8 local_4e60;
  undefined8 uStack_4e58;
  undefined8 uStack_4e50;
  undefined8 uStack_4e48;
  undefined8 local_4e40;
  undefined8 uStack_4e38;
  undefined8 uStack_4e30;
  undefined8 uStack_4e28;
  undefined8 local_4e20;
  undefined8 uStack_4e18;
  undefined8 uStack_4e10;
  undefined8 uStack_4e08;
  undefined8 local_4e00;
  undefined8 uStack_4df8;
  undefined8 uStack_4df0;
  undefined8 uStack_4de8;
  undefined8 local_4de0;
  undefined8 uStack_4dd8;
  undefined8 uStack_4dd0;
  undefined8 uStack_4dc8;
  undefined8 local_4dc0;
  undefined8 uStack_4db8;
  undefined8 uStack_4db0;
  undefined8 uStack_4da8;
  undefined8 local_4da0;
  undefined8 uStack_4d98;
  undefined8 uStack_4d90;
  undefined8 uStack_4d88;
  undefined8 local_4d80;
  undefined8 uStack_4d78;
  undefined8 uStack_4d70;
  undefined8 uStack_4d68;
  undefined8 local_4d60;
  undefined8 uStack_4d58;
  undefined8 uStack_4d50;
  undefined8 uStack_4d48;
  undefined8 local_4ae0;
  undefined8 uStack_4ac8;
  undefined8 uStack_4aa8;
  undefined8 uStack_4a88;
  undefined8 uStack_4a68;
  undefined8 uStack_4a48;
  undefined8 uStack_4a28;
  undefined8 uStack_4a08;
  undefined8 uStack_49e8;
  undefined8 local_49e0;
  undefined8 uStack_49d8;
  undefined8 uStack_49d0;
  undefined8 uStack_49c8;
  undefined8 local_49c0;
  undefined8 uStack_49b8;
  undefined8 uStack_49b0;
  undefined8 uStack_49a8;
  undefined8 local_49a0;
  undefined8 uStack_4998;
  undefined8 uStack_4990;
  undefined8 uStack_4988;
  undefined8 local_4980;
  undefined8 uStack_4978;
  undefined8 uStack_4970;
  undefined8 uStack_4968;
  undefined8 local_4960;
  undefined8 uStack_4958;
  undefined8 uStack_4950;
  undefined8 uStack_4948;
  undefined8 local_4940;
  undefined8 uStack_4938;
  undefined8 uStack_4930;
  undefined8 uStack_4928;
  undefined8 local_4920;
  undefined8 uStack_4918;
  undefined8 uStack_4910;
  undefined8 uStack_4908;
  undefined8 local_4900;
  undefined8 uStack_48f8;
  undefined8 uStack_48f0;
  undefined8 uStack_48e8;
  undefined8 local_48e0;
  undefined8 uStack_48d8;
  undefined8 uStack_48d0;
  undefined8 uStack_48c8;
  undefined8 local_48c0;
  undefined8 uStack_48b8;
  undefined8 uStack_48b0;
  undefined8 uStack_48a8;
  undefined8 local_48a0;
  undefined8 uStack_4898;
  undefined8 uStack_4890;
  undefined8 uStack_4888;
  undefined8 local_4880;
  undefined8 uStack_4878;
  undefined8 uStack_4870;
  undefined8 uStack_4868;
  undefined8 local_4860;
  undefined8 uStack_4858;
  undefined8 uStack_4850;
  undefined8 uStack_4848;
  undefined8 local_4840;
  undefined8 uStack_4838;
  undefined8 uStack_4830;
  undefined8 uStack_4828;
  undefined8 local_4820;
  undefined8 uStack_4818;
  undefined8 uStack_4810;
  undefined8 uStack_4808;
  undefined8 local_4800;
  undefined8 uStack_47f8;
  undefined8 uStack_47f0;
  undefined8 uStack_47e8;
  undefined8 local_46c0;
  undefined8 uStack_46b8;
  undefined8 uStack_46b0;
  undefined8 uStack_46a8;
  undefined8 local_46a0;
  undefined8 uStack_4698;
  undefined8 uStack_4690;
  undefined8 uStack_4688;
  undefined8 local_4680;
  undefined8 uStack_4678;
  undefined8 uStack_4670;
  undefined8 uStack_4668;
  undefined8 local_4660;
  undefined8 uStack_4658;
  undefined8 uStack_4650;
  undefined8 uStack_4648;
  undefined8 local_4640;
  undefined8 uStack_4638;
  undefined8 uStack_4630;
  undefined8 uStack_4628;
  undefined8 local_4620;
  undefined8 uStack_4618;
  undefined8 uStack_4610;
  undefined8 uStack_4608;
  undefined8 local_4600;
  undefined8 uStack_45f8;
  undefined8 uStack_45f0;
  undefined8 uStack_45e8;
  undefined8 local_45e0;
  undefined8 uStack_45d8;
  undefined8 uStack_45d0;
  undefined8 uStack_45c8;
  undefined8 local_45c0;
  undefined8 uStack_45b8;
  undefined8 uStack_45b0;
  undefined8 uStack_45a8;
  undefined8 local_45a0;
  undefined8 uStack_4598;
  undefined8 uStack_4590;
  undefined8 uStack_4588;
  undefined8 local_4580;
  undefined8 uStack_4578;
  undefined8 uStack_4570;
  undefined8 uStack_4568;
  undefined8 local_4560;
  undefined8 uStack_4558;
  undefined8 uStack_4550;
  undefined8 uStack_4548;
  undefined8 local_4540;
  undefined8 uStack_4538;
  undefined8 uStack_4530;
  undefined8 uStack_4528;
  undefined8 local_4520;
  undefined8 uStack_4518;
  undefined8 uStack_4510;
  undefined8 uStack_4508;
  undefined8 local_4500;
  undefined8 uStack_44f8;
  undefined8 uStack_44f0;
  undefined8 uStack_44e8;
  undefined8 local_44e0;
  undefined8 uStack_44d8;
  undefined8 uStack_44d0;
  undefined8 uStack_44c8;
  undefined8 local_44c0;
  undefined8 uStack_44b8;
  undefined8 uStack_44b0;
  undefined8 uStack_44a8;
  undefined8 local_44a0;
  undefined8 uStack_4498;
  undefined8 uStack_4490;
  undefined8 uStack_4488;
  undefined8 local_4480;
  undefined8 uStack_4478;
  undefined8 uStack_4470;
  undefined8 uStack_4468;
  undefined8 local_4460;
  undefined8 uStack_4458;
  undefined8 uStack_4450;
  undefined8 uStack_4448;
  undefined8 local_4440;
  undefined8 uStack_4438;
  undefined8 uStack_4430;
  undefined8 uStack_4428;
  undefined8 local_4420;
  undefined8 uStack_4418;
  undefined8 uStack_4410;
  undefined8 uStack_4408;
  undefined8 local_4400;
  undefined8 uStack_43f8;
  undefined8 uStack_43f0;
  undefined8 uStack_43e8;
  undefined8 local_43e0;
  undefined8 uStack_43d8;
  undefined8 uStack_43d0;
  undefined8 uStack_43c8;
  undefined8 local_43c0;
  undefined8 uStack_43b8;
  undefined8 uStack_43b0;
  undefined8 uStack_43a8;
  undefined8 local_43a0;
  undefined8 uStack_4398;
  undefined8 uStack_4390;
  undefined8 uStack_4388;
  undefined8 local_4380;
  undefined8 uStack_4378;
  undefined8 uStack_4370;
  undefined8 uStack_4368;
  undefined8 local_4360;
  undefined8 uStack_4358;
  undefined8 uStack_4350;
  undefined8 uStack_4348;
  undefined8 local_4340;
  undefined8 uStack_4338;
  undefined8 uStack_4330;
  undefined8 uStack_4328;
  undefined8 local_4320;
  undefined8 uStack_4318;
  undefined8 uStack_4310;
  undefined8 uStack_4308;
  undefined8 local_4300;
  undefined8 uStack_42f8;
  undefined8 uStack_42f0;
  undefined8 uStack_42e8;
  undefined8 local_42e0;
  undefined8 uStack_42d8;
  undefined8 uStack_42d0;
  undefined8 uStack_42c8;
  undefined8 local_42c0;
  undefined8 uStack_42b8;
  undefined8 uStack_42b0;
  undefined8 uStack_42a8;
  undefined8 local_42a0;
  undefined8 uStack_4298;
  undefined8 uStack_4290;
  undefined8 uStack_4288;
  undefined8 local_4280;
  undefined8 uStack_4278;
  undefined8 uStack_4270;
  undefined8 uStack_4268;
  undefined8 local_4260;
  undefined8 uStack_4258;
  undefined8 uStack_4250;
  undefined8 uStack_4248;
  undefined8 local_4240;
  undefined8 uStack_4238;
  undefined8 uStack_4230;
  undefined8 uStack_4228;
  undefined8 local_4220;
  undefined8 uStack_4218;
  undefined8 uStack_4210;
  undefined8 uStack_4208;
  undefined8 local_4200;
  undefined8 uStack_41f8;
  undefined8 uStack_41f0;
  undefined8 uStack_41e8;
  undefined8 local_41e0;
  undefined8 uStack_41d8;
  undefined8 uStack_41d0;
  undefined8 uStack_41c8;
  undefined8 local_41c0;
  undefined8 uStack_41b8;
  undefined8 uStack_41b0;
  undefined8 uStack_41a8;
  undefined8 local_41a0;
  undefined8 uStack_4198;
  undefined8 uStack_4190;
  undefined8 uStack_4188;
  undefined8 local_4180;
  undefined8 uStack_4178;
  undefined8 uStack_4170;
  undefined8 uStack_4168;
  undefined8 local_4160;
  undefined8 uStack_4158;
  undefined8 uStack_4150;
  undefined8 uStack_4148;
  undefined8 local_4140;
  undefined8 uStack_4138;
  undefined8 uStack_4130;
  undefined8 uStack_4128;
  undefined8 local_4120;
  undefined8 uStack_4118;
  undefined8 uStack_4110;
  undefined8 uStack_4108;
  undefined8 local_4100;
  undefined8 uStack_40f8;
  undefined8 uStack_40f0;
  undefined8 uStack_40e8;
  undefined8 local_40e0;
  undefined8 uStack_40d8;
  undefined8 uStack_40d0;
  undefined8 uStack_40c8;
  int local_3c90;
  int local_3c8c;
  void *local_3c88;
  int *local_3c80;
  long *local_3c68;
  undefined1 local_3c40 [16];
  undefined1 local_3c30 [16];
  undefined1 local_3c20 [32];
  undefined8 local_3c00;
  undefined8 uStack_3bf8;
  undefined8 uStack_3bf0;
  undefined8 uStack_3be8;
  undefined1 local_3be0 [16];
  undefined1 local_3bd0 [16];
  undefined1 local_3bc0 [16];
  undefined1 local_3bb0 [16];
  undefined1 local_3ba0 [16];
  undefined1 local_3b90 [16];
  undefined1 local_3b80 [16];
  undefined1 local_3b70 [16];
  int local_3b5c;
  undefined1 (*local_3b58) [16];
  undefined1 (*local_3b50) [16];
  undefined1 (*local_3b48) [16];
  undefined1 (*local_3b40) [16];
  unsigned_short *local_3b38;
  int local_3b2c;
  void *local_3b28;
  int *local_3b20;
  long local_3b18;
  long *local_3b08;
  int local_3afc;
  undefined8 local_3ae0;
  undefined8 uStack_3ad8;
  undefined8 local_3ad0;
  undefined8 uStack_3ac8;
  undefined8 local_3ac0;
  undefined8 uStack_3ab8;
  undefined8 local_3ab0;
  undefined8 uStack_3aa8;
  undefined8 local_3aa0;
  undefined8 uStack_3a98;
  undefined8 local_3a90;
  undefined8 uStack_3a88;
  undefined8 local_3a80;
  undefined8 uStack_3a78;
  undefined8 local_3a70;
  undefined8 uStack_3a68;
  undefined8 local_3a60;
  undefined8 uStack_3a58;
  undefined8 local_3a50;
  undefined8 uStack_3a48;
  undefined8 local_3a40;
  undefined8 uStack_3a38;
  undefined8 local_3a30;
  undefined8 uStack_3a28;
  undefined8 local_3a20;
  undefined8 uStack_3a18;
  undefined8 local_3a10;
  undefined8 uStack_3a08;
  undefined8 local_3a00;
  undefined8 uStack_39f8;
  undefined8 local_39f0;
  undefined8 uStack_39e8;
  undefined1 local_39e0 [16];
  undefined1 local_39d0 [16];
  undefined1 local_39c0 [16];
  undefined1 local_39b0 [16];
  undefined1 local_39a0 [16];
  undefined1 local_3990 [16];
  undefined1 local_3980 [16];
  undefined1 local_3970 [16];
  undefined8 local_3960;
  undefined8 uStack_3958;
  undefined8 uStack_3950;
  undefined8 uStack_3948;
  undefined8 local_3940;
  undefined8 uStack_3938;
  undefined8 uStack_3930;
  undefined8 uStack_3928;
  undefined8 local_3920;
  undefined8 uStack_3918;
  undefined8 uStack_3910;
  undefined8 uStack_3908;
  undefined8 local_3900;
  undefined8 uStack_38f8;
  undefined8 uStack_38f0;
  undefined8 uStack_38e8;
  undefined8 local_38e0;
  undefined8 uStack_38d8;
  undefined8 uStack_38d0;
  undefined8 uStack_38c8;
  undefined8 local_38c0;
  undefined8 uStack_38b8;
  undefined8 uStack_38b0;
  undefined8 uStack_38a8;
  undefined8 local_38a0;
  undefined8 uStack_3898;
  undefined8 uStack_3890;
  undefined8 uStack_3888;
  undefined8 local_3880;
  undefined8 uStack_3878;
  undefined8 uStack_3870;
  undefined8 uStack_3868;
  undefined8 local_3860;
  undefined8 uStack_3858;
  undefined8 uStack_3850;
  undefined8 uStack_3848;
  undefined8 local_3840;
  undefined8 uStack_3838;
  undefined8 uStack_3830;
  undefined8 uStack_3828;
  undefined8 local_3820;
  undefined8 uStack_3818;
  undefined8 uStack_3810;
  undefined8 uStack_3808;
  undefined8 local_3800;
  undefined8 uStack_37f8;
  undefined8 uStack_37f0;
  undefined8 uStack_37e8;
  undefined8 local_37e0;
  undefined8 uStack_37d8;
  undefined8 uStack_37d0;
  undefined8 uStack_37c8;
  undefined8 local_37c0;
  undefined8 uStack_37b8;
  undefined8 uStack_37b0;
  undefined8 uStack_37a8;
  undefined8 local_37a0;
  undefined8 uStack_3798;
  undefined8 uStack_3790;
  undefined8 uStack_3788;
  undefined8 local_3780;
  undefined8 uStack_3778;
  undefined8 uStack_3770;
  undefined8 uStack_3768;
  undefined1 local_3760 [32];
  undefined1 local_3740 [32];
  undefined1 local_3720 [32];
  undefined1 local_3700 [32];
  undefined1 local_36e0 [32];
  undefined1 local_36c0 [32];
  undefined1 local_36a0 [32];
  undefined1 local_3680 [32];
  int local_365c;
  undefined1 (*local_3658) [64];
  undefined1 (*local_3650) [64];
  undefined1 (*local_3648) [64];
  undefined1 (*local_3640) [64];
  undefined1 (*local_3638) [64];
  undefined1 (*local_3630) [64];
  undefined1 (*local_3628) [64];
  undefined1 (*local_3620) [64];
  unsigned_short *local_3618;
  int local_360c;
  void *local_3608;
  int *local_3600;
  long local_35f8;
  undefined4 local_35f0;
  long *local_35e8;
  undefined4 local_35e0;
  int local_35dc;
  undefined4 local_35d8;
  undefined4 local_35d4;
  undefined4 local_35d0;
  undefined8 local_35c8;
  undefined8 local_35c0;
  undefined8 uStack_35b8;
  undefined8 uStack_35b0;
  undefined8 uStack_35a8;
  undefined8 local_35a0;
  undefined8 uStack_3598;
  undefined8 uStack_3590;
  undefined8 uStack_3588;
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 uStack_3570;
  undefined8 uStack_3568;
  undefined8 local_3560;
  undefined8 uStack_3558;
  undefined8 uStack_3550;
  undefined8 uStack_3548;
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 uStack_3530;
  undefined8 uStack_3528;
  undefined8 local_3520;
  undefined8 uStack_3518;
  undefined8 uStack_3510;
  undefined8 uStack_3508;
  undefined8 local_3500;
  undefined8 uStack_34f8;
  undefined8 uStack_34f0;
  undefined8 uStack_34e8;
  undefined8 local_34e0;
  undefined8 uStack_34d8;
  undefined8 uStack_34d0;
  undefined8 uStack_34c8;
  undefined8 local_34c0;
  undefined8 uStack_34b8;
  undefined8 uStack_34b0;
  undefined8 uStack_34a8;
  undefined8 local_34a0;
  undefined8 uStack_3498;
  undefined8 uStack_3490;
  undefined8 uStack_3488;
  undefined8 local_3480;
  undefined8 uStack_3478;
  undefined8 uStack_3470;
  undefined8 uStack_3468;
  undefined8 local_3460;
  undefined8 uStack_3458;
  undefined8 uStack_3450;
  undefined8 uStack_3448;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined8 local_3420;
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  undefined8 uStack_3408;
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined8 local_33e0;
  undefined8 uStack_33d8;
  undefined8 uStack_33d0;
  undefined8 uStack_33c8;
  undefined1 local_33c0 [32];
  undefined1 local_33a0 [32];
  undefined1 local_3380 [32];
  undefined1 local_3360 [32];
  undefined1 local_3340 [32];
  undefined1 local_3320 [32];
  undefined1 local_3300 [32];
  undefined1 local_32e0 [32];
  undefined1 local_32c0 [16];
  undefined1 local_32b0 [16];
  undefined1 local_32a0 [16];
  undefined1 local_3290 [16];
  undefined1 local_3280 [16];
  undefined1 local_3270 [16];
  undefined1 local_3260 [16];
  undefined1 local_3250 [16];
  undefined1 local_3240 [16];
  undefined1 local_3230 [16];
  undefined1 local_3220 [16];
  undefined1 local_3210 [16];
  undefined1 local_3200 [16];
  undefined1 local_31f0 [16];
  undefined1 local_31e0 [16];
  undefined1 local_31d0 [16];
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined8 local_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  undefined8 local_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 uStack_3130;
  undefined8 uStack_3128;
  undefined8 local_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  undefined8 local_30e0;
  undefined8 uStack_30d8;
  undefined8 uStack_30d0;
  undefined8 uStack_30c8;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined8 local_30a0;
  undefined8 uStack_3098;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  undefined8 local_3080;
  undefined8 uStack_3078;
  undefined8 uStack_3070;
  undefined8 uStack_3068;
  undefined8 local_3060;
  undefined8 uStack_3058;
  undefined8 uStack_3050;
  undefined8 uStack_3048;
  undefined8 local_3040;
  undefined8 uStack_3038;
  undefined8 uStack_3030;
  undefined8 uStack_3028;
  undefined8 local_3020;
  undefined8 uStack_3018;
  undefined8 uStack_3010;
  undefined8 uStack_3008;
  undefined8 local_3000;
  undefined8 uStack_2ff8;
  undefined8 uStack_2ff0;
  undefined8 uStack_2fe8;
  undefined8 local_2fe0;
  undefined8 uStack_2fd8;
  undefined8 uStack_2fd0;
  undefined8 uStack_2fc8;
  undefined8 local_2fc0;
  undefined8 uStack_2fb8;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  undefined8 local_2fa0;
  undefined8 uStack_2f98;
  undefined8 uStack_2f90;
  undefined8 uStack_2f88;
  undefined8 local_2f80;
  undefined8 uStack_2f78;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  undefined8 local_2f60;
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  undefined8 local_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  undefined8 local_2ee0;
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 uStack_2eb0;
  undefined8 uStack_2ea8;
  undefined8 local_2ea0;
  undefined8 uStack_2e98;
  undefined8 uStack_2e90;
  undefined8 uStack_2e88;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  undefined8 local_2e60;
  undefined8 uStack_2e58;
  undefined8 uStack_2e50;
  undefined8 uStack_2e48;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  undefined8 local_2e20;
  undefined8 uStack_2e18;
  undefined8 uStack_2e10;
  undefined8 uStack_2e08;
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined8 local_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  undefined1 local_2dc0 [32];
  undefined1 local_2da0 [32];
  undefined1 local_2d80 [32];
  undefined1 local_2d60 [32];
  undefined1 local_2d40 [32];
  undefined1 local_2d20 [32];
  undefined1 local_2d00 [32];
  undefined1 local_2ce0 [32];
  undefined1 local_2cc0 [32];
  undefined1 local_2ca0 [32];
  undefined1 local_2c80 [32];
  undefined1 local_2c60 [32];
  undefined1 local_2c40 [32];
  undefined1 local_2c20 [32];
  undefined1 local_2c00 [32];
  undefined1 local_2be0 [32];
  int local_2bbc;
  undefined1 (*local_2bb8) [64];
  undefined1 (*local_2bb0) [64];
  undefined1 (*local_2ba8) [64];
  undefined1 (*local_2ba0) [64];
  undefined1 (*local_2b98) [64];
  undefined1 (*local_2b90) [64];
  undefined1 (*local_2b88) [64];
  undefined1 (*local_2b80) [64];
  undefined1 (*local_2b78) [64];
  undefined1 (*local_2b70) [64];
  undefined1 (*local_2b68) [64];
  undefined1 (*local_2b60) [64];
  undefined1 (*local_2b58) [64];
  undefined1 (*local_2b50) [64];
  undefined1 (*local_2b48) [64];
  undefined1 (*local_2b40) [64];
  unsigned_short *local_2b38;
  int local_2b30;
  void *local_2b20;
  int *local_2b18;
  long local_2b10;
  undefined4 local_2b08;
  long *local_2b00;
  undefined4 local_2af8;
  int local_2af4;
  undefined4 local_2af0;
  undefined4 local_2aec;
  undefined4 local_2ae8;
  undefined8 local_2ae0;
  int local_2ad4;
  int local_2ac8;
  int local_2ac4;
  long *local_2ac0;
  void **local_2ab0;
  void **local_2aa0;
  void **local_2a90;
  void **local_2a80;
  int local_2a6c;
  void **local_2a68;
  int local_2a5c;
  void **local_2a58;
  int local_2a4c;
  void **local_2a48;
  int local_2a3c;
  void **local_2a38;
  int local_2a2c;
  void **local_2a28;
  int local_2a1c;
  void **local_2a18;
  int local_2a0c;
  void **local_2a08;
  int local_29fc;
  void **local_29f8;
  int local_29ec;
  void **local_29e8;
  int local_29dc;
  void **local_29d8;
  int local_29cc;
  void **local_29c8;
  int local_29bc;
  void **local_29b8;
  int local_29ac;
  void **local_29a8;
  int local_299c;
  void **local_2998;
  int local_298c;
  void **local_2988;
  int local_297c;
  void **local_2978;
  int local_296c;
  void **local_2968;
  int local_295c;
  void **local_2958;
  int local_294c;
  void **local_2948;
  int local_293c;
  void **local_2938;
  int local_292c;
  void **local_2928;
  int local_291c;
  void **local_2918;
  int local_290c;
  void **local_2908;
  int local_28fc;
  void **local_28f8;
  int local_28ec;
  void **local_28e8;
  int local_28dc;
  void **local_28d8;
  int local_28cc;
  void **local_28c8;
  int local_28bc;
  void **local_28b8;
  int local_28a0;
  undefined4 local_289c;
  void **local_2898;
  int local_2880;
  undefined4 local_287c;
  void **local_2878;
  int local_2860;
  undefined4 local_285c;
  void **local_2858;
  int local_2840;
  undefined4 local_283c;
  void **local_2838;
  undefined1 (*local_2830) [64];
  undefined1 (*local_2828) [64];
  undefined1 (*local_2820) [64];
  undefined1 (*local_2818) [64];
  undefined1 (*local_2810) [64];
  undefined1 (*local_2808) [64];
  undefined1 (*local_2800) [64];
  undefined1 (*local_27f8) [64];
  undefined1 (*local_27f0) [64];
  undefined1 (*local_27e8) [64];
  undefined1 (*local_27e0) [64];
  undefined1 (*local_27d8) [64];
  undefined1 (*local_27d0) [64];
  undefined1 (*local_27c8) [64];
  undefined1 (*local_27c0) [64];
  undefined1 (*local_27b8) [64];
  undefined1 (*local_27b0) [64];
  undefined1 (*local_27a8) [64];
  undefined1 (*local_27a0) [64];
  undefined1 (*local_2798) [64];
  undefined1 (*local_2790) [64];
  undefined1 (*local_2788) [64];
  undefined1 (*local_2780) [64];
  undefined1 (*local_2778) [64];
  undefined1 (*local_2770) [16];
  undefined1 (*local_2768) [16];
  undefined1 (*local_2760) [16];
  undefined1 (*local_2758) [16];
  undefined1 (*local_2750) [64];
  undefined1 (*local_2748) [64];
  undefined1 (*local_2740) [64];
  undefined1 (*local_2738) [64];
  undefined1 (*local_2730) [64];
  undefined1 (*local_2728) [64];
  undefined1 (*local_2720) [64];
  undefined1 (*local_2718) [64];
  undefined1 (*local_2710) [64];
  undefined1 (*local_2708) [64];
  undefined1 (*local_2700) [64];
  undefined1 (*local_26f8) [64];
  undefined1 (*local_26f0) [64];
  undefined1 (*local_26e8) [64];
  undefined1 (*local_26e0) [64];
  undefined1 (*local_26d8) [64];
  undefined1 (*local_26d0) [64];
  undefined1 (*local_26c8) [64];
  undefined1 (*local_26c0) [64];
  undefined1 (*local_26b8) [64];
  undefined1 (*local_26b0) [64];
  undefined1 (*local_26a8) [64];
  undefined1 (*local_26a0) [64];
  undefined1 (*local_2698) [64];
  undefined8 local_2690;
  undefined8 uStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 local_2670;
  undefined8 uStack_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 local_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 local_2630;
  undefined8 uStack_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 local_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 local_25f0;
  undefined8 uStack_25e8;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 local_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 local_25b0;
  undefined8 uStack_25a8;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 local_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 local_2570;
  undefined8 uStack_2568;
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined8 local_2550;
  undefined8 uStack_2548;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 local_2530;
  undefined8 uStack_2528;
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 local_2510;
  undefined8 uStack_2508;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 local_24f0;
  undefined8 uStack_24e8;
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 local_24d0;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 local_24b0;
  undefined8 uStack_24a8;
  undefined8 local_24a0;
  undefined8 uStack_2498;
  int local_244c;
  long *local_2448;
  int local_243c;
  long *local_2438;
  int local_242c;
  long *local_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined1 local_2320 [16];
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined1 local_2300 [16];
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined1 local_22e0 [16];
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined1 local_22c0 [16];
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined1 local_22a0 [16];
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined1 local_2280 [16];
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined1 local_2260 [16];
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined1 local_2240 [16];
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 local_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined1 local_1f20 [16];
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined1 local_1f00 [16];
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined1 local_1ee0 [16];
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined1 local_1ec0 [16];
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined1 local_1ea0 [16];
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined1 local_1e80 [16];
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined1 local_1e60 [16];
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined1 local_1e40 [16];
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined1 (*local_be8) [32];
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  unsigned_short *local_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  unsigned_short *local_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  unsigned_short *local_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  unsigned_short *local_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  unsigned_short *local_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  unsigned_short *local_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  unsigned_short *local_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined1 (*local_9e8) [32];
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  unsigned_short *local_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  unsigned_short *local_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  unsigned_short *local_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  unsigned_short *local_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  unsigned_short *local_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  unsigned_short *local_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  unsigned_short *local_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined1 (*local_7e8) [32];
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  unsigned_short *local_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  unsigned_short *local_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  unsigned_short *local_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  unsigned_short *local_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  unsigned_short *local_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  unsigned_short *local_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  unsigned_short *local_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  unsigned_short *local_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  unsigned_short *local_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  unsigned_short *local_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  unsigned_short *local_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  unsigned_short *local_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  unsigned_short *local_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  unsigned_short *local_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  unsigned_short *local_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined1 (*local_198) [16];
  undefined8 local_190;
  undefined8 uStack_188;
  unsigned_short *local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined1 (*local_158) [16];
  undefined8 local_150;
  undefined8 uStack_148;
  unsigned_short *local_138;
  undefined8 local_130;
  undefined8 uStack_128;
  unsigned_short *local_118;
  undefined8 local_110;
  undefined8 uStack_108;
  unsigned_short *local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  unsigned_short *local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  unsigned_short *local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  unsigned_short *local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  unsigned_short *local_78;
  Mat *local_70;
  Mat *pMStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  
  local_2ad4 = 1;
  if ((*(byte *)(in_R8 + 0x27) & 1) != 0) {
    if (in_ECX % 0x10 == 0) {
      local_3c8c = 0x10;
    }
    else {
      if (in_ECX % 8 == 0) {
        local_3c90 = 8;
      }
      else {
        local_3c90 = 1;
        if (in_ECX % 4 == 0) {
          local_3c90 = 4;
        }
      }
      local_3c8c = local_3c90;
    }
    local_2ad4 = local_3c8c;
  }
  local_2ac8 = in_ECX;
  local_2ac4 = in_EDX;
  local_2ac0 = in_RSI;
  if (local_2ad4 == 0x10) {
    Mat::reshape(in_stack_ffffffffffffae10,(int)((ulong)in_stack_ffffffffffffae08 >> 0x20),
                 (int)in_stack_ffffffffffffae08,in_stack_ffffffffffffae00);
    Mat::create(in_stack_ffffffffffffadb8,in_stack_ffffffffffffadb4,in_stack_ffffffffffffadb0,
                in_stack_ffffffffffffada8,(int)((ulong)in_stack_ffffffffffffada0 >> 0x20),
                in_stack_ffffffffffffad98);
    for (local_2b30 = 0; local_2b30 + 0xf < local_2ac8; local_2b30 = local_2b30 + 0x10) {
      local_242c = local_2b30 / 0x10;
      local_2428 = local_2ac0;
      local_2b38 = (unsigned_short *)
                   (*local_2ac0 +
                   (long)*(int *)((long)local_2ac0 + 0x2c) * (long)local_242c * local_2ac0[2]);
      local_28b8 = &local_2b20;
      local_28bc = local_2b30;
      local_2b40 = (undefined1 (*) [64])
                   ((long)local_2b20 + (long)local_2af4 * (long)local_2b30 * local_2b10);
      local_28cc = local_2b30 + 1;
      local_28c8 = &local_2b20;
      local_2b48 = (undefined1 (*) [64])
                   ((long)local_2b20 + (long)local_2af4 * (long)local_28cc * local_2b10);
      local_28dc = local_2b30 + 2;
      local_28d8 = &local_2b20;
      local_2b50 = (undefined1 (*) [64])
                   ((long)local_2b20 + (long)local_2af4 * (long)local_28dc * local_2b10);
      local_28ec = local_2b30 + 3;
      local_28e8 = &local_2b20;
      local_2b58 = (undefined1 (*) [64])
                   ((long)local_2b20 + (long)local_2af4 * (long)local_28ec * local_2b10);
      local_28fc = local_2b30 + 4;
      local_28f8 = &local_2b20;
      local_2b60 = (undefined1 (*) [64])
                   ((long)local_2b20 + (long)local_2af4 * (long)local_28fc * local_2b10);
      local_290c = local_2b30 + 5;
      local_2908 = &local_2b20;
      local_2b68 = (undefined1 (*) [64])
                   ((long)local_2b20 + (long)local_2af4 * (long)local_290c * local_2b10);
      local_291c = local_2b30 + 6;
      local_2918 = &local_2b20;
      local_2b70 = (undefined1 (*) [64])
                   ((long)local_2b20 + (long)local_2af4 * (long)local_291c * local_2b10);
      local_292c = local_2b30 + 7;
      local_2928 = &local_2b20;
      local_2b78 = (undefined1 (*) [64])
                   ((long)local_2b20 + (long)local_2af4 * (long)local_292c * local_2b10);
      local_293c = local_2b30 + 8;
      local_2938 = &local_2b20;
      local_2b80 = (undefined1 (*) [64])
                   ((long)local_2b20 + (long)local_2af4 * (long)local_293c * local_2b10);
      local_294c = local_2b30 + 9;
      local_2948 = &local_2b20;
      local_2b88 = (undefined1 (*) [64])
                   ((long)local_2b20 + (long)local_2af4 * (long)local_294c * local_2b10);
      local_295c = local_2b30 + 10;
      local_2958 = &local_2b20;
      local_2b90 = (undefined1 (*) [64])
                   ((long)local_2b20 + (long)local_2af4 * (long)local_295c * local_2b10);
      local_296c = local_2b30 + 0xb;
      local_2968 = &local_2b20;
      local_2b98 = (undefined1 (*) [64])
                   ((long)local_2b20 + (long)local_2af4 * (long)local_296c * local_2b10);
      local_297c = local_2b30 + 0xc;
      local_2978 = &local_2b20;
      local_2ba0 = (undefined1 (*) [64])
                   ((long)local_2b20 + (long)local_2af4 * (long)local_297c * local_2b10);
      local_298c = local_2b30 + 0xd;
      local_2988 = &local_2b20;
      local_2ba8 = (undefined1 (*) [64])
                   ((long)local_2b20 + (long)local_2af4 * (long)local_298c * local_2b10);
      local_299c = local_2b30 + 0xe;
      local_2998 = &local_2b20;
      local_2bb0 = (undefined1 (*) [64])
                   ((long)local_2b20 + (long)local_2af4 * (long)local_299c * local_2b10);
      local_29ac = local_2b30 + 0xf;
      local_29a8 = &local_2b20;
      local_2bb8 = (undefined1 (*) [64])
                   ((long)local_2b20 + (long)local_2af4 * (long)local_29ac * local_2b10);
      for (local_2bbc = 0; local_2bbc + 0xf < local_2ac4; local_2bbc = local_2bbc + 0x10) {
        local_2778 = local_2b40;
        auVar16 = vcvtps2ph_avx512f(*local_2b40,3);
        local_2be0._0_8_ = auVar16._0_8_;
        local_2780 = local_2b48;
        auVar17 = vcvtps2ph_avx512f(*local_2b48,3);
        local_2c00._0_8_ = auVar17._0_8_;
        local_2788 = local_2b50;
        auVar18 = vcvtps2ph_avx512f(*local_2b50,3);
        local_2c20._0_8_ = auVar18._0_8_;
        local_2790 = local_2b58;
        auVar19 = vcvtps2ph_avx512f(*local_2b58,3);
        local_2c40._0_8_ = auVar19._0_8_;
        local_2798 = local_2b60;
        auVar20 = vcvtps2ph_avx512f(*local_2b60,3);
        local_2c60._0_8_ = auVar20._0_8_;
        local_27a0 = local_2b68;
        auVar21 = vcvtps2ph_avx512f(*local_2b68,3);
        local_2c80._0_8_ = auVar21._0_8_;
        local_27a8 = local_2b70;
        auVar22 = vcvtps2ph_avx512f(*local_2b70,3);
        local_2ca0._0_8_ = auVar22._0_8_;
        local_27b0 = local_2b78;
        auVar23 = vcvtps2ph_avx512f(*local_2b78,3);
        local_2cc0._0_8_ = auVar23._0_8_;
        local_27b8 = local_2b80;
        auVar24 = vcvtps2ph_avx512f(*local_2b80,3);
        local_2ce0._0_8_ = auVar24._0_8_;
        local_27c0 = local_2b88;
        auVar25 = vcvtps2ph_avx512f(*local_2b88,3);
        local_2d00._0_8_ = auVar25._0_8_;
        local_27c8 = local_2b90;
        auVar26 = vcvtps2ph_avx512f(*local_2b90,3);
        local_2d20._0_8_ = auVar26._0_8_;
        local_27d0 = local_2b98;
        auVar27 = vcvtps2ph_avx512f(*local_2b98,3);
        local_2d40._0_8_ = auVar27._0_8_;
        local_27d8 = local_2ba0;
        auVar28 = vcvtps2ph_avx512f(*local_2ba0,3);
        local_2d60._0_8_ = auVar28._0_8_;
        local_27e0 = local_2ba8;
        auVar29 = vcvtps2ph_avx512f(*local_2ba8,3);
        local_2d80._0_8_ = auVar29._0_8_;
        local_27e8 = local_2bb0;
        auVar30 = vcvtps2ph_avx512f(*local_2bb0,3);
        local_2da0._0_8_ = auVar30._0_8_;
        local_27f0 = local_2bb8;
        auVar31 = vcvtps2ph_avx512f(*local_2bb8,3);
        local_2dc0._0_8_ = auVar31._0_8_;
        local_2040 = local_2be0._0_8_;
        local_2be0._8_8_ = auVar16._8_8_;
        uStack_2038 = local_2be0._8_8_;
        local_2be0._16_8_ = auVar16._16_8_;
        uStack_2030 = local_2be0._16_8_;
        local_2be0._24_8_ = auVar16._24_8_;
        uStack_2028 = local_2be0._24_8_;
        local_2060 = local_2c00._0_8_;
        local_2c00._8_8_ = auVar17._8_8_;
        uStack_2058 = local_2c00._8_8_;
        local_2c00._16_8_ = auVar17._16_8_;
        uStack_2050 = local_2c00._16_8_;
        local_2c00._24_8_ = auVar17._24_8_;
        uStack_2048 = local_2c00._24_8_;
        auVar32 = vpunpcklwd_avx2(auVar16,auVar17);
        local_40e0 = auVar32._0_8_;
        uStack_40d8 = auVar32._8_8_;
        uStack_40d0 = auVar32._16_8_;
        uStack_40c8 = auVar32._24_8_;
        local_1c40 = local_2be0._0_8_;
        uStack_1c38 = local_2be0._8_8_;
        uStack_1c30 = local_2be0._16_8_;
        uStack_1c28 = local_2be0._24_8_;
        local_1c60 = local_2c00._0_8_;
        uStack_1c58 = local_2c00._8_8_;
        uStack_1c50 = local_2c00._16_8_;
        uStack_1c48 = local_2c00._24_8_;
        auVar16 = vpunpckhwd_avx2(auVar16,auVar17);
        local_4100 = auVar16._0_8_;
        uStack_40f8 = auVar16._8_8_;
        uStack_40f0 = auVar16._16_8_;
        uStack_40e8 = auVar16._24_8_;
        local_2080 = local_2c20._0_8_;
        local_2c20._8_8_ = auVar18._8_8_;
        uStack_2078 = local_2c20._8_8_;
        local_2c20._16_8_ = auVar18._16_8_;
        uStack_2070 = local_2c20._16_8_;
        local_2c20._24_8_ = auVar18._24_8_;
        uStack_2068 = local_2c20._24_8_;
        local_20a0 = local_2c40._0_8_;
        local_2c40._8_8_ = auVar19._8_8_;
        uStack_2098 = local_2c40._8_8_;
        local_2c40._16_8_ = auVar19._16_8_;
        uStack_2090 = local_2c40._16_8_;
        local_2c40._24_8_ = auVar19._24_8_;
        uStack_2088 = local_2c40._24_8_;
        auVar33 = vpunpcklwd_avx2(auVar18,auVar19);
        local_4120 = auVar33._0_8_;
        uStack_4118 = auVar33._8_8_;
        uStack_4110 = auVar33._16_8_;
        uStack_4108 = auVar33._24_8_;
        local_1c80 = local_2c20._0_8_;
        uStack_1c78 = local_2c20._8_8_;
        uStack_1c70 = local_2c20._16_8_;
        uStack_1c68 = local_2c20._24_8_;
        local_1ca0 = local_2c40._0_8_;
        uStack_1c98 = local_2c40._8_8_;
        uStack_1c90 = local_2c40._16_8_;
        uStack_1c88 = local_2c40._24_8_;
        auVar17 = vpunpckhwd_avx2(auVar18,auVar19);
        local_4140 = auVar17._0_8_;
        uStack_4138 = auVar17._8_8_;
        uStack_4130 = auVar17._16_8_;
        uStack_4128 = auVar17._24_8_;
        local_20c0 = local_2c60._0_8_;
        local_2c60._8_8_ = auVar20._8_8_;
        uStack_20b8 = local_2c60._8_8_;
        local_2c60._16_8_ = auVar20._16_8_;
        uStack_20b0 = local_2c60._16_8_;
        local_2c60._24_8_ = auVar20._24_8_;
        uStack_20a8 = local_2c60._24_8_;
        local_20e0 = local_2c80._0_8_;
        local_2c80._8_8_ = auVar21._8_8_;
        uStack_20d8 = local_2c80._8_8_;
        local_2c80._16_8_ = auVar21._16_8_;
        uStack_20d0 = local_2c80._16_8_;
        local_2c80._24_8_ = auVar21._24_8_;
        uStack_20c8 = local_2c80._24_8_;
        auVar34 = vpunpcklwd_avx2(auVar20,auVar21);
        local_4160 = auVar34._0_8_;
        uStack_4158 = auVar34._8_8_;
        uStack_4150 = auVar34._16_8_;
        uStack_4148 = auVar34._24_8_;
        local_1cc0 = local_2c60._0_8_;
        uStack_1cb8 = local_2c60._8_8_;
        uStack_1cb0 = local_2c60._16_8_;
        uStack_1ca8 = local_2c60._24_8_;
        local_1ce0 = local_2c80._0_8_;
        uStack_1cd8 = local_2c80._8_8_;
        uStack_1cd0 = local_2c80._16_8_;
        uStack_1cc8 = local_2c80._24_8_;
        auVar18 = vpunpckhwd_avx2(auVar20,auVar21);
        local_4180 = auVar18._0_8_;
        uStack_4178 = auVar18._8_8_;
        uStack_4170 = auVar18._16_8_;
        uStack_4168 = auVar18._24_8_;
        local_2100 = local_2ca0._0_8_;
        local_2ca0._8_8_ = auVar22._8_8_;
        uStack_20f8 = local_2ca0._8_8_;
        local_2ca0._16_8_ = auVar22._16_8_;
        uStack_20f0 = local_2ca0._16_8_;
        local_2ca0._24_8_ = auVar22._24_8_;
        uStack_20e8 = local_2ca0._24_8_;
        local_2120 = local_2cc0._0_8_;
        local_2cc0._8_8_ = auVar23._8_8_;
        uStack_2118 = local_2cc0._8_8_;
        local_2cc0._16_8_ = auVar23._16_8_;
        uStack_2110 = local_2cc0._16_8_;
        local_2cc0._24_8_ = auVar23._24_8_;
        uStack_2108 = local_2cc0._24_8_;
        auVar4 = vpunpcklwd_avx2(auVar22,auVar23);
        local_41a0 = auVar4._0_8_;
        uStack_4198 = auVar4._8_8_;
        uStack_4190 = auVar4._16_8_;
        uStack_4188 = auVar4._24_8_;
        local_1d00 = local_2ca0._0_8_;
        uStack_1cf8 = local_2ca0._8_8_;
        uStack_1cf0 = local_2ca0._16_8_;
        uStack_1ce8 = local_2ca0._24_8_;
        local_1d20 = local_2cc0._0_8_;
        uStack_1d18 = local_2cc0._8_8_;
        uStack_1d10 = local_2cc0._16_8_;
        uStack_1d08 = local_2cc0._24_8_;
        auVar19 = vpunpckhwd_avx2(auVar22,auVar23);
        local_41c0 = auVar19._0_8_;
        uStack_41b8 = auVar19._8_8_;
        uStack_41b0 = auVar19._16_8_;
        uStack_41a8 = auVar19._24_8_;
        local_2140 = local_2ce0._0_8_;
        local_2ce0._8_8_ = auVar24._8_8_;
        uStack_2138 = local_2ce0._8_8_;
        local_2ce0._16_8_ = auVar24._16_8_;
        uStack_2130 = local_2ce0._16_8_;
        local_2ce0._24_8_ = auVar24._24_8_;
        uStack_2128 = local_2ce0._24_8_;
        local_2160 = local_2d00._0_8_;
        local_2d00._8_8_ = auVar25._8_8_;
        uStack_2158 = local_2d00._8_8_;
        local_2d00._16_8_ = auVar25._16_8_;
        uStack_2150 = local_2d00._16_8_;
        local_2d00._24_8_ = auVar25._24_8_;
        uStack_2148 = local_2d00._24_8_;
        auVar5 = vpunpcklwd_avx2(auVar24,auVar25);
        local_41e0 = auVar5._0_8_;
        uStack_41d8 = auVar5._8_8_;
        uStack_41d0 = auVar5._16_8_;
        uStack_41c8 = auVar5._24_8_;
        local_1d40 = local_2ce0._0_8_;
        uStack_1d38 = local_2ce0._8_8_;
        uStack_1d30 = local_2ce0._16_8_;
        uStack_1d28 = local_2ce0._24_8_;
        local_1d60 = local_2d00._0_8_;
        uStack_1d58 = local_2d00._8_8_;
        uStack_1d50 = local_2d00._16_8_;
        uStack_1d48 = local_2d00._24_8_;
        auVar20 = vpunpckhwd_avx2(auVar24,auVar25);
        local_4200 = auVar20._0_8_;
        uStack_41f8 = auVar20._8_8_;
        uStack_41f0 = auVar20._16_8_;
        uStack_41e8 = auVar20._24_8_;
        local_2180 = local_2d20._0_8_;
        local_2d20._8_8_ = auVar26._8_8_;
        uStack_2178 = local_2d20._8_8_;
        local_2d20._16_8_ = auVar26._16_8_;
        uStack_2170 = local_2d20._16_8_;
        local_2d20._24_8_ = auVar26._24_8_;
        uStack_2168 = local_2d20._24_8_;
        local_21a0 = local_2d40._0_8_;
        local_2d40._8_8_ = auVar27._8_8_;
        uStack_2198 = local_2d40._8_8_;
        local_2d40._16_8_ = auVar27._16_8_;
        uStack_2190 = local_2d40._16_8_;
        local_2d40._24_8_ = auVar27._24_8_;
        uStack_2188 = local_2d40._24_8_;
        auVar24 = vpunpcklwd_avx2(auVar26,auVar27);
        local_4220 = auVar24._0_8_;
        uStack_4218 = auVar24._8_8_;
        uStack_4210 = auVar24._16_8_;
        uStack_4208 = auVar24._24_8_;
        local_1d80 = local_2d20._0_8_;
        uStack_1d78 = local_2d20._8_8_;
        uStack_1d70 = local_2d20._16_8_;
        uStack_1d68 = local_2d20._24_8_;
        local_1da0 = local_2d40._0_8_;
        uStack_1d98 = local_2d40._8_8_;
        uStack_1d90 = local_2d40._16_8_;
        uStack_1d88 = local_2d40._24_8_;
        auVar21 = vpunpckhwd_avx2(auVar26,auVar27);
        local_4240 = auVar21._0_8_;
        uStack_4238 = auVar21._8_8_;
        uStack_4230 = auVar21._16_8_;
        uStack_4228 = auVar21._24_8_;
        local_21c0 = local_2d60._0_8_;
        local_2d60._8_8_ = auVar28._8_8_;
        uStack_21b8 = local_2d60._8_8_;
        local_2d60._16_8_ = auVar28._16_8_;
        uStack_21b0 = local_2d60._16_8_;
        local_2d60._24_8_ = auVar28._24_8_;
        uStack_21a8 = local_2d60._24_8_;
        local_21e0 = local_2d80._0_8_;
        local_2d80._8_8_ = auVar29._8_8_;
        uStack_21d8 = local_2d80._8_8_;
        local_2d80._16_8_ = auVar29._16_8_;
        uStack_21d0 = local_2d80._16_8_;
        local_2d80._24_8_ = auVar29._24_8_;
        uStack_21c8 = local_2d80._24_8_;
        auVar25 = vpunpcklwd_avx2(auVar28,auVar29);
        local_4260 = auVar25._0_8_;
        uStack_4258 = auVar25._8_8_;
        uStack_4250 = auVar25._16_8_;
        uStack_4248 = auVar25._24_8_;
        local_1dc0 = local_2d60._0_8_;
        uStack_1db8 = local_2d60._8_8_;
        uStack_1db0 = local_2d60._16_8_;
        uStack_1da8 = local_2d60._24_8_;
        local_1de0 = local_2d80._0_8_;
        uStack_1dd8 = local_2d80._8_8_;
        uStack_1dd0 = local_2d80._16_8_;
        uStack_1dc8 = local_2d80._24_8_;
        auVar22 = vpunpckhwd_avx2(auVar28,auVar29);
        local_4280 = auVar22._0_8_;
        uStack_4278 = auVar22._8_8_;
        uStack_4270 = auVar22._16_8_;
        uStack_4268 = auVar22._24_8_;
        local_2200 = local_2da0._0_8_;
        local_2da0._8_8_ = auVar30._8_8_;
        uStack_21f8 = local_2da0._8_8_;
        local_2da0._16_8_ = auVar30._16_8_;
        uStack_21f0 = local_2da0._16_8_;
        local_2da0._24_8_ = auVar30._24_8_;
        uStack_21e8 = local_2da0._24_8_;
        local_2220 = local_2dc0._0_8_;
        local_2dc0._8_8_ = auVar31._8_8_;
        uStack_2218 = local_2dc0._8_8_;
        local_2dc0._16_8_ = auVar31._16_8_;
        uStack_2210 = local_2dc0._16_8_;
        local_2dc0._24_8_ = auVar31._24_8_;
        uStack_2208 = local_2dc0._24_8_;
        auVar26 = vpunpcklwd_avx2(auVar30,auVar31);
        local_42a0 = auVar26._0_8_;
        uStack_4298 = auVar26._8_8_;
        uStack_4290 = auVar26._16_8_;
        uStack_4288 = auVar26._24_8_;
        local_1e00 = local_2da0._0_8_;
        uStack_1df8 = local_2da0._8_8_;
        uStack_1df0 = local_2da0._16_8_;
        uStack_1de8 = local_2da0._24_8_;
        local_1e20 = local_2dc0._0_8_;
        uStack_1e18 = local_2dc0._8_8_;
        uStack_1e10 = local_2dc0._16_8_;
        uStack_1e08 = local_2dc0._24_8_;
        auVar23 = vpunpckhwd_avx2(auVar30,auVar31);
        local_42c0 = auVar23._0_8_;
        uStack_42b8 = auVar23._8_8_;
        uStack_42b0 = auVar23._16_8_;
        uStack_42a8 = auVar23._24_8_;
        local_1840 = local_40e0;
        uStack_1838 = uStack_40d8;
        uStack_1830 = uStack_40d0;
        uStack_1828 = uStack_40c8;
        local_1860 = local_4120;
        uStack_1858 = uStack_4118;
        uStack_1850 = uStack_4110;
        uStack_1848 = uStack_4108;
        auVar27 = vpunpckldq_avx2(auVar32,auVar33);
        local_42e0 = auVar27._0_8_;
        local_2fe0 = local_42e0;
        uStack_42d8 = auVar27._8_8_;
        uStack_2fd8 = uStack_42d8;
        uStack_42d0 = auVar27._16_8_;
        uStack_2fd0 = uStack_42d0;
        uStack_42c8 = auVar27._24_8_;
        uStack_2fc8 = uStack_42c8;
        local_1440 = local_40e0;
        uStack_1438 = uStack_40d8;
        uStack_1430 = uStack_40d0;
        uStack_1428 = uStack_40c8;
        local_1460 = local_4120;
        uStack_1458 = uStack_4118;
        uStack_1450 = uStack_4110;
        uStack_1448 = uStack_4108;
        auVar32 = vpunpckhdq_avx2(auVar32,auVar33);
        local_4300 = auVar32._0_8_;
        local_3000 = local_4300;
        uStack_42f8 = auVar32._8_8_;
        uStack_2ff8 = uStack_42f8;
        uStack_42f0 = auVar32._16_8_;
        uStack_2ff0 = uStack_42f0;
        uStack_42e8 = auVar32._24_8_;
        uStack_2fe8 = uStack_42e8;
        local_1880 = local_4100;
        uStack_1878 = uStack_40f8;
        uStack_1870 = uStack_40f0;
        uStack_1868 = uStack_40e8;
        local_18a0 = local_4140;
        uStack_1898 = uStack_4138;
        uStack_1890 = uStack_4130;
        uStack_1888 = uStack_4128;
        auVar33 = vpunpckldq_avx2(auVar16,auVar17);
        local_4320 = auVar33._0_8_;
        local_3020 = local_4320;
        uStack_4318 = auVar33._8_8_;
        uStack_3018 = uStack_4318;
        uStack_4310 = auVar33._16_8_;
        uStack_3010 = uStack_4310;
        uStack_4308 = auVar33._24_8_;
        uStack_3008 = uStack_4308;
        local_1480 = local_4100;
        uStack_1478 = uStack_40f8;
        uStack_1470 = uStack_40f0;
        uStack_1468 = uStack_40e8;
        local_14a0 = local_4140;
        uStack_1498 = uStack_4138;
        uStack_1490 = uStack_4130;
        uStack_1488 = uStack_4128;
        auVar16 = vpunpckhdq_avx2(auVar16,auVar17);
        local_4340 = auVar16._0_8_;
        local_3040 = local_4340;
        uStack_4338 = auVar16._8_8_;
        uStack_3038 = uStack_4338;
        uStack_4330 = auVar16._16_8_;
        uStack_3030 = uStack_4330;
        uStack_4328 = auVar16._24_8_;
        uStack_3028 = uStack_4328;
        local_18c0 = local_4160;
        uStack_18b8 = uStack_4158;
        uStack_18b0 = uStack_4150;
        uStack_18a8 = uStack_4148;
        local_18e0 = local_41a0;
        uStack_18d8 = uStack_4198;
        uStack_18d0 = uStack_4190;
        uStack_18c8 = uStack_4188;
        auVar28 = vpunpckldq_avx2(auVar34,auVar4);
        local_4360 = auVar28._0_8_;
        local_3060 = local_4360;
        uStack_4358 = auVar28._8_8_;
        uStack_3058 = uStack_4358;
        uStack_4350 = auVar28._16_8_;
        uStack_3050 = uStack_4350;
        uStack_4348 = auVar28._24_8_;
        uStack_3048 = uStack_4348;
        local_14c0 = local_4160;
        uStack_14b8 = uStack_4158;
        uStack_14b0 = uStack_4150;
        uStack_14a8 = uStack_4148;
        local_14e0 = local_41a0;
        uStack_14d8 = uStack_4198;
        uStack_14d0 = uStack_4190;
        uStack_14c8 = uStack_4188;
        auVar17 = vpunpckhdq_avx2(auVar34,auVar4);
        local_4380 = auVar17._0_8_;
        local_3080 = local_4380;
        uStack_4378 = auVar17._8_8_;
        uStack_3078 = uStack_4378;
        uStack_4370 = auVar17._16_8_;
        uStack_3070 = uStack_4370;
        uStack_4368 = auVar17._24_8_;
        uStack_3068 = uStack_4368;
        local_1900 = local_4180;
        uStack_18f8 = uStack_4178;
        uStack_18f0 = uStack_4170;
        uStack_18e8 = uStack_4168;
        local_1920 = local_41c0;
        uStack_1918 = uStack_41b8;
        uStack_1910 = uStack_41b0;
        uStack_1908 = uStack_41a8;
        auVar34 = vpunpckldq_avx2(auVar18,auVar19);
        local_43a0 = auVar34._0_8_;
        local_30a0 = local_43a0;
        uStack_4398 = auVar34._8_8_;
        uStack_3098 = uStack_4398;
        uStack_4390 = auVar34._16_8_;
        uStack_3090 = uStack_4390;
        uStack_4388 = auVar34._24_8_;
        uStack_3088 = uStack_4388;
        local_1500 = local_4180;
        uStack_14f8 = uStack_4178;
        uStack_14f0 = uStack_4170;
        uStack_14e8 = uStack_4168;
        local_1520 = local_41c0;
        uStack_1518 = uStack_41b8;
        uStack_1510 = uStack_41b0;
        uStack_1508 = uStack_41a8;
        auVar18 = vpunpckhdq_avx2(auVar18,auVar19);
        local_43c0 = auVar18._0_8_;
        local_30c0 = local_43c0;
        uStack_43b8 = auVar18._8_8_;
        uStack_30b8 = uStack_43b8;
        uStack_43b0 = auVar18._16_8_;
        uStack_30b0 = uStack_43b0;
        uStack_43a8 = auVar18._24_8_;
        uStack_30a8 = uStack_43a8;
        local_1940 = local_41e0;
        uStack_1938 = uStack_41d8;
        uStack_1930 = uStack_41d0;
        uStack_1928 = uStack_41c8;
        local_1960 = local_4220;
        uStack_1958 = uStack_4218;
        uStack_1950 = uStack_4210;
        uStack_1948 = uStack_4208;
        auVar4 = vpunpckldq_avx2(auVar5,auVar24);
        local_43e0 = auVar4._0_8_;
        local_30e0 = local_43e0;
        uStack_43d8 = auVar4._8_8_;
        uStack_30d8 = uStack_43d8;
        uStack_43d0 = auVar4._16_8_;
        uStack_30d0 = uStack_43d0;
        uStack_43c8 = auVar4._24_8_;
        uStack_30c8 = uStack_43c8;
        local_1540 = local_41e0;
        uStack_1538 = uStack_41d8;
        uStack_1530 = uStack_41d0;
        uStack_1528 = uStack_41c8;
        local_1560 = local_4220;
        uStack_1558 = uStack_4218;
        uStack_1550 = uStack_4210;
        uStack_1548 = uStack_4208;
        auVar19 = vpunpckhdq_avx2(auVar5,auVar24);
        local_4400 = auVar19._0_8_;
        local_3100 = local_4400;
        uStack_43f8 = auVar19._8_8_;
        uStack_30f8 = uStack_43f8;
        uStack_43f0 = auVar19._16_8_;
        uStack_30f0 = uStack_43f0;
        uStack_43e8 = auVar19._24_8_;
        uStack_30e8 = uStack_43e8;
        local_1980 = local_4200;
        uStack_1978 = uStack_41f8;
        uStack_1970 = uStack_41f0;
        uStack_1968 = uStack_41e8;
        local_19a0 = local_4240;
        uStack_1998 = uStack_4238;
        uStack_1990 = uStack_4230;
        uStack_1988 = uStack_4228;
        auVar5 = vpunpckldq_avx2(auVar20,auVar21);
        local_4420 = auVar5._0_8_;
        local_3120 = local_4420;
        uStack_4418 = auVar5._8_8_;
        uStack_3118 = uStack_4418;
        uStack_4410 = auVar5._16_8_;
        uStack_3110 = uStack_4410;
        uStack_4408 = auVar5._24_8_;
        uStack_3108 = uStack_4408;
        local_1580 = local_4200;
        uStack_1578 = uStack_41f8;
        uStack_1570 = uStack_41f0;
        uStack_1568 = uStack_41e8;
        local_15a0 = local_4240;
        uStack_1598 = uStack_4238;
        uStack_1590 = uStack_4230;
        uStack_1588 = uStack_4228;
        auVar20 = vpunpckhdq_avx2(auVar20,auVar21);
        local_4440 = auVar20._0_8_;
        local_3140 = local_4440;
        uStack_4438 = auVar20._8_8_;
        uStack_3138 = uStack_4438;
        uStack_4430 = auVar20._16_8_;
        uStack_3130 = uStack_4430;
        uStack_4428 = auVar20._24_8_;
        uStack_3128 = uStack_4428;
        local_19c0 = local_4260;
        uStack_19b8 = uStack_4258;
        uStack_19b0 = uStack_4250;
        uStack_19a8 = uStack_4248;
        local_19e0 = local_42a0;
        uStack_19d8 = uStack_4298;
        uStack_19d0 = uStack_4290;
        uStack_19c8 = uStack_4288;
        auVar24 = vpunpckldq_avx2(auVar25,auVar26);
        local_4460 = auVar24._0_8_;
        local_3160 = local_4460;
        uStack_4458 = auVar24._8_8_;
        uStack_3158 = uStack_4458;
        uStack_4450 = auVar24._16_8_;
        uStack_3150 = uStack_4450;
        uStack_4448 = auVar24._24_8_;
        uStack_3148 = uStack_4448;
        local_15c0 = local_4260;
        uStack_15b8 = uStack_4258;
        uStack_15b0 = uStack_4250;
        uStack_15a8 = uStack_4248;
        local_15e0 = local_42a0;
        uStack_15d8 = uStack_4298;
        uStack_15d0 = uStack_4290;
        uStack_15c8 = uStack_4288;
        auVar21 = vpunpckhdq_avx2(auVar25,auVar26);
        local_4480 = auVar21._0_8_;
        local_3180 = local_4480;
        uStack_4478 = auVar21._8_8_;
        uStack_3178 = uStack_4478;
        uStack_4470 = auVar21._16_8_;
        uStack_3170 = uStack_4470;
        uStack_4468 = auVar21._24_8_;
        uStack_3168 = uStack_4468;
        local_1a00 = local_4280;
        uStack_19f8 = uStack_4278;
        uStack_19f0 = uStack_4270;
        uStack_19e8 = uStack_4268;
        local_1a20 = local_42c0;
        uStack_1a18 = uStack_42b8;
        uStack_1a10 = uStack_42b0;
        uStack_1a08 = uStack_42a8;
        auVar25 = vpunpckldq_avx2(auVar22,auVar23);
        local_44a0 = auVar25._0_8_;
        local_31a0 = local_44a0;
        uStack_4498 = auVar25._8_8_;
        uStack_3198 = uStack_4498;
        uStack_4490 = auVar25._16_8_;
        uStack_3190 = uStack_4490;
        uStack_4488 = auVar25._24_8_;
        uStack_3188 = uStack_4488;
        local_1600 = local_4280;
        uStack_15f8 = uStack_4278;
        uStack_15f0 = uStack_4270;
        uStack_15e8 = uStack_4268;
        local_1620 = local_42c0;
        uStack_1618 = uStack_42b8;
        uStack_1610 = uStack_42b0;
        uStack_1608 = uStack_42a8;
        auVar22 = vpunpckhdq_avx2(auVar22,auVar23);
        local_44c0 = auVar22._0_8_;
        local_31c0 = local_44c0;
        uStack_44b8 = auVar22._8_8_;
        uStack_31b8 = uStack_44b8;
        uStack_44b0 = auVar22._16_8_;
        uStack_31b0 = uStack_44b0;
        uStack_44a8 = auVar22._24_8_;
        uStack_31a8 = uStack_44a8;
        local_1040 = local_42e0;
        uStack_1038 = uStack_42d8;
        uStack_1030 = uStack_42d0;
        uStack_1028 = uStack_42c8;
        local_1060 = local_4360;
        uStack_1058 = uStack_4358;
        uStack_1050 = uStack_4350;
        uStack_1048 = uStack_4348;
        auVar26 = vpunpcklqdq_avx2(auVar27,auVar28);
        local_44e0 = auVar26._0_8_;
        local_2de0 = local_44e0;
        uStack_44d8 = auVar26._8_8_;
        uStack_2dd8 = uStack_44d8;
        uStack_44d0 = auVar26._16_8_;
        uStack_2dd0 = uStack_44d0;
        uStack_44c8 = auVar26._24_8_;
        uStack_2dc8 = uStack_44c8;
        local_c40 = local_42e0;
        uStack_c38 = uStack_42d8;
        uStack_c30 = uStack_42d0;
        uStack_c28 = uStack_42c8;
        local_c60 = local_4360;
        uStack_c58 = uStack_4358;
        uStack_c50 = uStack_4350;
        uStack_c48 = uStack_4348;
        auVar23 = vpunpckhqdq_avx2(auVar27,auVar28);
        local_4500 = auVar23._0_8_;
        local_2e00 = local_4500;
        uStack_44f8 = auVar23._8_8_;
        uStack_2df8 = uStack_44f8;
        uStack_44f0 = auVar23._16_8_;
        uStack_2df0 = uStack_44f0;
        uStack_44e8 = auVar23._24_8_;
        uStack_2de8 = uStack_44e8;
        local_1080 = local_4300;
        uStack_1078 = uStack_42f8;
        uStack_1070 = uStack_42f0;
        uStack_1068 = uStack_42e8;
        local_10a0 = local_4380;
        uStack_1098 = uStack_4378;
        uStack_1090 = uStack_4370;
        uStack_1088 = uStack_4368;
        auVar27 = vpunpcklqdq_avx2(auVar32,auVar17);
        local_4520 = auVar27._0_8_;
        local_2e20 = local_4520;
        uStack_4518 = auVar27._8_8_;
        uStack_2e18 = uStack_4518;
        uStack_4510 = auVar27._16_8_;
        uStack_2e10 = uStack_4510;
        uStack_4508 = auVar27._24_8_;
        uStack_2e08 = uStack_4508;
        local_c80 = local_4300;
        uStack_c78 = uStack_42f8;
        uStack_c70 = uStack_42f0;
        uStack_c68 = uStack_42e8;
        local_ca0 = local_4380;
        uStack_c98 = uStack_4378;
        uStack_c90 = uStack_4370;
        uStack_c88 = uStack_4368;
        auVar17 = vpunpckhqdq_avx2(auVar32,auVar17);
        local_4540 = auVar17._0_8_;
        local_2e40 = local_4540;
        uStack_4538 = auVar17._8_8_;
        uStack_2e38 = uStack_4538;
        uStack_4530 = auVar17._16_8_;
        uStack_2e30 = uStack_4530;
        uStack_4528 = auVar17._24_8_;
        uStack_2e28 = uStack_4528;
        local_10c0 = local_4320;
        uStack_10b8 = uStack_4318;
        uStack_10b0 = uStack_4310;
        uStack_10a8 = uStack_4308;
        local_10e0 = local_43a0;
        uStack_10d8 = uStack_4398;
        uStack_10d0 = uStack_4390;
        uStack_10c8 = uStack_4388;
        auVar28 = vpunpcklqdq_avx2(auVar33,auVar34);
        local_4560 = auVar28._0_8_;
        local_2e60 = local_4560;
        uStack_4558 = auVar28._8_8_;
        uStack_2e58 = uStack_4558;
        uStack_4550 = auVar28._16_8_;
        uStack_2e50 = uStack_4550;
        uStack_4548 = auVar28._24_8_;
        uStack_2e48 = uStack_4548;
        local_cc0 = local_4320;
        uStack_cb8 = uStack_4318;
        uStack_cb0 = uStack_4310;
        uStack_ca8 = uStack_4308;
        local_ce0 = local_43a0;
        uStack_cd8 = uStack_4398;
        uStack_cd0 = uStack_4390;
        uStack_cc8 = uStack_4388;
        auVar32 = vpunpckhqdq_avx2(auVar33,auVar34);
        local_4580 = auVar32._0_8_;
        local_2e80 = local_4580;
        uStack_4578 = auVar32._8_8_;
        uStack_2e78 = uStack_4578;
        uStack_4570 = auVar32._16_8_;
        uStack_2e70 = uStack_4570;
        uStack_4568 = auVar32._24_8_;
        uStack_2e68 = uStack_4568;
        local_1100 = local_4340;
        uStack_10f8 = uStack_4338;
        uStack_10f0 = uStack_4330;
        uStack_10e8 = uStack_4328;
        local_1120 = local_43c0;
        uStack_1118 = uStack_43b8;
        uStack_1110 = uStack_43b0;
        uStack_1108 = uStack_43a8;
        auVar33 = vpunpcklqdq_avx2(auVar16,auVar18);
        local_45a0 = auVar33._0_8_;
        local_2ea0 = local_45a0;
        uStack_4598 = auVar33._8_8_;
        uStack_2e98 = uStack_4598;
        uStack_4590 = auVar33._16_8_;
        uStack_2e90 = uStack_4590;
        uStack_4588 = auVar33._24_8_;
        uStack_2e88 = uStack_4588;
        local_d00 = local_4340;
        uStack_cf8 = uStack_4338;
        uStack_cf0 = uStack_4330;
        uStack_ce8 = uStack_4328;
        local_d20 = local_43c0;
        uStack_d18 = uStack_43b8;
        uStack_d10 = uStack_43b0;
        uStack_d08 = uStack_43a8;
        auVar16 = vpunpckhqdq_avx2(auVar16,auVar18);
        local_45c0 = auVar16._0_8_;
        local_2ec0 = local_45c0;
        uStack_45b8 = auVar16._8_8_;
        uStack_2eb8 = uStack_45b8;
        uStack_45b0 = auVar16._16_8_;
        uStack_2eb0 = uStack_45b0;
        uStack_45a8 = auVar16._24_8_;
        uStack_2ea8 = uStack_45a8;
        local_1140 = local_43e0;
        uStack_1138 = uStack_43d8;
        uStack_1130 = uStack_43d0;
        uStack_1128 = uStack_43c8;
        local_1160 = local_4460;
        uStack_1158 = uStack_4458;
        uStack_1150 = uStack_4450;
        uStack_1148 = uStack_4448;
        auVar34 = vpunpcklqdq_avx2(auVar4,auVar24);
        local_45e0 = auVar34._0_8_;
        local_2ee0 = local_45e0;
        uStack_45d8 = auVar34._8_8_;
        uStack_2ed8 = uStack_45d8;
        uStack_45d0 = auVar34._16_8_;
        uStack_2ed0 = uStack_45d0;
        uStack_45c8 = auVar34._24_8_;
        uStack_2ec8 = uStack_45c8;
        local_d40 = local_43e0;
        uStack_d38 = uStack_43d8;
        uStack_d30 = uStack_43d0;
        uStack_d28 = uStack_43c8;
        local_d60 = local_4460;
        uStack_d58 = uStack_4458;
        uStack_d50 = uStack_4450;
        uStack_d48 = uStack_4448;
        auVar18 = vpunpckhqdq_avx2(auVar4,auVar24);
        local_4600 = auVar18._0_8_;
        local_2f00 = local_4600;
        uStack_45f8 = auVar18._8_8_;
        uStack_2ef8 = uStack_45f8;
        uStack_45f0 = auVar18._16_8_;
        uStack_2ef0 = uStack_45f0;
        uStack_45e8 = auVar18._24_8_;
        uStack_2ee8 = uStack_45e8;
        local_1180 = local_4400;
        uStack_1178 = uStack_43f8;
        uStack_1170 = uStack_43f0;
        uStack_1168 = uStack_43e8;
        local_11a0 = local_4480;
        uStack_1198 = uStack_4478;
        uStack_1190 = uStack_4470;
        uStack_1188 = uStack_4468;
        auVar4 = vpunpcklqdq_avx2(auVar19,auVar21);
        local_4620 = auVar4._0_8_;
        local_2f20 = local_4620;
        uStack_4618 = auVar4._8_8_;
        uStack_2f18 = uStack_4618;
        uStack_4610 = auVar4._16_8_;
        uStack_2f10 = uStack_4610;
        uStack_4608 = auVar4._24_8_;
        uStack_2f08 = uStack_4608;
        local_d80 = local_4400;
        uStack_d78 = uStack_43f8;
        uStack_d70 = uStack_43f0;
        uStack_d68 = uStack_43e8;
        local_da0 = local_4480;
        uStack_d98 = uStack_4478;
        uStack_d90 = uStack_4470;
        uStack_d88 = uStack_4468;
        auVar19 = vpunpckhqdq_avx2(auVar19,auVar21);
        local_4640 = auVar19._0_8_;
        local_2f40 = local_4640;
        uStack_4638 = auVar19._8_8_;
        uStack_2f38 = uStack_4638;
        uStack_4630 = auVar19._16_8_;
        uStack_2f30 = uStack_4630;
        uStack_4628 = auVar19._24_8_;
        uStack_2f28 = uStack_4628;
        local_11c0 = local_4420;
        uStack_11b8 = uStack_4418;
        uStack_11b0 = uStack_4410;
        uStack_11a8 = uStack_4408;
        local_11e0 = local_44a0;
        uStack_11d8 = uStack_4498;
        uStack_11d0 = uStack_4490;
        uStack_11c8 = uStack_4488;
        auVar24 = vpunpcklqdq_avx2(auVar5,auVar25);
        local_4660 = auVar24._0_8_;
        local_2f60 = local_4660;
        uStack_4658 = auVar24._8_8_;
        uStack_2f58 = uStack_4658;
        uStack_4650 = auVar24._16_8_;
        uStack_2f50 = uStack_4650;
        uStack_4648 = auVar24._24_8_;
        uStack_2f48 = uStack_4648;
        local_dc0 = local_4420;
        uStack_db8 = uStack_4418;
        uStack_db0 = uStack_4410;
        uStack_da8 = uStack_4408;
        local_de0 = local_44a0;
        uStack_dd8 = uStack_4498;
        uStack_dd0 = uStack_4490;
        uStack_dc8 = uStack_4488;
        auVar21 = vpunpckhqdq_avx2(auVar5,auVar25);
        local_4680 = auVar21._0_8_;
        local_2f80 = local_4680;
        uStack_4678 = auVar21._8_8_;
        uStack_2f78 = uStack_4678;
        uStack_4670 = auVar21._16_8_;
        uStack_2f70 = uStack_4670;
        uStack_4668 = auVar21._24_8_;
        uStack_2f68 = uStack_4668;
        local_1200 = local_4440;
        uStack_11f8 = uStack_4438;
        uStack_11f0 = uStack_4430;
        uStack_11e8 = uStack_4428;
        local_1220 = local_44c0;
        uStack_1218 = uStack_44b8;
        uStack_1210 = uStack_44b0;
        uStack_1208 = uStack_44a8;
        auVar5 = vpunpcklqdq_avx2(auVar20,auVar22);
        local_46a0 = auVar5._0_8_;
        local_2fa0 = local_46a0;
        uStack_4698 = auVar5._8_8_;
        uStack_2f98 = uStack_4698;
        uStack_4690 = auVar5._16_8_;
        uStack_2f90 = uStack_4690;
        uStack_4688 = auVar5._24_8_;
        uStack_2f88 = uStack_4688;
        local_e00 = local_4440;
        uStack_df8 = uStack_4438;
        uStack_df0 = uStack_4430;
        uStack_de8 = uStack_4428;
        local_e20 = local_44c0;
        uStack_e18 = uStack_44b8;
        uStack_e10 = uStack_44b0;
        uStack_e08 = uStack_44a8;
        auVar20 = vpunpckhqdq_avx2(auVar20,auVar22);
        local_46c0 = auVar20._0_8_;
        local_2fc0 = local_46c0;
        uStack_46b8 = auVar20._8_8_;
        uStack_2fb8 = uStack_46b8;
        uStack_46b0 = auVar20._16_8_;
        uStack_2fb0 = uStack_46b0;
        uStack_46a8 = auVar20._24_8_;
        uStack_2fa8 = uStack_46a8;
        local_2be0 = vperm2i128_avx2(auVar26,auVar34,0x20);
        local_2c00 = vperm2i128_avx2(auVar23,auVar18,0x20);
        local_2c20 = vperm2i128_avx2(auVar27,auVar4,0x20);
        local_2c40 = vperm2i128_avx2(auVar17,auVar19,0x20);
        local_2c60 = vperm2i128_avx2(auVar28,auVar24,0x20);
        local_2c80 = vperm2i128_avx2(auVar32,auVar21,0x20);
        local_2ca0 = vperm2i128_avx2(auVar33,auVar5,0x20);
        local_2cc0 = vperm2i128_avx2(auVar16,auVar20,0x20);
        local_2ce0 = vperm2i128_avx2(auVar26,auVar34,0x31);
        local_2d00 = vperm2i128_avx2(auVar23,auVar18,0x31);
        local_2d20 = vperm2i128_avx2(auVar27,auVar4,0x31);
        local_2d40 = vperm2i128_avx2(auVar17,auVar19,0x31);
        local_2d60 = vperm2i128_avx2(auVar28,auVar24,0x31);
        local_2d80 = vperm2i128_avx2(auVar32,auVar21,0x31);
        local_2da0 = vperm2i128_avx2(auVar33,auVar5,0x31);
        local_2dc0 = vperm2i128_avx2(auVar16,auVar20,0x31);
        local_438 = local_2b38;
        local_460 = local_2be0._0_8_;
        uStack_458 = local_2be0._8_8_;
        uStack_450 = local_2be0._16_8_;
        uStack_448 = local_2be0._24_8_;
        *(undefined8 *)local_2b38 = local_2be0._0_8_;
        *(undefined8 *)(local_2b38 + 4) = local_2be0._8_8_;
        *(undefined8 *)(local_2b38 + 8) = local_2be0._16_8_;
        *(undefined8 *)(local_2b38 + 0xc) = local_2be0._24_8_;
        local_468 = local_2b38 + 0x10;
        local_4a0 = local_2c00._0_8_;
        uStack_498 = local_2c00._8_8_;
        uStack_490 = local_2c00._16_8_;
        uStack_488 = local_2c00._24_8_;
        *(undefined8 *)local_468 = local_2c00._0_8_;
        *(undefined8 *)(local_2b38 + 0x14) = local_2c00._8_8_;
        *(undefined8 *)(local_2b38 + 0x18) = local_2c00._16_8_;
        *(undefined8 *)(local_2b38 + 0x1c) = local_2c00._24_8_;
        local_4a8 = local_2b38 + 0x20;
        local_4e0 = local_2c20._0_8_;
        uStack_4d8 = local_2c20._8_8_;
        uStack_4d0 = local_2c20._16_8_;
        uStack_4c8 = local_2c20._24_8_;
        *(undefined8 *)local_4a8 = local_2c20._0_8_;
        *(undefined8 *)(local_2b38 + 0x24) = local_2c20._8_8_;
        *(undefined8 *)(local_2b38 + 0x28) = local_2c20._16_8_;
        *(undefined8 *)(local_2b38 + 0x2c) = local_2c20._24_8_;
        local_4e8 = local_2b38 + 0x30;
        local_520 = local_2c40._0_8_;
        uStack_518 = local_2c40._8_8_;
        uStack_510 = local_2c40._16_8_;
        uStack_508 = local_2c40._24_8_;
        *(undefined8 *)local_4e8 = local_2c40._0_8_;
        *(undefined8 *)(local_2b38 + 0x34) = local_2c40._8_8_;
        *(undefined8 *)(local_2b38 + 0x38) = local_2c40._16_8_;
        *(undefined8 *)(local_2b38 + 0x3c) = local_2c40._24_8_;
        local_528 = local_2b38 + 0x40;
        local_560 = local_2c60._0_8_;
        uStack_558 = local_2c60._8_8_;
        uStack_550 = local_2c60._16_8_;
        uStack_548 = local_2c60._24_8_;
        *(undefined8 *)local_528 = local_2c60._0_8_;
        *(undefined8 *)(local_2b38 + 0x44) = local_2c60._8_8_;
        *(undefined8 *)(local_2b38 + 0x48) = local_2c60._16_8_;
        *(undefined8 *)(local_2b38 + 0x4c) = local_2c60._24_8_;
        local_568 = local_2b38 + 0x50;
        local_5a0 = local_2c80._0_8_;
        uStack_598 = local_2c80._8_8_;
        uStack_590 = local_2c80._16_8_;
        uStack_588 = local_2c80._24_8_;
        *(undefined8 *)local_568 = local_2c80._0_8_;
        *(undefined8 *)(local_2b38 + 0x54) = local_2c80._8_8_;
        *(undefined8 *)(local_2b38 + 0x58) = local_2c80._16_8_;
        *(undefined8 *)(local_2b38 + 0x5c) = local_2c80._24_8_;
        local_5a8 = local_2b38 + 0x60;
        local_5e0 = local_2ca0._0_8_;
        uStack_5d8 = local_2ca0._8_8_;
        uStack_5d0 = local_2ca0._16_8_;
        uStack_5c8 = local_2ca0._24_8_;
        *(undefined8 *)local_5a8 = local_2ca0._0_8_;
        *(undefined8 *)(local_2b38 + 100) = local_2ca0._8_8_;
        *(undefined8 *)(local_2b38 + 0x68) = local_2ca0._16_8_;
        *(undefined8 *)(local_2b38 + 0x6c) = local_2ca0._24_8_;
        local_5e8 = local_2b38 + 0x70;
        local_620 = local_2cc0._0_8_;
        uStack_618 = local_2cc0._8_8_;
        uStack_610 = local_2cc0._16_8_;
        uStack_608 = local_2cc0._24_8_;
        *(undefined8 *)local_5e8 = local_2cc0._0_8_;
        *(undefined8 *)(local_2b38 + 0x74) = local_2cc0._8_8_;
        *(undefined8 *)(local_2b38 + 0x78) = local_2cc0._16_8_;
        *(undefined8 *)(local_2b38 + 0x7c) = local_2cc0._24_8_;
        local_628 = local_2b38 + 0x80;
        local_660 = local_2ce0._0_8_;
        uStack_658 = local_2ce0._8_8_;
        uStack_650 = local_2ce0._16_8_;
        uStack_648 = local_2ce0._24_8_;
        *(undefined8 *)local_628 = local_2ce0._0_8_;
        *(undefined8 *)(local_2b38 + 0x84) = local_2ce0._8_8_;
        *(undefined8 *)(local_2b38 + 0x88) = local_2ce0._16_8_;
        *(undefined8 *)(local_2b38 + 0x8c) = local_2ce0._24_8_;
        local_668 = local_2b38 + 0x90;
        local_6a0 = local_2d00._0_8_;
        uStack_698 = local_2d00._8_8_;
        uStack_690 = local_2d00._16_8_;
        uStack_688 = local_2d00._24_8_;
        *(undefined8 *)local_668 = local_2d00._0_8_;
        *(undefined8 *)(local_2b38 + 0x94) = local_2d00._8_8_;
        *(undefined8 *)(local_2b38 + 0x98) = local_2d00._16_8_;
        *(undefined8 *)(local_2b38 + 0x9c) = local_2d00._24_8_;
        local_6a8 = local_2b38 + 0xa0;
        local_6e0 = local_2d20._0_8_;
        uStack_6d8 = local_2d20._8_8_;
        uStack_6d0 = local_2d20._16_8_;
        uStack_6c8 = local_2d20._24_8_;
        *(undefined8 *)local_6a8 = local_2d20._0_8_;
        *(undefined8 *)(local_2b38 + 0xa4) = local_2d20._8_8_;
        *(undefined8 *)(local_2b38 + 0xa8) = local_2d20._16_8_;
        *(undefined8 *)(local_2b38 + 0xac) = local_2d20._24_8_;
        local_6e8 = local_2b38 + 0xb0;
        local_720 = local_2d40._0_8_;
        uStack_718 = local_2d40._8_8_;
        uStack_710 = local_2d40._16_8_;
        uStack_708 = local_2d40._24_8_;
        *(undefined8 *)local_6e8 = local_2d40._0_8_;
        *(undefined8 *)(local_2b38 + 0xb4) = local_2d40._8_8_;
        *(undefined8 *)(local_2b38 + 0xb8) = local_2d40._16_8_;
        *(undefined8 *)(local_2b38 + 0xbc) = local_2d40._24_8_;
        local_728 = local_2b38 + 0xc0;
        local_760 = local_2d60._0_8_;
        uStack_758 = local_2d60._8_8_;
        uStack_750 = local_2d60._16_8_;
        uStack_748 = local_2d60._24_8_;
        *(undefined8 *)local_728 = local_2d60._0_8_;
        *(undefined8 *)(local_2b38 + 0xc4) = local_2d60._8_8_;
        *(undefined8 *)(local_2b38 + 200) = local_2d60._16_8_;
        *(undefined8 *)(local_2b38 + 0xcc) = local_2d60._24_8_;
        local_768 = local_2b38 + 0xd0;
        local_7a0 = local_2d80._0_8_;
        uStack_798 = local_2d80._8_8_;
        uStack_790 = local_2d80._16_8_;
        uStack_788 = local_2d80._24_8_;
        *(undefined8 *)local_768 = local_2d80._0_8_;
        *(undefined8 *)(local_2b38 + 0xd4) = local_2d80._8_8_;
        *(undefined8 *)(local_2b38 + 0xd8) = local_2d80._16_8_;
        *(undefined8 *)(local_2b38 + 0xdc) = local_2d80._24_8_;
        local_7a8 = local_2b38 + 0xe0;
        local_7e0 = local_2da0._0_8_;
        uStack_7d8 = local_2da0._8_8_;
        uStack_7d0 = local_2da0._16_8_;
        uStack_7c8 = local_2da0._24_8_;
        *(undefined8 *)local_7a8 = local_2da0._0_8_;
        *(undefined8 *)(local_2b38 + 0xe4) = local_2da0._8_8_;
        *(undefined8 *)(local_2b38 + 0xe8) = local_2da0._16_8_;
        *(undefined8 *)(local_2b38 + 0xec) = local_2da0._24_8_;
        local_7e8 = (undefined1 (*) [32])(local_2b38 + 0xf0);
        local_820 = local_2dc0._0_8_;
        uStack_818 = local_2dc0._8_8_;
        uStack_810 = local_2dc0._16_8_;
        uStack_808 = local_2dc0._24_8_;
        *local_7e8 = local_2dc0;
        local_2b40 = local_2b40 + 1;
        local_2b48 = local_2b48 + 1;
        local_2b50 = local_2b50 + 1;
        local_2b58 = local_2b58 + 1;
        local_2b60 = local_2b60 + 1;
        local_2b68 = local_2b68 + 1;
        local_2b70 = local_2b70 + 1;
        local_2b78 = local_2b78 + 1;
        local_2b80 = local_2b80 + 1;
        local_2b88 = local_2b88 + 1;
        local_2b90 = local_2b90 + 1;
        local_2b98 = local_2b98 + 1;
        local_2ba0 = local_2ba0 + 1;
        local_2ba8 = local_2ba8 + 1;
        local_2bb0 = local_2bb0 + 1;
        local_2bb8 = local_2bb8 + 1;
        local_2b38 = local_2b38 + 0x100;
      }
      for (; local_2bbc + 7 < local_2ac4; local_2bbc = local_2bbc + 8) {
        local_2698 = local_2b40;
        local_31d0 = vcvtps2ph_f16c(*(undefined1 (*) [32])*local_2b40,3);
        local_26a0 = local_2b48;
        local_31e0 = vcvtps2ph_f16c(*(undefined1 (*) [32])*local_2b48,3);
        local_26a8 = local_2b50;
        local_31f0 = vcvtps2ph_f16c(*(undefined1 (*) [32])*local_2b50,3);
        local_26b0 = local_2b58;
        local_3200 = vcvtps2ph_f16c(*(undefined1 (*) [32])*local_2b58,3);
        local_26b8 = local_2b60;
        local_3210 = vcvtps2ph_f16c(*(undefined1 (*) [32])*local_2b60,3);
        local_26c0 = local_2b68;
        local_3220 = vcvtps2ph_f16c(*(undefined1 (*) [32])*local_2b68,3);
        local_26c8 = local_2b70;
        local_3230 = vcvtps2ph_f16c(*(undefined1 (*) [32])*local_2b70,3);
        local_26d0 = local_2b78;
        local_3240 = vcvtps2ph_f16c(*(undefined1 (*) [32])*local_2b78,3);
        local_26d8 = local_2b80;
        local_3250 = vcvtps2ph_f16c(*(undefined1 (*) [32])*local_2b80,3);
        local_26e0 = local_2b88;
        local_3260 = vcvtps2ph_f16c(*(undefined1 (*) [32])*local_2b88,3);
        local_26e8 = local_2b90;
        local_3270 = vcvtps2ph_f16c(*(undefined1 (*) [32])*local_2b90,3);
        local_26f0 = local_2b98;
        local_3280 = vcvtps2ph_f16c(*(undefined1 (*) [32])*local_2b98,3);
        local_26f8 = local_2ba0;
        local_3290 = vcvtps2ph_f16c(*(undefined1 (*) [32])*local_2ba0,3);
        local_2700 = local_2ba8;
        local_32a0 = vcvtps2ph_f16c(*(undefined1 (*) [32])*local_2ba8,3);
        local_2708 = local_2bb0;
        local_32b0 = vcvtps2ph_f16c(*(undefined1 (*) [32])*local_2bb0,3);
        local_2710 = local_2bb8;
        local_32c0 = vcvtps2ph_f16c(*(undefined1 (*) [32])*local_2bb8,3);
        local_3c0 = local_31d0._0_8_;
        uStack_3b8 = local_31d0._8_8_;
        local_2240 = ZEXT116(0) * local_3250 + ZEXT116(1) * local_31d0;
        auVar6 = ZEXT116(1) * local_3250;
        local_3d0 = local_31e0._0_8_;
        uStack_3c8 = local_31e0._8_8_;
        local_2260 = ZEXT116(0) * local_3260 + ZEXT116(1) * local_31e0;
        auVar7 = ZEXT116(1) * local_3260;
        local_3e0 = local_31f0._0_8_;
        uStack_3d8 = local_31f0._8_8_;
        local_2280 = ZEXT116(0) * local_3270 + ZEXT116(1) * local_31f0;
        auVar8 = ZEXT116(1) * local_3270;
        local_3f0 = local_3200._0_8_;
        uStack_3e8 = local_3200._8_8_;
        local_22a0 = ZEXT116(0) * local_3280 + ZEXT116(1) * local_3200;
        auVar9 = ZEXT116(1) * local_3280;
        local_400 = local_3210._0_8_;
        uStack_3f8 = local_3210._8_8_;
        local_22c0 = ZEXT116(0) * local_3290 + ZEXT116(1) * local_3210;
        auVar10 = ZEXT116(1) * local_3290;
        local_410 = local_3220._0_8_;
        uStack_408 = local_3220._8_8_;
        local_22e0 = ZEXT116(0) * local_32a0 + ZEXT116(1) * local_3220;
        auVar11 = ZEXT116(1) * local_32a0;
        local_420 = local_3230._0_8_;
        uStack_418 = local_3230._8_8_;
        local_2300 = ZEXT116(0) * local_32b0 + ZEXT116(1) * local_3230;
        auVar12 = ZEXT116(1) * local_32b0;
        local_430 = local_3240._0_8_;
        uStack_428 = local_3240._8_8_;
        local_2320 = ZEXT116(0) * local_32c0 + ZEXT116(1) * local_3240;
        auVar13 = ZEXT116(1) * local_32c0;
        local_32e0._16_8_ = auVar6._0_8_;
        uStack_2230 = local_32e0._16_8_;
        local_32e0._24_8_ = auVar6._8_8_;
        uStack_2228 = local_32e0._24_8_;
        local_3300._16_8_ = auVar7._0_8_;
        uStack_2250 = local_3300._16_8_;
        local_3300._24_8_ = auVar7._8_8_;
        uStack_2248 = local_3300._24_8_;
        auVar20._16_8_ = local_32e0._16_8_;
        auVar20._0_16_ = local_2240;
        auVar20._24_8_ = local_32e0._24_8_;
        auVar16._16_8_ = local_3300._16_8_;
        auVar16._0_16_ = local_2260;
        auVar16._24_8_ = local_3300._24_8_;
        auVar20 = vpunpcklwd_avx2(auVar20,auVar16);
        local_4800 = auVar20._0_8_;
        local_33e0 = local_4800;
        uStack_47f8 = auVar20._8_8_;
        uStack_33d8 = uStack_47f8;
        uStack_47f0 = auVar20._16_8_;
        uStack_33d0 = uStack_47f0;
        uStack_47e8 = auVar20._24_8_;
        uStack_33c8 = uStack_47e8;
        uStack_1e30 = local_32e0._16_8_;
        uStack_1e28 = local_32e0._24_8_;
        uStack_1e50 = local_3300._16_8_;
        uStack_1e48 = local_3300._24_8_;
        auVar26._16_8_ = local_32e0._16_8_;
        auVar26._0_16_ = local_2240;
        auVar26._24_8_ = local_32e0._24_8_;
        auVar25._16_8_ = local_3300._16_8_;
        auVar25._0_16_ = local_2260;
        auVar25._24_8_ = local_3300._24_8_;
        auVar16 = vpunpckhwd_avx2(auVar26,auVar25);
        local_4820 = auVar16._0_8_;
        local_3400 = local_4820;
        uStack_4818 = auVar16._8_8_;
        uStack_33f8 = uStack_4818;
        uStack_4810 = auVar16._16_8_;
        uStack_33f0 = uStack_4810;
        uStack_4808 = auVar16._24_8_;
        uStack_33e8 = uStack_4808;
        local_3320._16_8_ = auVar8._0_8_;
        uStack_2270 = local_3320._16_8_;
        local_3320._24_8_ = auVar8._8_8_;
        uStack_2268 = local_3320._24_8_;
        local_3340._16_8_ = auVar9._0_8_;
        uStack_2290 = local_3340._16_8_;
        local_3340._24_8_ = auVar9._8_8_;
        uStack_2288 = local_3340._24_8_;
        auVar21._16_8_ = local_3320._16_8_;
        auVar21._0_16_ = local_2280;
        auVar21._24_8_ = local_3320._24_8_;
        auVar17._16_8_ = local_3340._16_8_;
        auVar17._0_16_ = local_22a0;
        auVar17._24_8_ = local_3340._24_8_;
        auVar21 = vpunpcklwd_avx2(auVar21,auVar17);
        local_4840 = auVar21._0_8_;
        local_3420 = local_4840;
        uStack_4838 = auVar21._8_8_;
        uStack_3418 = uStack_4838;
        uStack_4830 = auVar21._16_8_;
        uStack_3410 = uStack_4830;
        uStack_4828 = auVar21._24_8_;
        uStack_3408 = uStack_4828;
        uStack_1e70 = local_3320._16_8_;
        uStack_1e68 = local_3320._24_8_;
        uStack_1e90 = local_3340._16_8_;
        uStack_1e88 = local_3340._24_8_;
        auVar24._16_8_ = local_3320._16_8_;
        auVar24._0_16_ = local_2280;
        auVar24._24_8_ = local_3320._24_8_;
        auVar5._16_8_ = local_3340._16_8_;
        auVar5._0_16_ = local_22a0;
        auVar5._24_8_ = local_3340._24_8_;
        auVar17 = vpunpckhwd_avx2(auVar24,auVar5);
        local_4860 = auVar17._0_8_;
        local_3440 = local_4860;
        uStack_4858 = auVar17._8_8_;
        uStack_3438 = uStack_4858;
        uStack_4850 = auVar17._16_8_;
        uStack_3430 = uStack_4850;
        uStack_4848 = auVar17._24_8_;
        uStack_3428 = uStack_4848;
        local_3360._16_8_ = auVar10._0_8_;
        uStack_22b0 = local_3360._16_8_;
        local_3360._24_8_ = auVar10._8_8_;
        uStack_22a8 = local_3360._24_8_;
        local_3380._16_8_ = auVar11._0_8_;
        uStack_22d0 = local_3380._16_8_;
        local_3380._24_8_ = auVar11._8_8_;
        uStack_22c8 = local_3380._24_8_;
        auVar22._16_8_ = local_3360._16_8_;
        auVar22._0_16_ = local_22c0;
        auVar22._24_8_ = local_3360._24_8_;
        auVar18._16_8_ = local_3380._16_8_;
        auVar18._0_16_ = local_22e0;
        auVar18._24_8_ = local_3380._24_8_;
        auVar22 = vpunpcklwd_avx2(auVar22,auVar18);
        local_4880 = auVar22._0_8_;
        local_3460 = local_4880;
        uStack_4878 = auVar22._8_8_;
        uStack_3458 = uStack_4878;
        uStack_4870 = auVar22._16_8_;
        uStack_3450 = uStack_4870;
        uStack_4868 = auVar22._24_8_;
        uStack_3448 = uStack_4868;
        uStack_1eb0 = local_3360._16_8_;
        uStack_1ea8 = local_3360._24_8_;
        uStack_1ed0 = local_3380._16_8_;
        uStack_1ec8 = local_3380._24_8_;
        auVar4._16_8_ = local_3360._16_8_;
        auVar4._0_16_ = local_22c0;
        auVar4._24_8_ = local_3360._24_8_;
        auVar34._16_8_ = local_3380._16_8_;
        auVar34._0_16_ = local_22e0;
        auVar34._24_8_ = local_3380._24_8_;
        auVar18 = vpunpckhwd_avx2(auVar4,auVar34);
        local_48a0 = auVar18._0_8_;
        local_3480 = local_48a0;
        uStack_4898 = auVar18._8_8_;
        uStack_3478 = uStack_4898;
        uStack_4890 = auVar18._16_8_;
        uStack_3470 = uStack_4890;
        uStack_4888 = auVar18._24_8_;
        uStack_3468 = uStack_4888;
        local_33a0._16_8_ = auVar12._0_8_;
        uStack_22f0 = local_33a0._16_8_;
        local_33a0._24_8_ = auVar12._8_8_;
        uStack_22e8 = local_33a0._24_8_;
        local_33c0._16_8_ = auVar13._0_8_;
        uStack_2310 = local_33c0._16_8_;
        local_33c0._24_8_ = auVar13._8_8_;
        uStack_2308 = local_33c0._24_8_;
        auVar23._16_8_ = local_33a0._16_8_;
        auVar23._0_16_ = local_2300;
        auVar23._24_8_ = local_33a0._24_8_;
        auVar19._16_8_ = local_33c0._16_8_;
        auVar19._0_16_ = local_2320;
        auVar19._24_8_ = local_33c0._24_8_;
        auVar23 = vpunpcklwd_avx2(auVar23,auVar19);
        local_48c0 = auVar23._0_8_;
        local_34a0 = local_48c0;
        uStack_48b8 = auVar23._8_8_;
        uStack_3498 = uStack_48b8;
        uStack_48b0 = auVar23._16_8_;
        uStack_3490 = uStack_48b0;
        uStack_48a8 = auVar23._24_8_;
        uStack_3488 = uStack_48a8;
        uStack_1ef0 = local_33a0._16_8_;
        uStack_1ee8 = local_33a0._24_8_;
        uStack_1f10 = local_33c0._16_8_;
        uStack_1f08 = local_33c0._24_8_;
        auVar33._16_8_ = local_33a0._16_8_;
        auVar33._0_16_ = local_2300;
        auVar33._24_8_ = local_33a0._24_8_;
        auVar32._16_8_ = local_33c0._16_8_;
        auVar32._0_16_ = local_2320;
        auVar32._24_8_ = local_33c0._24_8_;
        auVar19 = vpunpckhwd_avx2(auVar33,auVar32);
        local_48e0 = auVar19._0_8_;
        local_34c0 = local_48e0;
        uStack_48d8 = auVar19._8_8_;
        uStack_34b8 = uStack_48d8;
        uStack_48d0 = auVar19._16_8_;
        uStack_34b0 = uStack_48d0;
        uStack_48c8 = auVar19._24_8_;
        uStack_34a8 = uStack_48c8;
        local_1a40 = local_4800;
        uStack_1a38 = uStack_47f8;
        uStack_1a30 = uStack_47f0;
        uStack_1a28 = uStack_47e8;
        local_1a60 = local_4840;
        uStack_1a58 = uStack_4838;
        uStack_1a50 = uStack_4830;
        uStack_1a48 = uStack_4828;
        auVar32 = vpunpckldq_avx2(auVar20,auVar21);
        local_4900 = auVar32._0_8_;
        local_34e0 = local_4900;
        uStack_48f8 = auVar32._8_8_;
        uStack_34d8 = uStack_48f8;
        uStack_48f0 = auVar32._16_8_;
        uStack_34d0 = uStack_48f0;
        uStack_48e8 = auVar32._24_8_;
        uStack_34c8 = uStack_48e8;
        local_1640 = local_4800;
        uStack_1638 = uStack_47f8;
        uStack_1630 = uStack_47f0;
        uStack_1628 = uStack_47e8;
        local_1660 = local_4840;
        uStack_1658 = uStack_4838;
        uStack_1650 = uStack_4830;
        uStack_1648 = uStack_4828;
        auVar20 = vpunpckhdq_avx2(auVar20,auVar21);
        local_4920 = auVar20._0_8_;
        local_3500 = local_4920;
        uStack_4918 = auVar20._8_8_;
        uStack_34f8 = uStack_4918;
        uStack_4910 = auVar20._16_8_;
        uStack_34f0 = uStack_4910;
        uStack_4908 = auVar20._24_8_;
        uStack_34e8 = uStack_4908;
        local_1a80 = local_4820;
        uStack_1a78 = uStack_4818;
        uStack_1a70 = uStack_4810;
        uStack_1a68 = uStack_4808;
        local_1aa0 = local_4860;
        uStack_1a98 = uStack_4858;
        uStack_1a90 = uStack_4850;
        uStack_1a88 = uStack_4848;
        auVar21 = vpunpckldq_avx2(auVar16,auVar17);
        local_4940 = auVar21._0_8_;
        local_3520 = local_4940;
        uStack_4938 = auVar21._8_8_;
        uStack_3518 = uStack_4938;
        uStack_4930 = auVar21._16_8_;
        uStack_3510 = uStack_4930;
        uStack_4928 = auVar21._24_8_;
        uStack_3508 = uStack_4928;
        local_1680 = local_4820;
        uStack_1678 = uStack_4818;
        uStack_1670 = uStack_4810;
        uStack_1668 = uStack_4808;
        local_16a0 = local_4860;
        uStack_1698 = uStack_4858;
        uStack_1690 = uStack_4850;
        uStack_1688 = uStack_4848;
        auVar16 = vpunpckhdq_avx2(auVar16,auVar17);
        local_4960 = auVar16._0_8_;
        local_3540 = local_4960;
        uStack_4958 = auVar16._8_8_;
        uStack_3538 = uStack_4958;
        uStack_4950 = auVar16._16_8_;
        uStack_3530 = uStack_4950;
        uStack_4948 = auVar16._24_8_;
        uStack_3528 = uStack_4948;
        local_1ac0 = local_4880;
        uStack_1ab8 = uStack_4878;
        uStack_1ab0 = uStack_4870;
        uStack_1aa8 = uStack_4868;
        local_1ae0 = local_48c0;
        uStack_1ad8 = uStack_48b8;
        uStack_1ad0 = uStack_48b0;
        uStack_1ac8 = uStack_48a8;
        auVar33 = vpunpckldq_avx2(auVar22,auVar23);
        local_4980 = auVar33._0_8_;
        local_3560 = local_4980;
        uStack_4978 = auVar33._8_8_;
        uStack_3558 = uStack_4978;
        uStack_4970 = auVar33._16_8_;
        uStack_3550 = uStack_4970;
        uStack_4968 = auVar33._24_8_;
        uStack_3548 = uStack_4968;
        local_16c0 = local_4880;
        uStack_16b8 = uStack_4878;
        uStack_16b0 = uStack_4870;
        uStack_16a8 = uStack_4868;
        local_16e0 = local_48c0;
        uStack_16d8 = uStack_48b8;
        uStack_16d0 = uStack_48b0;
        uStack_16c8 = uStack_48a8;
        auVar17 = vpunpckhdq_avx2(auVar22,auVar23);
        local_49a0 = auVar17._0_8_;
        local_3580 = local_49a0;
        uStack_4998 = auVar17._8_8_;
        uStack_3578 = uStack_4998;
        uStack_4990 = auVar17._16_8_;
        uStack_3570 = uStack_4990;
        uStack_4988 = auVar17._24_8_;
        uStack_3568 = uStack_4988;
        local_1b00 = local_48a0;
        uStack_1af8 = uStack_4898;
        uStack_1af0 = uStack_4890;
        uStack_1ae8 = uStack_4888;
        local_1b20 = local_48e0;
        uStack_1b18 = uStack_48d8;
        uStack_1b10 = uStack_48d0;
        uStack_1b08 = uStack_48c8;
        auVar22 = vpunpckldq_avx2(auVar18,auVar19);
        local_49c0 = auVar22._0_8_;
        local_35a0 = local_49c0;
        uStack_49b8 = auVar22._8_8_;
        uStack_3598 = uStack_49b8;
        uStack_49b0 = auVar22._16_8_;
        uStack_3590 = uStack_49b0;
        uStack_49a8 = auVar22._24_8_;
        uStack_3588 = uStack_49a8;
        local_1700 = local_48a0;
        uStack_16f8 = uStack_4898;
        uStack_16f0 = uStack_4890;
        uStack_16e8 = uStack_4888;
        local_1720 = local_48e0;
        uStack_1718 = uStack_48d8;
        uStack_1710 = uStack_48d0;
        uStack_1708 = uStack_48c8;
        auVar18 = vpunpckhdq_avx2(auVar18,auVar19);
        local_49e0 = auVar18._0_8_;
        local_35c0 = local_49e0;
        uStack_49d8 = auVar18._8_8_;
        uStack_35b8 = uStack_49d8;
        uStack_49d0 = auVar18._16_8_;
        uStack_35b0 = uStack_49d0;
        uStack_49c8 = auVar18._24_8_;
        uStack_35a8 = uStack_49c8;
        local_1240 = local_4900;
        uStack_1238 = uStack_48f8;
        uStack_1230 = uStack_48f0;
        uStack_1228 = uStack_48e8;
        local_1260 = local_4980;
        uStack_1258 = uStack_4978;
        uStack_1250 = uStack_4970;
        uStack_1248 = uStack_4968;
        local_32e0 = vpunpcklqdq_avx2(auVar32,auVar33);
        uStack_49e8 = local_32e0._24_8_;
        local_e40 = local_4900;
        uStack_e38 = uStack_48f8;
        uStack_e30 = uStack_48f0;
        uStack_e28 = uStack_48e8;
        local_e60 = local_4980;
        uStack_e58 = uStack_4978;
        uStack_e50 = uStack_4970;
        uStack_e48 = uStack_4968;
        local_3300 = vpunpckhqdq_avx2(auVar32,auVar33);
        uStack_4a08 = local_3300._24_8_;
        local_1280 = local_4920;
        uStack_1278 = uStack_4918;
        uStack_1270 = uStack_4910;
        uStack_1268 = uStack_4908;
        local_12a0 = local_49a0;
        uStack_1298 = uStack_4998;
        uStack_1290 = uStack_4990;
        uStack_1288 = uStack_4988;
        local_3320 = vpunpcklqdq_avx2(auVar20,auVar17);
        uStack_4a28 = local_3320._24_8_;
        local_e80 = local_4920;
        uStack_e78 = uStack_4918;
        uStack_e70 = uStack_4910;
        uStack_e68 = uStack_4908;
        local_ea0 = local_49a0;
        uStack_e98 = uStack_4998;
        uStack_e90 = uStack_4990;
        uStack_e88 = uStack_4988;
        local_3340 = vpunpckhqdq_avx2(auVar20,auVar17);
        uStack_4a48 = local_3340._24_8_;
        local_12c0 = local_4940;
        uStack_12b8 = uStack_4938;
        uStack_12b0 = uStack_4930;
        uStack_12a8 = uStack_4928;
        local_12e0 = local_49c0;
        uStack_12d8 = uStack_49b8;
        uStack_12d0 = uStack_49b0;
        uStack_12c8 = uStack_49a8;
        local_3360 = vpunpcklqdq_avx2(auVar21,auVar22);
        uStack_4a68 = local_3360._24_8_;
        local_ec0 = local_4940;
        uStack_eb8 = uStack_4938;
        uStack_eb0 = uStack_4930;
        uStack_ea8 = uStack_4928;
        local_ee0 = local_49c0;
        uStack_ed8 = uStack_49b8;
        uStack_ed0 = uStack_49b0;
        uStack_ec8 = uStack_49a8;
        local_3380 = vpunpckhqdq_avx2(auVar21,auVar22);
        uStack_4a88 = local_3380._24_8_;
        local_1300 = local_4960;
        uStack_12f8 = uStack_4958;
        uStack_12f0 = uStack_4950;
        uStack_12e8 = uStack_4948;
        local_1320 = local_49e0;
        uStack_1318 = uStack_49d8;
        uStack_1310 = uStack_49d0;
        uStack_1308 = uStack_49c8;
        local_33a0 = vpunpcklqdq_avx2(auVar16,auVar18);
        uStack_4aa8 = local_33a0._24_8_;
        local_f00 = local_4960;
        uStack_ef8 = uStack_4958;
        uStack_ef0 = uStack_4950;
        uStack_ee8 = uStack_4948;
        local_f20 = local_49e0;
        uStack_f18 = uStack_49d8;
        uStack_f10 = uStack_49d0;
        uStack_f08 = uStack_49c8;
        local_33c0 = vpunpckhqdq_avx2(auVar16,auVar18);
        local_4ae0 = local_33c0._0_8_;
        uStack_4ac8 = local_33c0._24_8_;
        local_828 = local_2b38;
        local_860 = local_32e0._0_8_;
        uStack_858 = local_32e0._8_8_;
        uStack_850 = local_32e0._16_8_;
        uStack_848 = uStack_49e8;
        *(undefined8 *)local_2b38 = local_32e0._0_8_;
        *(undefined8 *)(local_2b38 + 4) = local_32e0._8_8_;
        *(undefined8 *)(local_2b38 + 8) = local_32e0._16_8_;
        *(undefined8 *)(local_2b38 + 0xc) = uStack_49e8;
        local_868 = local_2b38 + 0x10;
        local_8a0 = local_3300._0_8_;
        uStack_898 = local_3300._8_8_;
        uStack_890 = local_3300._16_8_;
        uStack_888 = uStack_4a08;
        *(undefined8 *)local_868 = local_3300._0_8_;
        *(undefined8 *)(local_2b38 + 0x14) = local_3300._8_8_;
        *(undefined8 *)(local_2b38 + 0x18) = local_3300._16_8_;
        *(undefined8 *)(local_2b38 + 0x1c) = uStack_4a08;
        local_8a8 = local_2b38 + 0x20;
        local_8e0 = local_3320._0_8_;
        uStack_8d8 = local_3320._8_8_;
        uStack_8d0 = local_3320._16_8_;
        uStack_8c8 = uStack_4a28;
        *(undefined8 *)local_8a8 = local_3320._0_8_;
        *(undefined8 *)(local_2b38 + 0x24) = local_3320._8_8_;
        *(undefined8 *)(local_2b38 + 0x28) = local_3320._16_8_;
        *(undefined8 *)(local_2b38 + 0x2c) = uStack_4a28;
        local_8e8 = local_2b38 + 0x30;
        local_920 = local_3340._0_8_;
        uStack_918 = local_3340._8_8_;
        uStack_910 = local_3340._16_8_;
        uStack_908 = uStack_4a48;
        *(undefined8 *)local_8e8 = local_3340._0_8_;
        *(undefined8 *)(local_2b38 + 0x34) = local_3340._8_8_;
        *(undefined8 *)(local_2b38 + 0x38) = local_3340._16_8_;
        *(undefined8 *)(local_2b38 + 0x3c) = uStack_4a48;
        local_928 = local_2b38 + 0x40;
        local_960 = local_3360._0_8_;
        uStack_958 = local_3360._8_8_;
        uStack_950 = local_3360._16_8_;
        uStack_948 = uStack_4a68;
        *(undefined8 *)local_928 = local_3360._0_8_;
        *(undefined8 *)(local_2b38 + 0x44) = local_3360._8_8_;
        *(undefined8 *)(local_2b38 + 0x48) = local_3360._16_8_;
        *(undefined8 *)(local_2b38 + 0x4c) = uStack_4a68;
        local_968 = local_2b38 + 0x50;
        local_9a0 = local_3380._0_8_;
        uStack_998 = local_3380._8_8_;
        uStack_990 = local_3380._16_8_;
        uStack_988 = uStack_4a88;
        *(undefined8 *)local_968 = local_3380._0_8_;
        *(undefined8 *)(local_2b38 + 0x54) = local_3380._8_8_;
        *(undefined8 *)(local_2b38 + 0x58) = local_3380._16_8_;
        *(undefined8 *)(local_2b38 + 0x5c) = uStack_4a88;
        local_9a8 = local_2b38 + 0x60;
        local_9e0 = local_33a0._0_8_;
        uStack_9d8 = local_33a0._8_8_;
        uStack_9d0 = local_33a0._16_8_;
        uStack_9c8 = uStack_4aa8;
        *(undefined8 *)local_9a8 = local_33a0._0_8_;
        *(undefined8 *)(local_2b38 + 100) = local_33a0._8_8_;
        *(undefined8 *)(local_2b38 + 0x68) = local_33a0._16_8_;
        *(undefined8 *)(local_2b38 + 0x6c) = uStack_4aa8;
        local_9e8 = (undefined1 (*) [32])(local_2b38 + 0x70);
        local_a20 = local_4ae0;
        uStack_a18 = local_33c0._8_8_;
        uStack_a10 = local_33c0._16_8_;
        uStack_a08 = uStack_4ac8;
        *local_9e8 = local_33c0;
        local_2b40 = (undefined1 (*) [64])(*local_2b40 + 0x20);
        local_2b48 = (undefined1 (*) [64])(*local_2b48 + 0x20);
        local_2b50 = (undefined1 (*) [64])(*local_2b50 + 0x20);
        local_2b58 = (undefined1 (*) [64])(*local_2b58 + 0x20);
        local_2b60 = (undefined1 (*) [64])(*local_2b60 + 0x20);
        local_2b68 = (undefined1 (*) [64])(*local_2b68 + 0x20);
        local_2b70 = (undefined1 (*) [64])(*local_2b70 + 0x20);
        local_2b78 = (undefined1 (*) [64])(*local_2b78 + 0x20);
        local_2b80 = (undefined1 (*) [64])(*local_2b80 + 0x20);
        local_2b88 = (undefined1 (*) [64])(*local_2b88 + 0x20);
        local_2b90 = (undefined1 (*) [64])(*local_2b90 + 0x20);
        local_2b98 = (undefined1 (*) [64])(*local_2b98 + 0x20);
        local_2ba0 = (undefined1 (*) [64])(*local_2ba0 + 0x20);
        local_2ba8 = (undefined1 (*) [64])(*local_2ba8 + 0x20);
        local_2bb0 = (undefined1 (*) [64])(*local_2bb0 + 0x20);
        local_2bb8 = (undefined1 (*) [64])(*local_2bb8 + 0x20);
        local_2b38 = local_2b38 + 0x80;
        local_1e40 = local_2240;
        local_1e60 = local_2260;
        local_1e80 = local_2280;
        local_1ea0 = local_22a0;
        local_1ec0 = local_22c0;
        local_1ee0 = local_22e0;
        local_1f00 = local_2300;
        local_1f20 = local_2320;
      }
      for (; local_2bbc < local_2ac4; local_2bbc = local_2bbc + 1) {
        puVar14 = *local_2b40;
        local_2b40 = (undefined1 (*) [64])(*local_2b40 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        *local_2b38 = uVar15;
        puVar14 = *local_2b48;
        local_2b48 = (undefined1 (*) [64])(*local_2b48 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        local_2b38[1] = uVar15;
        puVar14 = *local_2b50;
        local_2b50 = (undefined1 (*) [64])(*local_2b50 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        local_2b38[2] = uVar15;
        puVar14 = *local_2b58;
        local_2b58 = (undefined1 (*) [64])(*local_2b58 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        local_2b38[3] = uVar15;
        puVar14 = *local_2b60;
        local_2b60 = (undefined1 (*) [64])(*local_2b60 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        local_2b38[4] = uVar15;
        puVar14 = *local_2b68;
        local_2b68 = (undefined1 (*) [64])(*local_2b68 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        local_2b38[5] = uVar15;
        puVar14 = *local_2b70;
        local_2b70 = (undefined1 (*) [64])(*local_2b70 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        local_2b38[6] = uVar15;
        puVar14 = *local_2b78;
        local_2b78 = (undefined1 (*) [64])(*local_2b78 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        local_2b38[7] = uVar15;
        puVar14 = *local_2b80;
        local_2b80 = (undefined1 (*) [64])(*local_2b80 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        local_2b38[8] = uVar15;
        puVar14 = *local_2b88;
        local_2b88 = (undefined1 (*) [64])(*local_2b88 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        local_2b38[9] = uVar15;
        puVar14 = *local_2b90;
        local_2b90 = (undefined1 (*) [64])(*local_2b90 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        local_2b38[10] = uVar15;
        puVar14 = *local_2b98;
        local_2b98 = (undefined1 (*) [64])(*local_2b98 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        local_2b38[0xb] = uVar15;
        puVar14 = *local_2ba0;
        local_2ba0 = (undefined1 (*) [64])(*local_2ba0 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        local_2b38[0xc] = uVar15;
        puVar14 = *local_2ba8;
        local_2ba8 = (undefined1 (*) [64])(*local_2ba8 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        local_2b38[0xd] = uVar15;
        puVar14 = *local_2bb0;
        local_2bb0 = (undefined1 (*) [64])(*local_2bb0 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        local_2b38[0xe] = uVar15;
        puVar14 = *local_2bb8;
        local_2bb8 = (undefined1 (*) [64])(*local_2bb8 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        local_2b38[0xf] = uVar15;
        local_2b38 = local_2b38 + 0x10;
      }
    }
    local_2ab0 = &local_2b20;
    local_2838 = local_2ab0;
    if (local_2b18 != (int *)0x0) {
      local_283c = 0xffffffff;
      LOCK();
      local_2840 = *local_2b18;
      *local_2b18 = *local_2b18 + -1;
      UNLOCK();
      if (local_2840 == 1) {
        if (local_2b00 == (long *)0x0) {
          if (local_2b20 != (void *)0x0) {
            free(local_2b20);
          }
        }
        else {
          (**(code **)(*local_2b00 + 0x18))(local_2b00,local_2b20);
        }
      }
    }
    local_2b20 = (void *)0x0;
    local_2b10 = 0;
    local_2b08 = 0;
    local_2af8 = 0;
    local_2af4 = 0;
    local_2af0 = 0;
    local_2aec = 0;
    local_2ae8 = 0;
    local_2ae0 = 0;
    local_2b18 = (int *)0x0;
  }
  _elempack = (int)((ulong)in_stack_ffffffffffffada0 >> 0x20);
  if (local_2ad4 == 8) {
    Mat::reshape(in_stack_ffffffffffffae10,(int)((ulong)in_stack_ffffffffffffae08 >> 0x20),
                 (int)in_stack_ffffffffffffae08,in_stack_ffffffffffffae00);
    Mat::create(in_stack_ffffffffffffadb8,in_stack_ffffffffffffadb4,in_stack_ffffffffffffadb0,
                in_stack_ffffffffffffada8,(int)((ulong)in_stack_ffffffffffffada0 >> 0x20),
                in_stack_ffffffffffffad98);
    for (local_360c = 0; _elempack = (int)((ulong)in_stack_ffffffffffffada0 >> 0x20),
        local_360c + 7 < local_2ac8; local_360c = local_360c + 8) {
      local_243c = local_360c / 8;
      local_2438 = local_2ac0;
      local_3618 = (unsigned_short *)
                   (*local_2ac0 +
                   (long)*(int *)((long)local_2ac0 + 0x2c) * (long)local_243c * local_2ac0[2]);
      local_29b8 = &local_3608;
      local_29bc = local_360c;
      local_3620 = (undefined1 (*) [64])
                   ((long)local_3608 + (long)local_35dc * (long)local_360c * local_35f8);
      local_29cc = local_360c + 1;
      local_29c8 = &local_3608;
      local_3628 = (undefined1 (*) [64])
                   ((long)local_3608 + (long)local_35dc * (long)local_29cc * local_35f8);
      local_29dc = local_360c + 2;
      local_29d8 = &local_3608;
      local_3630 = (undefined1 (*) [64])
                   ((long)local_3608 + (long)local_35dc * (long)local_29dc * local_35f8);
      local_29ec = local_360c + 3;
      local_29e8 = &local_3608;
      local_3638 = (undefined1 (*) [64])
                   ((long)local_3608 + (long)local_35dc * (long)local_29ec * local_35f8);
      local_29fc = local_360c + 4;
      local_29f8 = &local_3608;
      local_3640 = (undefined1 (*) [64])
                   ((long)local_3608 + (long)local_35dc * (long)local_29fc * local_35f8);
      local_2a0c = local_360c + 5;
      local_2a08 = &local_3608;
      local_3648 = (undefined1 (*) [64])
                   ((long)local_3608 + (long)local_35dc * (long)local_2a0c * local_35f8);
      local_2a1c = local_360c + 6;
      local_2a18 = &local_3608;
      local_3650 = (undefined1 (*) [64])
                   ((long)local_3608 + (long)local_35dc * (long)local_2a1c * local_35f8);
      local_2a2c = local_360c + 7;
      local_2a28 = &local_3608;
      local_3658 = (undefined1 (*) [64])
                   ((long)local_3608 + (long)local_35dc * (long)local_2a2c * local_35f8);
      for (local_365c = 0; local_365c + 0xf < local_2ac4; local_365c = local_365c + 0x10) {
        local_27f8 = local_3620;
        auVar16 = vcvtps2ph_avx512f(*local_3620,3);
        local_3680._0_8_ = auVar16._0_8_;
        local_2800 = local_3628;
        auVar17 = vcvtps2ph_avx512f(*local_3628,3);
        local_36a0._0_8_ = auVar17._0_8_;
        local_2808 = local_3630;
        auVar18 = vcvtps2ph_avx512f(*local_3630,3);
        local_36c0._0_8_ = auVar18._0_8_;
        local_2810 = local_3638;
        auVar19 = vcvtps2ph_avx512f(*local_3638,3);
        local_36e0._0_8_ = auVar19._0_8_;
        local_2818 = local_3640;
        auVar23 = vcvtps2ph_avx512f(*local_3640,3);
        local_3700._0_8_ = auVar23._0_8_;
        local_2820 = local_3648;
        auVar32 = vcvtps2ph_avx512f(*local_3648,3);
        local_3720._0_8_ = auVar32._0_8_;
        local_2828 = local_3650;
        auVar33 = vcvtps2ph_avx512f(*local_3650,3);
        local_3740._0_8_ = auVar33._0_8_;
        local_2830 = local_3658;
        auVar34 = vcvtps2ph_avx512f(*local_3658,3);
        local_3760._0_8_ = auVar34._0_8_;
        local_2340 = local_3680._0_8_;
        local_3680._8_8_ = auVar16._8_8_;
        uStack_2338 = local_3680._8_8_;
        local_3680._16_8_ = auVar16._16_8_;
        uStack_2330 = local_3680._16_8_;
        local_3680._24_8_ = auVar16._24_8_;
        uStack_2328 = local_3680._24_8_;
        local_2360 = local_36a0._0_8_;
        local_36a0._8_8_ = auVar17._8_8_;
        uStack_2358 = local_36a0._8_8_;
        local_36a0._16_8_ = auVar17._16_8_;
        uStack_2350 = local_36a0._16_8_;
        local_36a0._24_8_ = auVar17._24_8_;
        uStack_2348 = local_36a0._24_8_;
        auVar20 = vpunpcklwd_avx2(auVar16,auVar17);
        local_4d60 = auVar20._0_8_;
        uStack_4d58 = auVar20._8_8_;
        uStack_4d50 = auVar20._16_8_;
        uStack_4d48 = auVar20._24_8_;
        local_1f40 = local_3680._0_8_;
        uStack_1f38 = local_3680._8_8_;
        uStack_1f30 = local_3680._16_8_;
        uStack_1f28 = local_3680._24_8_;
        local_1f60 = local_36a0._0_8_;
        uStack_1f58 = local_36a0._8_8_;
        uStack_1f50 = local_36a0._16_8_;
        uStack_1f48 = local_36a0._24_8_;
        auVar16 = vpunpckhwd_avx2(auVar16,auVar17);
        local_4d80 = auVar16._0_8_;
        uStack_4d78 = auVar16._8_8_;
        uStack_4d70 = auVar16._16_8_;
        uStack_4d68 = auVar16._24_8_;
        local_2380 = local_36c0._0_8_;
        local_36c0._8_8_ = auVar18._8_8_;
        uStack_2378 = local_36c0._8_8_;
        local_36c0._16_8_ = auVar18._16_8_;
        uStack_2370 = local_36c0._16_8_;
        local_36c0._24_8_ = auVar18._24_8_;
        uStack_2368 = local_36c0._24_8_;
        local_23a0 = local_36e0._0_8_;
        local_36e0._8_8_ = auVar19._8_8_;
        uStack_2398 = local_36e0._8_8_;
        local_36e0._16_8_ = auVar19._16_8_;
        uStack_2390 = local_36e0._16_8_;
        local_36e0._24_8_ = auVar19._24_8_;
        uStack_2388 = local_36e0._24_8_;
        auVar21 = vpunpcklwd_avx2(auVar18,auVar19);
        local_4da0 = auVar21._0_8_;
        uStack_4d98 = auVar21._8_8_;
        uStack_4d90 = auVar21._16_8_;
        uStack_4d88 = auVar21._24_8_;
        local_1f80 = local_36c0._0_8_;
        uStack_1f78 = local_36c0._8_8_;
        uStack_1f70 = local_36c0._16_8_;
        uStack_1f68 = local_36c0._24_8_;
        local_1fa0 = local_36e0._0_8_;
        uStack_1f98 = local_36e0._8_8_;
        uStack_1f90 = local_36e0._16_8_;
        uStack_1f88 = local_36e0._24_8_;
        auVar17 = vpunpckhwd_avx2(auVar18,auVar19);
        local_4dc0 = auVar17._0_8_;
        uStack_4db8 = auVar17._8_8_;
        uStack_4db0 = auVar17._16_8_;
        uStack_4da8 = auVar17._24_8_;
        local_23c0 = local_3700._0_8_;
        local_3700._8_8_ = auVar23._8_8_;
        uStack_23b8 = local_3700._8_8_;
        local_3700._16_8_ = auVar23._16_8_;
        uStack_23b0 = local_3700._16_8_;
        local_3700._24_8_ = auVar23._24_8_;
        uStack_23a8 = local_3700._24_8_;
        local_23e0 = local_3720._0_8_;
        local_3720._8_8_ = auVar32._8_8_;
        uStack_23d8 = local_3720._8_8_;
        local_3720._16_8_ = auVar32._16_8_;
        uStack_23d0 = local_3720._16_8_;
        local_3720._24_8_ = auVar32._24_8_;
        uStack_23c8 = local_3720._24_8_;
        auVar22 = vpunpcklwd_avx2(auVar23,auVar32);
        local_4de0 = auVar22._0_8_;
        uStack_4dd8 = auVar22._8_8_;
        uStack_4dd0 = auVar22._16_8_;
        uStack_4dc8 = auVar22._24_8_;
        local_1fc0 = local_3700._0_8_;
        uStack_1fb8 = local_3700._8_8_;
        uStack_1fb0 = local_3700._16_8_;
        uStack_1fa8 = local_3700._24_8_;
        local_1fe0 = local_3720._0_8_;
        uStack_1fd8 = local_3720._8_8_;
        uStack_1fd0 = local_3720._16_8_;
        uStack_1fc8 = local_3720._24_8_;
        auVar18 = vpunpckhwd_avx2(auVar23,auVar32);
        local_4e00 = auVar18._0_8_;
        uStack_4df8 = auVar18._8_8_;
        uStack_4df0 = auVar18._16_8_;
        uStack_4de8 = auVar18._24_8_;
        local_2400 = local_3740._0_8_;
        local_3740._8_8_ = auVar33._8_8_;
        uStack_23f8 = local_3740._8_8_;
        local_3740._16_8_ = auVar33._16_8_;
        uStack_23f0 = local_3740._16_8_;
        local_3740._24_8_ = auVar33._24_8_;
        uStack_23e8 = local_3740._24_8_;
        local_2420 = local_3760._0_8_;
        local_3760._8_8_ = auVar34._8_8_;
        uStack_2418 = local_3760._8_8_;
        local_3760._16_8_ = auVar34._16_8_;
        uStack_2410 = local_3760._16_8_;
        local_3760._24_8_ = auVar34._24_8_;
        uStack_2408 = local_3760._24_8_;
        auVar23 = vpunpcklwd_avx2(auVar33,auVar34);
        local_4e20 = auVar23._0_8_;
        uStack_4e18 = auVar23._8_8_;
        uStack_4e10 = auVar23._16_8_;
        uStack_4e08 = auVar23._24_8_;
        local_2000 = local_3740._0_8_;
        uStack_1ff8 = local_3740._8_8_;
        uStack_1ff0 = local_3740._16_8_;
        uStack_1fe8 = local_3740._24_8_;
        local_2020 = local_3760._0_8_;
        uStack_2018 = local_3760._8_8_;
        uStack_2010 = local_3760._16_8_;
        uStack_2008 = local_3760._24_8_;
        auVar19 = vpunpckhwd_avx2(auVar33,auVar34);
        local_4e40 = auVar19._0_8_;
        uStack_4e38 = auVar19._8_8_;
        uStack_4e30 = auVar19._16_8_;
        uStack_4e28 = auVar19._24_8_;
        local_1b40 = local_4d60;
        uStack_1b38 = uStack_4d58;
        uStack_1b30 = uStack_4d50;
        uStack_1b28 = uStack_4d48;
        local_1b60 = local_4da0;
        uStack_1b58 = uStack_4d98;
        uStack_1b50 = uStack_4d90;
        uStack_1b48 = uStack_4d88;
        auVar32 = vpunpckldq_avx2(auVar20,auVar21);
        local_4e60 = auVar32._0_8_;
        local_3880 = local_4e60;
        uStack_4e58 = auVar32._8_8_;
        uStack_3878 = uStack_4e58;
        uStack_4e50 = auVar32._16_8_;
        uStack_3870 = uStack_4e50;
        uStack_4e48 = auVar32._24_8_;
        uStack_3868 = uStack_4e48;
        local_1740 = local_4d60;
        uStack_1738 = uStack_4d58;
        uStack_1730 = uStack_4d50;
        uStack_1728 = uStack_4d48;
        local_1760 = local_4da0;
        uStack_1758 = uStack_4d98;
        uStack_1750 = uStack_4d90;
        uStack_1748 = uStack_4d88;
        auVar20 = vpunpckhdq_avx2(auVar20,auVar21);
        local_4e80 = auVar20._0_8_;
        local_38a0 = local_4e80;
        uStack_4e78 = auVar20._8_8_;
        uStack_3898 = uStack_4e78;
        uStack_4e70 = auVar20._16_8_;
        uStack_3890 = uStack_4e70;
        uStack_4e68 = auVar20._24_8_;
        uStack_3888 = uStack_4e68;
        local_1b80 = local_4d80;
        uStack_1b78 = uStack_4d78;
        uStack_1b70 = uStack_4d70;
        uStack_1b68 = uStack_4d68;
        local_1ba0 = local_4dc0;
        uStack_1b98 = uStack_4db8;
        uStack_1b90 = uStack_4db0;
        uStack_1b88 = uStack_4da8;
        auVar21 = vpunpckldq_avx2(auVar16,auVar17);
        local_4ea0 = auVar21._0_8_;
        local_38c0 = local_4ea0;
        uStack_4e98 = auVar21._8_8_;
        uStack_38b8 = uStack_4e98;
        uStack_4e90 = auVar21._16_8_;
        uStack_38b0 = uStack_4e90;
        uStack_4e88 = auVar21._24_8_;
        uStack_38a8 = uStack_4e88;
        local_1780 = local_4d80;
        uStack_1778 = uStack_4d78;
        uStack_1770 = uStack_4d70;
        uStack_1768 = uStack_4d68;
        local_17a0 = local_4dc0;
        uStack_1798 = uStack_4db8;
        uStack_1790 = uStack_4db0;
        uStack_1788 = uStack_4da8;
        auVar16 = vpunpckhdq_avx2(auVar16,auVar17);
        local_4ec0 = auVar16._0_8_;
        local_38e0 = local_4ec0;
        uStack_4eb8 = auVar16._8_8_;
        uStack_38d8 = uStack_4eb8;
        uStack_4eb0 = auVar16._16_8_;
        uStack_38d0 = uStack_4eb0;
        uStack_4ea8 = auVar16._24_8_;
        uStack_38c8 = uStack_4ea8;
        local_1bc0 = local_4de0;
        uStack_1bb8 = uStack_4dd8;
        uStack_1bb0 = uStack_4dd0;
        uStack_1ba8 = uStack_4dc8;
        local_1be0 = local_4e20;
        uStack_1bd8 = uStack_4e18;
        uStack_1bd0 = uStack_4e10;
        uStack_1bc8 = uStack_4e08;
        auVar33 = vpunpckldq_avx2(auVar22,auVar23);
        local_4ee0 = auVar33._0_8_;
        local_3900 = local_4ee0;
        uStack_4ed8 = auVar33._8_8_;
        uStack_38f8 = uStack_4ed8;
        uStack_4ed0 = auVar33._16_8_;
        uStack_38f0 = uStack_4ed0;
        uStack_4ec8 = auVar33._24_8_;
        uStack_38e8 = uStack_4ec8;
        local_17c0 = local_4de0;
        uStack_17b8 = uStack_4dd8;
        uStack_17b0 = uStack_4dd0;
        uStack_17a8 = uStack_4dc8;
        local_17e0 = local_4e20;
        uStack_17d8 = uStack_4e18;
        uStack_17d0 = uStack_4e10;
        uStack_17c8 = uStack_4e08;
        auVar17 = vpunpckhdq_avx2(auVar22,auVar23);
        local_4f00 = auVar17._0_8_;
        local_3920 = local_4f00;
        uStack_4ef8 = auVar17._8_8_;
        uStack_3918 = uStack_4ef8;
        uStack_4ef0 = auVar17._16_8_;
        uStack_3910 = uStack_4ef0;
        uStack_4ee8 = auVar17._24_8_;
        uStack_3908 = uStack_4ee8;
        local_1c00 = local_4e00;
        uStack_1bf8 = uStack_4df8;
        uStack_1bf0 = uStack_4df0;
        uStack_1be8 = uStack_4de8;
        local_1c20 = local_4e40;
        uStack_1c18 = uStack_4e38;
        uStack_1c10 = uStack_4e30;
        uStack_1c08 = uStack_4e28;
        auVar22 = vpunpckldq_avx2(auVar18,auVar19);
        local_4f20 = auVar22._0_8_;
        local_3940 = local_4f20;
        uStack_4f18 = auVar22._8_8_;
        uStack_3938 = uStack_4f18;
        uStack_4f10 = auVar22._16_8_;
        uStack_3930 = uStack_4f10;
        uStack_4f08 = auVar22._24_8_;
        uStack_3928 = uStack_4f08;
        local_1800 = local_4e00;
        uStack_17f8 = uStack_4df8;
        uStack_17f0 = uStack_4df0;
        uStack_17e8 = uStack_4de8;
        local_1820 = local_4e40;
        uStack_1818 = uStack_4e38;
        uStack_1810 = uStack_4e30;
        uStack_1808 = uStack_4e28;
        auVar18 = vpunpckhdq_avx2(auVar18,auVar19);
        local_4f40 = auVar18._0_8_;
        local_3960 = local_4f40;
        uStack_4f38 = auVar18._8_8_;
        uStack_3958 = uStack_4f38;
        uStack_4f30 = auVar18._16_8_;
        uStack_3950 = uStack_4f30;
        uStack_4f28 = auVar18._24_8_;
        uStack_3948 = uStack_4f28;
        local_1340 = local_4e60;
        uStack_1338 = uStack_4e58;
        uStack_1330 = uStack_4e50;
        uStack_1328 = uStack_4e48;
        local_1360 = local_4ee0;
        uStack_1358 = uStack_4ed8;
        uStack_1350 = uStack_4ed0;
        uStack_1348 = uStack_4ec8;
        auVar23 = vpunpcklqdq_avx2(auVar32,auVar33);
        local_4f60 = auVar23._0_8_;
        local_3780 = local_4f60;
        uStack_4f58 = auVar23._8_8_;
        uStack_3778 = uStack_4f58;
        uStack_4f50 = auVar23._16_8_;
        uStack_3770 = uStack_4f50;
        uStack_4f48 = auVar23._24_8_;
        uStack_3768 = uStack_4f48;
        local_f40 = local_4e60;
        uStack_f38 = uStack_4e58;
        uStack_f30 = uStack_4e50;
        uStack_f28 = uStack_4e48;
        local_f60 = local_4ee0;
        uStack_f58 = uStack_4ed8;
        uStack_f50 = uStack_4ed0;
        uStack_f48 = uStack_4ec8;
        auVar19 = vpunpckhqdq_avx2(auVar32,auVar33);
        local_4f80 = auVar19._0_8_;
        local_37a0 = local_4f80;
        uStack_4f78 = auVar19._8_8_;
        uStack_3798 = uStack_4f78;
        uStack_4f70 = auVar19._16_8_;
        uStack_3790 = uStack_4f70;
        uStack_4f68 = auVar19._24_8_;
        uStack_3788 = uStack_4f68;
        local_1380 = local_4e80;
        uStack_1378 = uStack_4e78;
        uStack_1370 = uStack_4e70;
        uStack_1368 = uStack_4e68;
        local_13a0 = local_4f00;
        uStack_1398 = uStack_4ef8;
        uStack_1390 = uStack_4ef0;
        uStack_1388 = uStack_4ee8;
        auVar32 = vpunpcklqdq_avx2(auVar20,auVar17);
        local_4fa0 = auVar32._0_8_;
        local_37c0 = local_4fa0;
        uStack_4f98 = auVar32._8_8_;
        uStack_37b8 = uStack_4f98;
        uStack_4f90 = auVar32._16_8_;
        uStack_37b0 = uStack_4f90;
        uStack_4f88 = auVar32._24_8_;
        uStack_37a8 = uStack_4f88;
        local_f80 = local_4e80;
        uStack_f78 = uStack_4e78;
        uStack_f70 = uStack_4e70;
        uStack_f68 = uStack_4e68;
        local_fa0 = local_4f00;
        uStack_f98 = uStack_4ef8;
        uStack_f90 = uStack_4ef0;
        uStack_f88 = uStack_4ee8;
        auVar17 = vpunpckhqdq_avx2(auVar20,auVar17);
        local_4fc0 = auVar17._0_8_;
        local_37e0 = local_4fc0;
        uStack_4fb8 = auVar17._8_8_;
        uStack_37d8 = uStack_4fb8;
        uStack_4fb0 = auVar17._16_8_;
        uStack_37d0 = uStack_4fb0;
        uStack_4fa8 = auVar17._24_8_;
        uStack_37c8 = uStack_4fa8;
        local_13c0 = local_4ea0;
        uStack_13b8 = uStack_4e98;
        uStack_13b0 = uStack_4e90;
        uStack_13a8 = uStack_4e88;
        local_13e0 = local_4f20;
        uStack_13d8 = uStack_4f18;
        uStack_13d0 = uStack_4f10;
        uStack_13c8 = uStack_4f08;
        auVar33 = vpunpcklqdq_avx2(auVar21,auVar22);
        local_4fe0 = auVar33._0_8_;
        local_3800 = local_4fe0;
        uStack_4fd8 = auVar33._8_8_;
        uStack_37f8 = uStack_4fd8;
        uStack_4fd0 = auVar33._16_8_;
        uStack_37f0 = uStack_4fd0;
        uStack_4fc8 = auVar33._24_8_;
        uStack_37e8 = uStack_4fc8;
        local_fc0 = local_4ea0;
        uStack_fb8 = uStack_4e98;
        uStack_fb0 = uStack_4e90;
        uStack_fa8 = uStack_4e88;
        local_fe0 = local_4f20;
        uStack_fd8 = uStack_4f18;
        uStack_fd0 = uStack_4f10;
        uStack_fc8 = uStack_4f08;
        auVar20 = vpunpckhqdq_avx2(auVar21,auVar22);
        local_5000 = auVar20._0_8_;
        local_3820 = local_5000;
        uStack_4ff8 = auVar20._8_8_;
        uStack_3818 = uStack_4ff8;
        uStack_4ff0 = auVar20._16_8_;
        uStack_3810 = uStack_4ff0;
        uStack_4fe8 = auVar20._24_8_;
        uStack_3808 = uStack_4fe8;
        local_1400 = local_4ec0;
        uStack_13f8 = uStack_4eb8;
        uStack_13f0 = uStack_4eb0;
        uStack_13e8 = uStack_4ea8;
        local_1420 = local_4f40;
        uStack_1418 = uStack_4f38;
        uStack_1410 = uStack_4f30;
        uStack_1408 = uStack_4f28;
        auVar21 = vpunpcklqdq_avx2(auVar16,auVar18);
        local_5020 = auVar21._0_8_;
        local_3840 = local_5020;
        uStack_5018 = auVar21._8_8_;
        uStack_3838 = uStack_5018;
        uStack_5010 = auVar21._16_8_;
        uStack_3830 = uStack_5010;
        uStack_5008 = auVar21._24_8_;
        uStack_3828 = uStack_5008;
        local_1000 = local_4ec0;
        uStack_ff8 = uStack_4eb8;
        uStack_ff0 = uStack_4eb0;
        uStack_fe8 = uStack_4ea8;
        local_1020 = local_4f40;
        uStack_1018 = uStack_4f38;
        uStack_1010 = uStack_4f30;
        uStack_1008 = uStack_4f28;
        auVar16 = vpunpckhqdq_avx2(auVar16,auVar18);
        local_5040 = auVar16._0_8_;
        local_3860 = local_5040;
        uStack_5038 = auVar16._8_8_;
        uStack_3858 = uStack_5038;
        uStack_5030 = auVar16._16_8_;
        uStack_3850 = uStack_5030;
        uStack_5028 = auVar16._24_8_;
        uStack_3848 = uStack_5028;
        local_3680 = vperm2i128_avx2(auVar23,auVar19,0x20);
        local_36a0 = vperm2i128_avx2(auVar32,auVar17,0x20);
        local_36c0 = vperm2i128_avx2(auVar33,auVar20,0x20);
        local_36e0 = vperm2i128_avx2(auVar21,auVar16,0x20);
        local_3700 = vperm2i128_avx2(auVar23,auVar19,0x31);
        local_3720 = vperm2i128_avx2(auVar32,auVar17,0x31);
        local_3740 = vperm2i128_avx2(auVar33,auVar20,0x31);
        local_3760 = vperm2i128_avx2(auVar21,auVar16,0x31);
        local_a28 = local_3618;
        local_a60 = local_3680._0_8_;
        uStack_a58 = local_3680._8_8_;
        uStack_a50 = local_3680._16_8_;
        uStack_a48 = local_3680._24_8_;
        *(undefined8 *)local_3618 = local_3680._0_8_;
        *(undefined8 *)(local_3618 + 4) = local_3680._8_8_;
        *(undefined8 *)(local_3618 + 8) = local_3680._16_8_;
        *(undefined8 *)(local_3618 + 0xc) = local_3680._24_8_;
        local_a68 = local_3618 + 0x10;
        local_aa0 = local_36a0._0_8_;
        uStack_a98 = local_36a0._8_8_;
        uStack_a90 = local_36a0._16_8_;
        uStack_a88 = local_36a0._24_8_;
        *(undefined8 *)local_a68 = local_36a0._0_8_;
        *(undefined8 *)(local_3618 + 0x14) = local_36a0._8_8_;
        *(undefined8 *)(local_3618 + 0x18) = local_36a0._16_8_;
        *(undefined8 *)(local_3618 + 0x1c) = local_36a0._24_8_;
        local_aa8 = local_3618 + 0x20;
        local_ae0 = local_36c0._0_8_;
        uStack_ad8 = local_36c0._8_8_;
        uStack_ad0 = local_36c0._16_8_;
        uStack_ac8 = local_36c0._24_8_;
        *(undefined8 *)local_aa8 = local_36c0._0_8_;
        *(undefined8 *)(local_3618 + 0x24) = local_36c0._8_8_;
        *(undefined8 *)(local_3618 + 0x28) = local_36c0._16_8_;
        *(undefined8 *)(local_3618 + 0x2c) = local_36c0._24_8_;
        local_ae8 = local_3618 + 0x30;
        local_b20 = local_36e0._0_8_;
        uStack_b18 = local_36e0._8_8_;
        uStack_b10 = local_36e0._16_8_;
        uStack_b08 = local_36e0._24_8_;
        *(undefined8 *)local_ae8 = local_36e0._0_8_;
        *(undefined8 *)(local_3618 + 0x34) = local_36e0._8_8_;
        *(undefined8 *)(local_3618 + 0x38) = local_36e0._16_8_;
        *(undefined8 *)(local_3618 + 0x3c) = local_36e0._24_8_;
        local_b28 = local_3618 + 0x40;
        local_b60 = local_3700._0_8_;
        uStack_b58 = local_3700._8_8_;
        uStack_b50 = local_3700._16_8_;
        uStack_b48 = local_3700._24_8_;
        *(undefined8 *)local_b28 = local_3700._0_8_;
        *(undefined8 *)(local_3618 + 0x44) = local_3700._8_8_;
        *(undefined8 *)(local_3618 + 0x48) = local_3700._16_8_;
        *(undefined8 *)(local_3618 + 0x4c) = local_3700._24_8_;
        local_b68 = local_3618 + 0x50;
        local_ba0 = local_3720._0_8_;
        uStack_b98 = local_3720._8_8_;
        uStack_b90 = local_3720._16_8_;
        uStack_b88 = local_3720._24_8_;
        *(undefined8 *)local_b68 = local_3720._0_8_;
        *(undefined8 *)(local_3618 + 0x54) = local_3720._8_8_;
        *(undefined8 *)(local_3618 + 0x58) = local_3720._16_8_;
        *(undefined8 *)(local_3618 + 0x5c) = local_3720._24_8_;
        local_ba8 = local_3618 + 0x60;
        local_be0 = local_3740._0_8_;
        uStack_bd8 = local_3740._8_8_;
        uStack_bd0 = local_3740._16_8_;
        uStack_bc8 = local_3740._24_8_;
        *(undefined8 *)local_ba8 = local_3740._0_8_;
        *(undefined8 *)(local_3618 + 100) = local_3740._8_8_;
        *(undefined8 *)(local_3618 + 0x68) = local_3740._16_8_;
        *(undefined8 *)(local_3618 + 0x6c) = local_3740._24_8_;
        local_be8 = (undefined1 (*) [32])(local_3618 + 0x70);
        local_c20 = local_3760._0_8_;
        uStack_c18 = local_3760._8_8_;
        uStack_c10 = local_3760._16_8_;
        uStack_c08 = local_3760._24_8_;
        *local_be8 = local_3760;
        local_3620 = local_3620 + 1;
        local_3628 = local_3628 + 1;
        local_3630 = local_3630 + 1;
        local_3638 = local_3638 + 1;
        local_3640 = local_3640 + 1;
        local_3648 = local_3648 + 1;
        local_3650 = local_3650 + 1;
        local_3658 = local_3658 + 1;
        local_3618 = local_3618 + 0x80;
      }
      for (; local_365c + 7 < local_2ac4; local_365c = local_365c + 8) {
        local_2718 = local_3620;
        auVar6 = vcvtps2ph_f16c(*(undefined1 (*) [32])*local_3620,3);
        local_2720 = local_3628;
        auVar7 = vcvtps2ph_f16c(*(undefined1 (*) [32])*local_3628,3);
        local_2728 = local_3630;
        auVar8 = vcvtps2ph_f16c(*(undefined1 (*) [32])*local_3630,3);
        local_2730 = local_3638;
        auVar9 = vcvtps2ph_f16c(*(undefined1 (*) [32])*local_3638,3);
        local_2738 = local_3640;
        auVar10 = vcvtps2ph_f16c(*(undefined1 (*) [32])*local_3640,3);
        local_2740 = local_3648;
        auVar11 = vcvtps2ph_f16c(*(undefined1 (*) [32])*local_3648,3);
        local_2748 = local_3650;
        auVar12 = vcvtps2ph_f16c(*(undefined1 (*) [32])*local_3650,3);
        local_2750 = local_3658;
        auVar13 = vcvtps2ph_f16c(*(undefined1 (*) [32])*local_3658,3);
        local_3970._0_8_ = auVar6._0_8_;
        local_2520 = local_3970._0_8_;
        local_3970._8_8_ = auVar6._8_8_;
        uStack_2518 = local_3970._8_8_;
        local_3980._0_8_ = auVar7._0_8_;
        local_2530 = local_3980._0_8_;
        local_3980._8_8_ = auVar7._8_8_;
        uStack_2528 = local_3980._8_8_;
        auVar1 = vpunpcklwd_avx(auVar6,auVar7);
        local_5060 = auVar1._0_8_;
        local_39f0 = local_5060;
        uStack_5058 = auVar1._8_8_;
        uStack_39e8 = uStack_5058;
        local_24a0 = local_3970._0_8_;
        uStack_2498 = local_3970._8_8_;
        local_24b0 = local_3980._0_8_;
        uStack_24a8 = local_3980._8_8_;
        auVar6 = vpunpckhwd_avx(auVar6,auVar7);
        local_5070 = auVar6._0_8_;
        local_3a00 = local_5070;
        uStack_5068 = auVar6._8_8_;
        uStack_39f8 = uStack_5068;
        local_3990._0_8_ = auVar8._0_8_;
        local_2540 = local_3990._0_8_;
        local_3990._8_8_ = auVar8._8_8_;
        uStack_2538 = local_3990._8_8_;
        local_39a0._0_8_ = auVar9._0_8_;
        local_2550 = local_39a0._0_8_;
        local_39a0._8_8_ = auVar9._8_8_;
        uStack_2548 = local_39a0._8_8_;
        auVar2 = vpunpcklwd_avx(auVar8,auVar9);
        local_5080 = auVar2._0_8_;
        local_3a10 = local_5080;
        uStack_5078 = auVar2._8_8_;
        uStack_3a08 = uStack_5078;
        local_24c0 = local_3990._0_8_;
        uStack_24b8 = local_3990._8_8_;
        local_24d0 = local_39a0._0_8_;
        uStack_24c8 = local_39a0._8_8_;
        auVar7 = vpunpckhwd_avx(auVar8,auVar9);
        local_5090 = auVar7._0_8_;
        local_3a20 = local_5090;
        uStack_5088 = auVar7._8_8_;
        uStack_3a18 = uStack_5088;
        local_39b0._0_8_ = auVar10._0_8_;
        local_2560 = local_39b0._0_8_;
        local_39b0._8_8_ = auVar10._8_8_;
        uStack_2558 = local_39b0._8_8_;
        local_39c0._0_8_ = auVar11._0_8_;
        local_2570 = local_39c0._0_8_;
        local_39c0._8_8_ = auVar11._8_8_;
        uStack_2568 = local_39c0._8_8_;
        auVar3 = vpunpcklwd_avx(auVar10,auVar11);
        local_50a0 = auVar3._0_8_;
        local_3a30 = local_50a0;
        uStack_5098 = auVar3._8_8_;
        uStack_3a28 = uStack_5098;
        local_24e0 = local_39b0._0_8_;
        uStack_24d8 = local_39b0._8_8_;
        local_24f0 = local_39c0._0_8_;
        uStack_24e8 = local_39c0._8_8_;
        auVar8 = vpunpckhwd_avx(auVar10,auVar11);
        local_50b0 = auVar8._0_8_;
        local_3a40 = local_50b0;
        uStack_50a8 = auVar8._8_8_;
        uStack_3a38 = uStack_50a8;
        local_39d0._0_8_ = auVar12._0_8_;
        local_2580 = local_39d0._0_8_;
        local_39d0._8_8_ = auVar12._8_8_;
        uStack_2578 = local_39d0._8_8_;
        local_39e0._0_8_ = auVar13._0_8_;
        local_2590 = local_39e0._0_8_;
        local_39e0._8_8_ = auVar13._8_8_;
        uStack_2588 = local_39e0._8_8_;
        auVar11 = vpunpcklwd_avx(auVar12,auVar13);
        local_50c0 = auVar11._0_8_;
        local_3a50 = local_50c0;
        uStack_50b8 = auVar11._8_8_;
        uStack_3a48 = uStack_50b8;
        local_2500 = local_39d0._0_8_;
        uStack_24f8 = local_39d0._8_8_;
        local_2510 = local_39e0._0_8_;
        uStack_2508 = local_39e0._8_8_;
        auVar9 = vpunpckhwd_avx(auVar12,auVar13);
        local_50d0 = auVar9._0_8_;
        local_3a60 = local_50d0;
        uStack_50c8 = auVar9._8_8_;
        uStack_3a58 = uStack_50c8;
        local_340 = local_5060;
        uStack_338 = uStack_5058;
        local_350 = local_5080;
        uStack_348 = uStack_5078;
        auVar12 = vpunpckldq_avx(auVar1,auVar2);
        local_50e0 = auVar12._0_8_;
        local_3a70 = local_50e0;
        uStack_50d8 = auVar12._8_8_;
        uStack_3a68 = uStack_50d8;
        local_2c0 = local_5060;
        uStack_2b8 = uStack_5058;
        local_2d0 = local_5080;
        uStack_2c8 = uStack_5078;
        auVar10 = vpunpckhdq_avx(auVar1,auVar2);
        local_50f0 = auVar10._0_8_;
        local_3a80 = local_50f0;
        uStack_50e8 = auVar10._8_8_;
        uStack_3a78 = uStack_50e8;
        local_360 = local_5070;
        uStack_358 = uStack_5068;
        local_370 = local_5090;
        uStack_368 = uStack_5088;
        auVar13 = vpunpckldq_avx(auVar6,auVar7);
        local_5100 = auVar13._0_8_;
        local_3a90 = local_5100;
        uStack_50f8 = auVar13._8_8_;
        uStack_3a88 = uStack_50f8;
        local_2e0 = local_5070;
        uStack_2d8 = uStack_5068;
        local_2f0 = local_5090;
        uStack_2e8 = uStack_5088;
        auVar6 = vpunpckhdq_avx(auVar6,auVar7);
        local_5110 = auVar6._0_8_;
        local_3aa0 = local_5110;
        uStack_5108 = auVar6._8_8_;
        uStack_3a98 = uStack_5108;
        local_380 = local_50a0;
        uStack_378 = uStack_5098;
        local_390 = local_50c0;
        uStack_388 = uStack_50b8;
        auVar1 = vpunpckldq_avx(auVar3,auVar11);
        local_5120 = auVar1._0_8_;
        local_3ab0 = local_5120;
        uStack_5118 = auVar1._8_8_;
        uStack_3aa8 = uStack_5118;
        local_300 = local_50a0;
        uStack_2f8 = uStack_5098;
        local_310 = local_50c0;
        uStack_308 = uStack_50b8;
        auVar7 = vpunpckhdq_avx(auVar3,auVar11);
        local_5130 = auVar7._0_8_;
        local_3ac0 = local_5130;
        uStack_5128 = auVar7._8_8_;
        uStack_3ab8 = uStack_5128;
        local_3a0 = local_50b0;
        uStack_398 = uStack_50a8;
        local_3b0 = local_50d0;
        uStack_3a8 = uStack_50c8;
        auVar11 = vpunpckldq_avx(auVar8,auVar9);
        local_5140 = auVar11._0_8_;
        local_3ad0 = local_5140;
        uStack_5138 = auVar11._8_8_;
        uStack_3ac8 = uStack_5138;
        local_320 = local_50b0;
        uStack_318 = uStack_50a8;
        local_330 = local_50d0;
        uStack_328 = uStack_50c8;
        auVar8 = vpunpckhdq_avx(auVar8,auVar9);
        local_5150 = auVar8._0_8_;
        local_3ae0 = local_5150;
        uStack_5148 = auVar8._8_8_;
        uStack_3ad8 = uStack_5148;
        local_240 = local_50e0;
        uStack_238 = uStack_50d8;
        local_250 = local_5120;
        uStack_248 = uStack_5118;
        local_3970 = vpunpcklqdq_avx(auVar12,auVar1);
        local_5160 = local_3970._0_8_;
        uStack_5158 = local_3970._8_8_;
        local_1c0 = local_50e0;
        uStack_1b8 = uStack_50d8;
        local_1d0 = local_5120;
        uStack_1c8 = uStack_5118;
        local_3980 = vpunpckhqdq_avx(auVar12,auVar1);
        local_5170 = local_3980._0_8_;
        uStack_5168 = local_3980._8_8_;
        local_260 = local_50f0;
        uStack_258 = uStack_50e8;
        local_270 = local_5130;
        uStack_268 = uStack_5128;
        local_3990 = vpunpcklqdq_avx(auVar10,auVar7);
        local_5180 = local_3990._0_8_;
        uStack_5178 = local_3990._8_8_;
        local_1e0 = local_50f0;
        uStack_1d8 = uStack_50e8;
        local_1f0 = local_5130;
        uStack_1e8 = uStack_5128;
        local_39a0 = vpunpckhqdq_avx(auVar10,auVar7);
        local_5190 = local_39a0._0_8_;
        uStack_5188 = local_39a0._8_8_;
        local_280 = local_5100;
        uStack_278 = uStack_50f8;
        local_290 = local_5140;
        uStack_288 = uStack_5138;
        local_39b0 = vpunpcklqdq_avx(auVar13,auVar11);
        local_51a0 = local_39b0._0_8_;
        uStack_5198 = local_39b0._8_8_;
        local_200 = local_5100;
        uStack_1f8 = uStack_50f8;
        local_210 = local_5140;
        uStack_208 = uStack_5138;
        local_39c0 = vpunpckhqdq_avx(auVar13,auVar11);
        local_51b0 = local_39c0._0_8_;
        uStack_51a8 = local_39c0._8_8_;
        local_2a0 = local_5110;
        uStack_298 = uStack_5108;
        local_2b0 = local_5150;
        uStack_2a8 = uStack_5148;
        local_39d0 = vpunpcklqdq_avx(auVar6,auVar8);
        local_51c0 = local_39d0._0_8_;
        uStack_51b8 = local_39d0._8_8_;
        local_220 = local_5110;
        uStack_218 = uStack_5108;
        local_230 = local_5150;
        uStack_228 = uStack_5148;
        local_39e0 = vpunpckhqdq_avx(auVar6,auVar8);
        local_51d0 = local_39e0._0_8_;
        uStack_51c8 = local_39e0._8_8_;
        local_78 = local_3618;
        local_90 = local_5160;
        uStack_88 = uStack_5158;
        *(undefined8 *)local_3618 = local_5160;
        *(undefined8 *)(local_3618 + 4) = uStack_5158;
        local_98 = local_3618 + 8;
        local_b0 = local_5170;
        uStack_a8 = uStack_5168;
        *(undefined8 *)local_98 = local_5170;
        *(undefined8 *)(local_3618 + 0xc) = uStack_5168;
        local_b8 = local_3618 + 0x10;
        local_d0 = local_5180;
        uStack_c8 = uStack_5178;
        *(undefined8 *)local_b8 = local_5180;
        *(undefined8 *)(local_3618 + 0x14) = uStack_5178;
        local_d8 = local_3618 + 0x18;
        local_f0 = local_5190;
        uStack_e8 = uStack_5188;
        *(undefined8 *)local_d8 = local_5190;
        *(undefined8 *)(local_3618 + 0x1c) = uStack_5188;
        local_f8 = local_3618 + 0x20;
        local_110 = local_51a0;
        uStack_108 = uStack_5198;
        *(undefined8 *)local_f8 = local_51a0;
        *(undefined8 *)(local_3618 + 0x24) = uStack_5198;
        local_118 = local_3618 + 0x28;
        local_130 = local_51b0;
        uStack_128 = uStack_51a8;
        *(undefined8 *)local_118 = local_51b0;
        *(undefined8 *)(local_3618 + 0x2c) = uStack_51a8;
        local_138 = local_3618 + 0x30;
        local_150 = local_51c0;
        uStack_148 = uStack_51b8;
        *(undefined8 *)local_138 = local_51c0;
        *(undefined8 *)(local_3618 + 0x34) = uStack_51b8;
        local_158 = (undefined1 (*) [16])(local_3618 + 0x38);
        local_170 = local_51d0;
        uStack_168 = uStack_51c8;
        *local_158 = local_39e0;
        local_3620 = (undefined1 (*) [64])(*local_3620 + 0x20);
        local_3628 = (undefined1 (*) [64])(*local_3628 + 0x20);
        local_3630 = (undefined1 (*) [64])(*local_3630 + 0x20);
        local_3638 = (undefined1 (*) [64])(*local_3638 + 0x20);
        local_3640 = (undefined1 (*) [64])(*local_3640 + 0x20);
        local_3648 = (undefined1 (*) [64])(*local_3648 + 0x20);
        local_3650 = (undefined1 (*) [64])(*local_3650 + 0x20);
        local_3658 = (undefined1 (*) [64])(*local_3658 + 0x20);
        local_3618 = local_3618 + 0x40;
      }
      for (; local_365c < local_2ac4; local_365c = local_365c + 1) {
        puVar14 = *local_3620;
        local_3620 = (undefined1 (*) [64])(*local_3620 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        *local_3618 = uVar15;
        puVar14 = *local_3628;
        local_3628 = (undefined1 (*) [64])(*local_3628 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        local_3618[1] = uVar15;
        puVar14 = *local_3630;
        local_3630 = (undefined1 (*) [64])(*local_3630 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        local_3618[2] = uVar15;
        puVar14 = *local_3638;
        local_3638 = (undefined1 (*) [64])(*local_3638 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        local_3618[3] = uVar15;
        puVar14 = *local_3640;
        local_3640 = (undefined1 (*) [64])(*local_3640 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        local_3618[4] = uVar15;
        puVar14 = *local_3648;
        local_3648 = (undefined1 (*) [64])(*local_3648 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        local_3618[5] = uVar15;
        puVar14 = *local_3650;
        local_3650 = (undefined1 (*) [64])(*local_3650 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        local_3618[6] = uVar15;
        puVar14 = *local_3658;
        local_3658 = (undefined1 (*) [64])(*local_3658 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        local_3618[7] = uVar15;
        local_3618 = local_3618 + 8;
      }
    }
    local_2aa0 = &local_3608;
    local_2858 = local_2aa0;
    if (local_3600 != (int *)0x0) {
      local_285c = 0xffffffff;
      LOCK();
      local_2860 = *local_3600;
      *local_3600 = *local_3600 + -1;
      UNLOCK();
      if (local_2860 == 1) {
        if (local_35e8 == (long *)0x0) {
          if (local_3608 != (void *)0x0) {
            free(local_3608);
          }
        }
        else {
          (**(code **)(*local_35e8 + 0x18))(local_35e8,local_3608);
        }
      }
    }
    local_3608 = (void *)0x0;
    local_35f8 = 0;
    local_35f0 = 0;
    local_35e0 = 0;
    local_35dc = 0;
    local_35d8 = 0;
    local_35d4 = 0;
    local_35d0 = 0;
    local_35c8 = 0;
    local_3600 = (int *)0x0;
  }
  if (local_2ad4 == 4) {
    in_stack_ffffffffffffae10 = (Mat *)0x0;
    Mat::reshape((Mat *)0x0,(int)((ulong)in_stack_ffffffffffffae08 >> 0x20),
                 (int)in_stack_ffffffffffffae08,in_stack_ffffffffffffae00);
    Mat::create(in_stack_ffffffffffffadb8,in_stack_ffffffffffffadb4,in_stack_ffffffffffffadb0,
                in_stack_ffffffffffffada8,_elempack,in_stack_ffffffffffffad98);
    for (local_3b2c = 0; local_3b2c + 3 < local_2ac8; local_3b2c = local_3b2c + 4) {
      local_244c = local_3b2c / 4;
      local_2448 = local_2ac0;
      in_stack_ffffffffffffae08 =
           (unsigned_short *)
           (*local_2ac0 + (long)*(int *)((long)local_2ac0 + 0x2c) * (long)local_244c * local_2ac0[2]
           );
      local_2a38 = &local_3b28;
      local_2a3c = local_3b2c;
      local_3b40 = (undefined1 (*) [16])
                   ((long)local_3b28 + (long)local_3afc * (long)local_3b2c * local_3b18);
      local_2a4c = local_3b2c + 1;
      local_2a48 = &local_3b28;
      local_3b48 = (undefined1 (*) [16])
                   ((long)local_3b28 + (long)local_3afc * (long)local_2a4c * local_3b18);
      local_2a5c = local_3b2c + 2;
      local_2a58 = &local_3b28;
      local_3b50 = (undefined1 (*) [16])
                   ((long)local_3b28 + (long)local_3afc * (long)local_2a5c * local_3b18);
      local_2a6c = local_3b2c + 3;
      local_2a68 = &local_3b28;
      local_3b58 = (undefined1 (*) [16])
                   ((long)local_3b28 + (long)local_3afc * (long)local_2a6c * local_3b18);
      local_3b38 = in_stack_ffffffffffffae08;
      for (local_3b5c = 0; local_3b5c + 3 < local_2ac4; local_3b5c = local_3b5c + 4) {
        local_2758 = local_3b40;
        local_2660 = *(undefined8 *)*local_3b40;
        uStack_2658 = *(undefined8 *)(*local_3b40 + 8);
        local_2760 = local_3b48;
        local_2670 = *(undefined8 *)*local_3b48;
        uStack_2668 = *(undefined8 *)(*local_3b48 + 8);
        local_2768 = local_3b50;
        local_2680 = *(undefined8 *)*local_3b50;
        uStack_2678 = *(undefined8 *)(*local_3b50 + 8);
        local_2770 = local_3b58;
        local_2690 = *(undefined8 *)*local_3b58;
        uStack_2688 = *(undefined8 *)(*local_3b58 + 8);
        local_3be0 = vunpcklps_avx(*local_3b40,*local_3b48);
        local_3bc0 = vunpcklps_avx(*local_3b50,*local_3b58);
        local_3bd0 = vunpckhps_avx(*local_3b40,*local_3b48);
        local_3bb0 = vunpckhps_avx(*local_3b50,*local_3b58);
        local_25e0 = local_3be0._0_8_;
        uStack_25d8 = local_3be0._8_8_;
        local_25f0 = local_3bc0._0_8_;
        uStack_25e8 = local_3bc0._8_8_;
        local_3b70 = vunpcklpd_avx(local_3be0,local_3bc0);
        local_25a0 = local_3bc0._0_8_;
        uStack_2598 = local_3bc0._8_8_;
        local_25b0 = local_3be0._0_8_;
        uStack_25a8 = local_3be0._8_8_;
        local_3b80 = vunpckhpd_avx(local_3be0,local_3bc0);
        local_2600 = local_3bd0._0_8_;
        uStack_25f8 = local_3bd0._8_8_;
        local_2610 = local_3bb0._0_8_;
        uStack_2608 = local_3bb0._8_8_;
        local_3b90 = vunpcklpd_avx(local_3bd0,local_3bb0);
        local_25c0 = local_3bb0._0_8_;
        uStack_25b8 = local_3bb0._8_8_;
        local_25d0 = local_3bd0._0_8_;
        uStack_25c8 = local_3bd0._8_8_;
        local_3ba0 = vunpckhpd_avx(local_3bd0,local_3bb0);
        local_60 = local_3b70._0_8_;
        uStack_58 = local_3b70._8_8_;
        uStack_3be8 = local_3b80._8_8_;
        uStack_3bf0 = local_3b80._0_8_;
        uStack_3bf8 = local_3b70._8_8_;
        local_3c00 = local_3b70._0_8_;
        local_70 = (Mat *)local_3b90._0_8_;
        pMStack_68 = (Mat *)local_3b90._8_8_;
        local_3c20._16_16_ = local_3ba0;
        local_3c20._0_16_ = local_3b90;
        auVar27._16_8_ = local_3b80._0_8_;
        auVar27._0_16_ = local_3b70;
        auVar27._24_8_ = local_3b80._8_8_;
        local_3c30 = vcvtps2ph_f16c(auVar27,3);
        local_3c40 = vcvtps2ph_f16c(local_3c20,3);
        local_178 = local_3b38;
        local_190 = local_3c30._0_8_;
        uStack_188 = local_3c30._8_8_;
        *(undefined8 *)local_3b38 = local_3c30._0_8_;
        *(undefined8 *)(local_3b38 + 4) = local_3c30._8_8_;
        local_198 = (undefined1 (*) [16])(local_3b38 + 8);
        local_1b0 = local_3c40._0_8_;
        uStack_1a8 = local_3c40._8_8_;
        *local_198 = local_3c40;
        local_3b40 = local_3b40 + 1;
        local_3b48 = local_3b48 + 1;
        local_3b50 = local_3b50 + 1;
        local_3b58 = local_3b58 + 1;
        local_3b38 = local_3b38 + 0x10;
        in_stack_ffffffffffffadc0 = (Mat *)local_3b90._0_8_;
        in_stack_ffffffffffffadc8 = (Mat *)local_3b90._8_8_;
        local_2650 = local_2690;
        uStack_2648 = uStack_2688;
        local_2640 = local_2680;
        uStack_2638 = uStack_2678;
        local_2630 = local_2670;
        uStack_2628 = uStack_2668;
        local_2620 = local_2660;
        uStack_2618 = uStack_2658;
      }
      for (; local_3b5c < local_2ac4; local_3b5c = local_3b5c + 1) {
        puVar14 = *local_3b40;
        local_3b40 = (undefined1 (*) [16])(*local_3b40 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        *local_3b38 = uVar15;
        puVar14 = *local_3b48;
        local_3b48 = (undefined1 (*) [16])(*local_3b48 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        local_3b38[1] = uVar15;
        puVar14 = *local_3b50;
        local_3b50 = (undefined1 (*) [16])(*local_3b50 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        local_3b38[2] = uVar15;
        puVar14 = *local_3b58;
        local_3b58 = (undefined1 (*) [16])(*local_3b58 + 4);
        uVar15 = float32_to_float16(*(float *)puVar14);
        local_3b38[3] = uVar15;
        local_3b38 = local_3b38 + 4;
      }
    }
    ppvVar35 = &local_3b28;
    local_2a90 = ppvVar35;
    local_2878 = ppvVar35;
    if (local_3b20 != (int *)0x0) {
      local_287c = 0xffffffff;
      LOCK();
      local_2880 = *local_3b20;
      *local_3b20 = *local_3b20 + -1;
      UNLOCK();
      if (local_2880 == 1) {
        if (local_3b08 == (long *)0x0) {
          if (local_3b28 != (void *)0x0) {
            free(local_3b28);
          }
        }
        else {
          (**(code **)(*local_3b08 + 0x18))(local_3b08,local_3b28);
        }
      }
    }
    *ppvVar35 = (void *)0x0;
    ppvVar35[2] = (void *)0x0;
    *(undefined4 *)(ppvVar35 + 3) = 0;
    *(undefined4 *)(ppvVar35 + 5) = 0;
    *(undefined4 *)((long)ppvVar35 + 0x2c) = 0;
    *(undefined4 *)(ppvVar35 + 6) = 0;
    *(undefined4 *)((long)ppvVar35 + 0x34) = 0;
    *(undefined4 *)(ppvVar35 + 7) = 0;
    ppvVar35[8] = (void *)0x0;
    ppvVar35[1] = (void *)0x0;
  }
  if (local_2ad4 == 1) {
    Mat::reshape(in_stack_ffffffffffffae10,(int)((ulong)in_stack_ffffffffffffae08 >> 0x20),
                 (int)in_stack_ffffffffffffae08,in_stack_ffffffffffffae00);
    cast_float32_to_float16
              (in_stack_ffffffffffffadc8,in_stack_ffffffffffffadc0,
               (Option *)in_stack_ffffffffffffadb8);
    ppvVar35 = &local_3c88;
    if (local_3c80 != (int *)0x0) {
      local_289c = 0xffffffff;
      LOCK();
      local_28a0 = *local_3c80;
      *local_3c80 = *local_3c80 + -1;
      UNLOCK();
      if (local_28a0 == 1) {
        local_2a80 = ppvVar35;
        local_2898 = ppvVar35;
        if (local_3c68 == (long *)0x0) {
          if (local_3c88 != (void *)0x0) {
            free(local_3c88);
          }
        }
        else {
          (**(code **)(*local_3c68 + 0x18))(local_3c68,local_3c88);
        }
      }
    }
    *ppvVar35 = (void *)0x0;
    ppvVar35[2] = (void *)0x0;
    *(undefined4 *)(ppvVar35 + 3) = 0;
    *(undefined4 *)(ppvVar35 + 5) = 0;
    *(undefined4 *)((long)ppvVar35 + 0x2c) = 0;
    *(undefined4 *)(ppvVar35 + 6) = 0;
    *(undefined4 *)((long)ppvVar35 + 0x34) = 0;
    *(undefined4 *)(ppvVar35 + 7) = 0;
    ppvVar35[8] = (void *)0x0;
    ppvVar35[1] = (void *)0x0;
  }
  return;
}

Assistant:

static void innerproduct_transform_kernel_fp16s_sse(const Mat& weight_data, Mat& weight_data_tm, int num_input, int num_output, const Option& opt)
{
#if NCNN_RUNTIME_CPU && NCNN_F16C && __AVX__ && !__F16C__
    if (ncnn::cpu_support_x86_f16c())
    {
        innerproduct_transform_kernel_fp16s_sse_f16c(weight_data, weight_data_tm, num_input, num_output, opt);
        return;
    }
#endif

#if __F16C__
    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }

    // src = inch-outch
    // dst = pb-inch-outch/pb
#if __AVX512F__
    if (out_elempack == 16)
    {
        Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

        weight_data_tm.create(num_input, num_output / 16, (size_t)32u, 16);

        for (int q = 0; q + 15 < num_output; q += 16)
        {
            unsigned short* g0 = weight_data_tm.row<unsigned short>(q / 16);

            const float* k0 = weight_data_r2.row(q);
            const float* k1 = weight_data_r2.row(q + 1);
            const float* k2 = weight_data_r2.row(q + 2);
            const float* k3 = weight_data_r2.row(q + 3);
            const float* k4 = weight_data_r2.row(q + 4);
            const float* k5 = weight_data_r2.row(q + 5);
            const float* k6 = weight_data_r2.row(q + 6);
            const float* k7 = weight_data_r2.row(q + 7);
            const float* k8 = weight_data_r2.row(q + 8);
            const float* k9 = weight_data_r2.row(q + 9);
            const float* ka = weight_data_r2.row(q + 10);
            const float* kb = weight_data_r2.row(q + 11);
            const float* kc = weight_data_r2.row(q + 12);
            const float* kd = weight_data_r2.row(q + 13);
            const float* ke = weight_data_r2.row(q + 14);
            const float* kf = weight_data_r2.row(q + 15);

            int p = 0;
            for (; p + 15 < num_input; p += 16)
            {
                // transpose 16x16
                __m256i _r0 = _mm512_cvtps_ph(_mm512_loadu_ps(k0), _MM_FROUND_TRUNC);
                __m256i _r1 = _mm512_cvtps_ph(_mm512_loadu_ps(k1), _MM_FROUND_TRUNC);
                __m256i _r2 = _mm512_cvtps_ph(_mm512_loadu_ps(k2), _MM_FROUND_TRUNC);
                __m256i _r3 = _mm512_cvtps_ph(_mm512_loadu_ps(k3), _MM_FROUND_TRUNC);
                __m256i _r4 = _mm512_cvtps_ph(_mm512_loadu_ps(k4), _MM_FROUND_TRUNC);
                __m256i _r5 = _mm512_cvtps_ph(_mm512_loadu_ps(k5), _MM_FROUND_TRUNC);
                __m256i _r6 = _mm512_cvtps_ph(_mm512_loadu_ps(k6), _MM_FROUND_TRUNC);
                __m256i _r7 = _mm512_cvtps_ph(_mm512_loadu_ps(k7), _MM_FROUND_TRUNC);
                __m256i _r8 = _mm512_cvtps_ph(_mm512_loadu_ps(k8), _MM_FROUND_TRUNC);
                __m256i _r9 = _mm512_cvtps_ph(_mm512_loadu_ps(k9), _MM_FROUND_TRUNC);
                __m256i _ra = _mm512_cvtps_ph(_mm512_loadu_ps(ka), _MM_FROUND_TRUNC);
                __m256i _rb = _mm512_cvtps_ph(_mm512_loadu_ps(kb), _MM_FROUND_TRUNC);
                __m256i _rc = _mm512_cvtps_ph(_mm512_loadu_ps(kc), _MM_FROUND_TRUNC);
                __m256i _rd = _mm512_cvtps_ph(_mm512_loadu_ps(kd), _MM_FROUND_TRUNC);
                __m256i _re = _mm512_cvtps_ph(_mm512_loadu_ps(ke), _MM_FROUND_TRUNC);
                __m256i _rf = _mm512_cvtps_ph(_mm512_loadu_ps(kf), _MM_FROUND_TRUNC);

                __m256i _tmp0 = _mm256_unpacklo_epi16(_r0, _r1);
                __m256i _tmp1 = _mm256_unpackhi_epi16(_r0, _r1);
                __m256i _tmp2 = _mm256_unpacklo_epi16(_r2, _r3);
                __m256i _tmp3 = _mm256_unpackhi_epi16(_r2, _r3);
                __m256i _tmp4 = _mm256_unpacklo_epi16(_r4, _r5);
                __m256i _tmp5 = _mm256_unpackhi_epi16(_r4, _r5);
                __m256i _tmp6 = _mm256_unpacklo_epi16(_r6, _r7);
                __m256i _tmp7 = _mm256_unpackhi_epi16(_r6, _r7);
                __m256i _tmp8 = _mm256_unpacklo_epi16(_r8, _r9);
                __m256i _tmp9 = _mm256_unpackhi_epi16(_r8, _r9);
                __m256i _tmpa = _mm256_unpacklo_epi16(_ra, _rb);
                __m256i _tmpb = _mm256_unpackhi_epi16(_ra, _rb);
                __m256i _tmpc = _mm256_unpacklo_epi16(_rc, _rd);
                __m256i _tmpd = _mm256_unpackhi_epi16(_rc, _rd);
                __m256i _tmpe = _mm256_unpacklo_epi16(_re, _rf);
                __m256i _tmpf = _mm256_unpackhi_epi16(_re, _rf);

                __m256i _tmpg = _mm256_unpacklo_epi32(_tmp0, _tmp2);
                __m256i _tmph = _mm256_unpackhi_epi32(_tmp0, _tmp2);
                __m256i _tmpi = _mm256_unpacklo_epi32(_tmp1, _tmp3);
                __m256i _tmpj = _mm256_unpackhi_epi32(_tmp1, _tmp3);
                __m256i _tmpk = _mm256_unpacklo_epi32(_tmp4, _tmp6);
                __m256i _tmpl = _mm256_unpackhi_epi32(_tmp4, _tmp6);
                __m256i _tmpm = _mm256_unpacklo_epi32(_tmp5, _tmp7);
                __m256i _tmpn = _mm256_unpackhi_epi32(_tmp5, _tmp7);
                __m256i _tmpo = _mm256_unpacklo_epi32(_tmp8, _tmpa);
                __m256i _tmpp = _mm256_unpackhi_epi32(_tmp8, _tmpa);
                __m256i _tmpq = _mm256_unpacklo_epi32(_tmp9, _tmpb);
                __m256i _tmpr = _mm256_unpackhi_epi32(_tmp9, _tmpb);
                __m256i _tmps = _mm256_unpacklo_epi32(_tmpc, _tmpe);
                __m256i _tmpt = _mm256_unpackhi_epi32(_tmpc, _tmpe);
                __m256i _tmpu = _mm256_unpacklo_epi32(_tmpd, _tmpf);
                __m256i _tmpv = _mm256_unpackhi_epi32(_tmpd, _tmpf);

                _tmp0 = _mm256_unpacklo_epi64(_tmpg, _tmpk);
                _tmp1 = _mm256_unpackhi_epi64(_tmpg, _tmpk);
                _tmp2 = _mm256_unpacklo_epi64(_tmph, _tmpl);
                _tmp3 = _mm256_unpackhi_epi64(_tmph, _tmpl);
                _tmp4 = _mm256_unpacklo_epi64(_tmpi, _tmpm);
                _tmp5 = _mm256_unpackhi_epi64(_tmpi, _tmpm);
                _tmp6 = _mm256_unpacklo_epi64(_tmpj, _tmpn);
                _tmp7 = _mm256_unpackhi_epi64(_tmpj, _tmpn);
                _tmp8 = _mm256_unpacklo_epi64(_tmpo, _tmps);
                _tmp9 = _mm256_unpackhi_epi64(_tmpo, _tmps);
                _tmpa = _mm256_unpacklo_epi64(_tmpp, _tmpt);
                _tmpb = _mm256_unpackhi_epi64(_tmpp, _tmpt);
                _tmpc = _mm256_unpacklo_epi64(_tmpq, _tmpu);
                _tmpd = _mm256_unpackhi_epi64(_tmpq, _tmpu);
                _tmpe = _mm256_unpacklo_epi64(_tmpr, _tmpv);
                _tmpf = _mm256_unpackhi_epi64(_tmpr, _tmpv);

                _r0 = _mm256_permute2x128_si256(_tmp0, _tmp8, _MM_SHUFFLE(0, 2, 0, 0));
                _r1 = _mm256_permute2x128_si256(_tmp1, _tmp9, _MM_SHUFFLE(0, 2, 0, 0));
                _r2 = _mm256_permute2x128_si256(_tmp2, _tmpa, _MM_SHUFFLE(0, 2, 0, 0));
                _r3 = _mm256_permute2x128_si256(_tmp3, _tmpb, _MM_SHUFFLE(0, 2, 0, 0));
                _r4 = _mm256_permute2x128_si256(_tmp4, _tmpc, _MM_SHUFFLE(0, 2, 0, 0));
                _r5 = _mm256_permute2x128_si256(_tmp5, _tmpd, _MM_SHUFFLE(0, 2, 0, 0));
                _r6 = _mm256_permute2x128_si256(_tmp6, _tmpe, _MM_SHUFFLE(0, 2, 0, 0));
                _r7 = _mm256_permute2x128_si256(_tmp7, _tmpf, _MM_SHUFFLE(0, 2, 0, 0));
                _r8 = _mm256_permute2x128_si256(_tmp0, _tmp8, _MM_SHUFFLE(0, 3, 0, 1));
                _r9 = _mm256_permute2x128_si256(_tmp1, _tmp9, _MM_SHUFFLE(0, 3, 0, 1));
                _ra = _mm256_permute2x128_si256(_tmp2, _tmpa, _MM_SHUFFLE(0, 3, 0, 1));
                _rb = _mm256_permute2x128_si256(_tmp3, _tmpb, _MM_SHUFFLE(0, 3, 0, 1));
                _rc = _mm256_permute2x128_si256(_tmp4, _tmpc, _MM_SHUFFLE(0, 3, 0, 1));
                _rd = _mm256_permute2x128_si256(_tmp5, _tmpd, _MM_SHUFFLE(0, 3, 0, 1));
                _re = _mm256_permute2x128_si256(_tmp6, _tmpe, _MM_SHUFFLE(0, 3, 0, 1));
                _rf = _mm256_permute2x128_si256(_tmp7, _tmpf, _MM_SHUFFLE(0, 3, 0, 1));

                _mm256_storeu_si256((__m256i*)g0, _r0);
                _mm256_storeu_si256((__m256i*)(g0 + 16), _r1);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 2), _r2);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 3), _r3);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 4), _r4);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 5), _r5);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 6), _r6);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 7), _r7);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 8), _r8);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 9), _r9);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 10), _ra);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 11), _rb);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 12), _rc);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 13), _rd);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 14), _re);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 15), _rf);

                k0 += 16;
                k1 += 16;
                k2 += 16;
                k3 += 16;
                k4 += 16;
                k5 += 16;
                k6 += 16;
                k7 += 16;
                k8 += 16;
                k9 += 16;
                ka += 16;
                kb += 16;
                kc += 16;
                kd += 16;
                ke += 16;
                kf += 16;
                g0 += 256;
            }
            for (; p + 7 < num_input; p += 8)
            {
                // transpose 16x8
                __m128i _r0 = _mm256_cvtps_ph(_mm256_loadu_ps(k0), _MM_FROUND_TRUNC);
                __m128i _r1 = _mm256_cvtps_ph(_mm256_loadu_ps(k1), _MM_FROUND_TRUNC);
                __m128i _r2 = _mm256_cvtps_ph(_mm256_loadu_ps(k2), _MM_FROUND_TRUNC);
                __m128i _r3 = _mm256_cvtps_ph(_mm256_loadu_ps(k3), _MM_FROUND_TRUNC);
                __m128i _r4 = _mm256_cvtps_ph(_mm256_loadu_ps(k4), _MM_FROUND_TRUNC);
                __m128i _r5 = _mm256_cvtps_ph(_mm256_loadu_ps(k5), _MM_FROUND_TRUNC);
                __m128i _r6 = _mm256_cvtps_ph(_mm256_loadu_ps(k6), _MM_FROUND_TRUNC);
                __m128i _r7 = _mm256_cvtps_ph(_mm256_loadu_ps(k7), _MM_FROUND_TRUNC);
                __m128i _r8 = _mm256_cvtps_ph(_mm256_loadu_ps(k8), _MM_FROUND_TRUNC);
                __m128i _r9 = _mm256_cvtps_ph(_mm256_loadu_ps(k9), _MM_FROUND_TRUNC);
                __m128i _ra = _mm256_cvtps_ph(_mm256_loadu_ps(ka), _MM_FROUND_TRUNC);
                __m128i _rb = _mm256_cvtps_ph(_mm256_loadu_ps(kb), _MM_FROUND_TRUNC);
                __m128i _rc = _mm256_cvtps_ph(_mm256_loadu_ps(kc), _MM_FROUND_TRUNC);
                __m128i _rd = _mm256_cvtps_ph(_mm256_loadu_ps(kd), _MM_FROUND_TRUNC);
                __m128i _re = _mm256_cvtps_ph(_mm256_loadu_ps(ke), _MM_FROUND_TRUNC);
                __m128i _rf = _mm256_cvtps_ph(_mm256_loadu_ps(kf), _MM_FROUND_TRUNC);

                __m256i _r08 = _mm256_inserti128_si256(_mm256_castsi128_si256(_r0), _r8, 1);
                __m256i _r19 = _mm256_inserti128_si256(_mm256_castsi128_si256(_r1), _r9, 1);
                __m256i _r2a = _mm256_inserti128_si256(_mm256_castsi128_si256(_r2), _ra, 1);
                __m256i _r3b = _mm256_inserti128_si256(_mm256_castsi128_si256(_r3), _rb, 1);
                __m256i _r4c = _mm256_inserti128_si256(_mm256_castsi128_si256(_r4), _rc, 1);
                __m256i _r5d = _mm256_inserti128_si256(_mm256_castsi128_si256(_r5), _rd, 1);
                __m256i _r6e = _mm256_inserti128_si256(_mm256_castsi128_si256(_r6), _re, 1);
                __m256i _r7f = _mm256_inserti128_si256(_mm256_castsi128_si256(_r7), _rf, 1);

                __m256i _tmp0 = _mm256_unpacklo_epi16(_r08, _r19);
                __m256i _tmp1 = _mm256_unpackhi_epi16(_r08, _r19);
                __m256i _tmp2 = _mm256_unpacklo_epi16(_r2a, _r3b);
                __m256i _tmp3 = _mm256_unpackhi_epi16(_r2a, _r3b);
                __m256i _tmp4 = _mm256_unpacklo_epi16(_r4c, _r5d);
                __m256i _tmp5 = _mm256_unpackhi_epi16(_r4c, _r5d);
                __m256i _tmp6 = _mm256_unpacklo_epi16(_r6e, _r7f);
                __m256i _tmp7 = _mm256_unpackhi_epi16(_r6e, _r7f);

                __m256i _tmpg = _mm256_unpacklo_epi32(_tmp0, _tmp2);
                __m256i _tmph = _mm256_unpackhi_epi32(_tmp0, _tmp2);
                __m256i _tmpi = _mm256_unpacklo_epi32(_tmp1, _tmp3);
                __m256i _tmpj = _mm256_unpackhi_epi32(_tmp1, _tmp3);
                __m256i _tmpk = _mm256_unpacklo_epi32(_tmp4, _tmp6);
                __m256i _tmpl = _mm256_unpackhi_epi32(_tmp4, _tmp6);
                __m256i _tmpm = _mm256_unpacklo_epi32(_tmp5, _tmp7);
                __m256i _tmpn = _mm256_unpackhi_epi32(_tmp5, _tmp7);

                _r08 = _mm256_unpacklo_epi64(_tmpg, _tmpk);
                _r19 = _mm256_unpackhi_epi64(_tmpg, _tmpk);
                _r2a = _mm256_unpacklo_epi64(_tmph, _tmpl);
                _r3b = _mm256_unpackhi_epi64(_tmph, _tmpl);
                _r4c = _mm256_unpacklo_epi64(_tmpi, _tmpm);
                _r5d = _mm256_unpackhi_epi64(_tmpi, _tmpm);
                _r6e = _mm256_unpacklo_epi64(_tmpj, _tmpn);
                _r7f = _mm256_unpackhi_epi64(_tmpj, _tmpn);

                _mm256_storeu_si256((__m256i*)g0, _r08);
                _mm256_storeu_si256((__m256i*)(g0 + 16), _r19);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 2), _r2a);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 3), _r3b);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 4), _r4c);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 5), _r5d);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 6), _r6e);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 7), _r7f);

                k0 += 8;
                k1 += 8;
                k2 += 8;
                k3 += 8;
                k4 += 8;
                k5 += 8;
                k6 += 8;
                k7 += 8;
                k8 += 8;
                k9 += 8;
                ka += 8;
                kb += 8;
                kc += 8;
                kd += 8;
                ke += 8;
                kf += 8;
                g0 += 128;
            }
            for (; p < num_input; p++)
            {
                g0[0] = float32_to_float16(*k0++);
                g0[1] = float32_to_float16(*k1++);
                g0[2] = float32_to_float16(*k2++);
                g0[3] = float32_to_float16(*k3++);
                g0[4] = float32_to_float16(*k4++);
                g0[5] = float32_to_float16(*k5++);
                g0[6] = float32_to_float16(*k6++);
                g0[7] = float32_to_float16(*k7++);
                g0[8] = float32_to_float16(*k8++);
                g0[9] = float32_to_float16(*k9++);
                g0[10] = float32_to_float16(*ka++);
                g0[11] = float32_to_float16(*kb++);
                g0[12] = float32_to_float16(*kc++);
                g0[13] = float32_to_float16(*kd++);
                g0[14] = float32_to_float16(*ke++);
                g0[15] = float32_to_float16(*kf++);
                g0 += 16;
            }
        }
    }
#endif // __AVX512F__

    if (out_elempack == 8)
    {
        Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

        weight_data_tm.create(num_input, num_output / 8, (size_t)16u, 8);

        for (int q = 0; q + 7 < num_output; q += 8)
        {
            unsigned short* g0 = weight_data_tm.row<unsigned short>(q / 8);

            const float* k0 = weight_data_r2.row(q);
            const float* k1 = weight_data_r2.row(q + 1);
            const float* k2 = weight_data_r2.row(q + 2);
            const float* k3 = weight_data_r2.row(q + 3);
            const float* k4 = weight_data_r2.row(q + 4);
            const float* k5 = weight_data_r2.row(q + 5);
            const float* k6 = weight_data_r2.row(q + 6);
            const float* k7 = weight_data_r2.row(q + 7);

            int p = 0;
#if __AVX512F__
            for (; p + 15 < num_input; p += 16)
            {
                // transpose 8x16
                __m256i _r0 = _mm512_cvtps_ph(_mm512_loadu_ps(k0), _MM_FROUND_TRUNC);
                __m256i _r1 = _mm512_cvtps_ph(_mm512_loadu_ps(k1), _MM_FROUND_TRUNC);
                __m256i _r2 = _mm512_cvtps_ph(_mm512_loadu_ps(k2), _MM_FROUND_TRUNC);
                __m256i _r3 = _mm512_cvtps_ph(_mm512_loadu_ps(k3), _MM_FROUND_TRUNC);
                __m256i _r4 = _mm512_cvtps_ph(_mm512_loadu_ps(k4), _MM_FROUND_TRUNC);
                __m256i _r5 = _mm512_cvtps_ph(_mm512_loadu_ps(k5), _MM_FROUND_TRUNC);
                __m256i _r6 = _mm512_cvtps_ph(_mm512_loadu_ps(k6), _MM_FROUND_TRUNC);
                __m256i _r7 = _mm512_cvtps_ph(_mm512_loadu_ps(k7), _MM_FROUND_TRUNC);

                __m256i _tmp0 = _mm256_unpacklo_epi16(_r0, _r1);
                __m256i _tmp1 = _mm256_unpackhi_epi16(_r0, _r1);
                __m256i _tmp2 = _mm256_unpacklo_epi16(_r2, _r3);
                __m256i _tmp3 = _mm256_unpackhi_epi16(_r2, _r3);
                __m256i _tmp4 = _mm256_unpacklo_epi16(_r4, _r5);
                __m256i _tmp5 = _mm256_unpackhi_epi16(_r4, _r5);
                __m256i _tmp6 = _mm256_unpacklo_epi16(_r6, _r7);
                __m256i _tmp7 = _mm256_unpackhi_epi16(_r6, _r7);

                __m256i _tmpg = _mm256_unpacklo_epi32(_tmp0, _tmp2);
                __m256i _tmph = _mm256_unpackhi_epi32(_tmp0, _tmp2);
                __m256i _tmpi = _mm256_unpacklo_epi32(_tmp1, _tmp3);
                __m256i _tmpj = _mm256_unpackhi_epi32(_tmp1, _tmp3);
                __m256i _tmpk = _mm256_unpacklo_epi32(_tmp4, _tmp6);
                __m256i _tmpl = _mm256_unpackhi_epi32(_tmp4, _tmp6);
                __m256i _tmpm = _mm256_unpacklo_epi32(_tmp5, _tmp7);
                __m256i _tmpn = _mm256_unpackhi_epi32(_tmp5, _tmp7);

                _tmp0 = _mm256_unpacklo_epi64(_tmpg, _tmpk);
                _tmp1 = _mm256_unpackhi_epi64(_tmpg, _tmpk);
                _tmp2 = _mm256_unpacklo_epi64(_tmph, _tmpl);
                _tmp3 = _mm256_unpackhi_epi64(_tmph, _tmpl);
                _tmp4 = _mm256_unpacklo_epi64(_tmpi, _tmpm);
                _tmp5 = _mm256_unpackhi_epi64(_tmpi, _tmpm);
                _tmp6 = _mm256_unpacklo_epi64(_tmpj, _tmpn);
                _tmp7 = _mm256_unpackhi_epi64(_tmpj, _tmpn);

                _r0 = _mm256_permute2x128_si256(_tmp0, _tmp1, _MM_SHUFFLE(0, 2, 0, 0));
                _r1 = _mm256_permute2x128_si256(_tmp2, _tmp3, _MM_SHUFFLE(0, 2, 0, 0));
                _r2 = _mm256_permute2x128_si256(_tmp4, _tmp5, _MM_SHUFFLE(0, 2, 0, 0));
                _r3 = _mm256_permute2x128_si256(_tmp6, _tmp7, _MM_SHUFFLE(0, 2, 0, 0));
                _r4 = _mm256_permute2x128_si256(_tmp0, _tmp1, _MM_SHUFFLE(0, 3, 0, 1));
                _r5 = _mm256_permute2x128_si256(_tmp2, _tmp3, _MM_SHUFFLE(0, 3, 0, 1));
                _r6 = _mm256_permute2x128_si256(_tmp4, _tmp5, _MM_SHUFFLE(0, 3, 0, 1));
                _r7 = _mm256_permute2x128_si256(_tmp6, _tmp7, _MM_SHUFFLE(0, 3, 0, 1));

                _mm256_storeu_si256((__m256i*)g0, _r0);
                _mm256_storeu_si256((__m256i*)(g0 + 16), _r1);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 2), _r2);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 3), _r3);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 4), _r4);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 5), _r5);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 6), _r6);
                _mm256_storeu_si256((__m256i*)(g0 + 16 * 7), _r7);

                k0 += 16;
                k1 += 16;
                k2 += 16;
                k3 += 16;
                k4 += 16;
                k5 += 16;
                k6 += 16;
                k7 += 16;
                g0 += 128;
            }
#endif // __AVX512F__
            for (; p + 7 < num_input; p += 8)
            {
                // transpose 8x8
                __m128i _r0 = _mm256_cvtps_ph(_mm256_loadu_ps(k0), _MM_FROUND_TRUNC);
                __m128i _r1 = _mm256_cvtps_ph(_mm256_loadu_ps(k1), _MM_FROUND_TRUNC);
                __m128i _r2 = _mm256_cvtps_ph(_mm256_loadu_ps(k2), _MM_FROUND_TRUNC);
                __m128i _r3 = _mm256_cvtps_ph(_mm256_loadu_ps(k3), _MM_FROUND_TRUNC);
                __m128i _r4 = _mm256_cvtps_ph(_mm256_loadu_ps(k4), _MM_FROUND_TRUNC);
                __m128i _r5 = _mm256_cvtps_ph(_mm256_loadu_ps(k5), _MM_FROUND_TRUNC);
                __m128i _r6 = _mm256_cvtps_ph(_mm256_loadu_ps(k6), _MM_FROUND_TRUNC);
                __m128i _r7 = _mm256_cvtps_ph(_mm256_loadu_ps(k7), _MM_FROUND_TRUNC);

                __m128i _tmp0 = _mm_unpacklo_epi16(_r0, _r1);
                __m128i _tmp1 = _mm_unpackhi_epi16(_r0, _r1);
                __m128i _tmp2 = _mm_unpacklo_epi16(_r2, _r3);
                __m128i _tmp3 = _mm_unpackhi_epi16(_r2, _r3);
                __m128i _tmp4 = _mm_unpacklo_epi16(_r4, _r5);
                __m128i _tmp5 = _mm_unpackhi_epi16(_r4, _r5);
                __m128i _tmp6 = _mm_unpacklo_epi16(_r6, _r7);
                __m128i _tmp7 = _mm_unpackhi_epi16(_r6, _r7);

                __m128i _tmp8 = _mm_unpacklo_epi32(_tmp0, _tmp2);
                __m128i _tmp9 = _mm_unpackhi_epi32(_tmp0, _tmp2);
                __m128i _tmpa = _mm_unpacklo_epi32(_tmp1, _tmp3);
                __m128i _tmpb = _mm_unpackhi_epi32(_tmp1, _tmp3);
                __m128i _tmpc = _mm_unpacklo_epi32(_tmp4, _tmp6);
                __m128i _tmpd = _mm_unpackhi_epi32(_tmp4, _tmp6);
                __m128i _tmpe = _mm_unpacklo_epi32(_tmp5, _tmp7);
                __m128i _tmpf = _mm_unpackhi_epi32(_tmp5, _tmp7);

                _r0 = _mm_unpacklo_epi64(_tmp8, _tmpc);
                _r1 = _mm_unpackhi_epi64(_tmp8, _tmpc);
                _r2 = _mm_unpacklo_epi64(_tmp9, _tmpd);
                _r3 = _mm_unpackhi_epi64(_tmp9, _tmpd);
                _r4 = _mm_unpacklo_epi64(_tmpa, _tmpe);
                _r5 = _mm_unpackhi_epi64(_tmpa, _tmpe);
                _r6 = _mm_unpacklo_epi64(_tmpb, _tmpf);
                _r7 = _mm_unpackhi_epi64(_tmpb, _tmpf);

                _mm_storeu_si128((__m128i*)g0, _r0);
                _mm_storeu_si128((__m128i*)(g0 + 8), _r1);
                _mm_storeu_si128((__m128i*)(g0 + 16), _r2);
                _mm_storeu_si128((__m128i*)(g0 + 24), _r3);
                _mm_storeu_si128((__m128i*)(g0 + 32), _r4);
                _mm_storeu_si128((__m128i*)(g0 + 40), _r5);
                _mm_storeu_si128((__m128i*)(g0 + 48), _r6);
                _mm_storeu_si128((__m128i*)(g0 + 56), _r7);

                k0 += 8;
                k1 += 8;
                k2 += 8;
                k3 += 8;
                k4 += 8;
                k5 += 8;
                k6 += 8;
                k7 += 8;
                g0 += 64;
            }
            for (; p < num_input; p++)
            {
                g0[0] = float32_to_float16(*k0++);
                g0[1] = float32_to_float16(*k1++);
                g0[2] = float32_to_float16(*k2++);
                g0[3] = float32_to_float16(*k3++);
                g0[4] = float32_to_float16(*k4++);
                g0[5] = float32_to_float16(*k5++);
                g0[6] = float32_to_float16(*k6++);
                g0[7] = float32_to_float16(*k7++);
                g0 += 8;
            }
        }
    }

    if (out_elempack == 4)
    {
        Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

        weight_data_tm.create(num_input, num_output / 4, (size_t)8u, 4);

        for (int q = 0; q + 3 < num_output; q += 4)
        {
            unsigned short* g0 = weight_data_tm.row<unsigned short>(q / 4);

            const float* k0 = weight_data_r2.row(q);
            const float* k1 = weight_data_r2.row(q + 1);
            const float* k2 = weight_data_r2.row(q + 2);
            const float* k3 = weight_data_r2.row(q + 3);

            int p = 0;
            for (; p + 3 < num_input; p += 4)
            {
                // transpose 4x4
                __m128 _r0 = _mm_loadu_ps(k0);
                __m128 _r1 = _mm_loadu_ps(k1);
                __m128 _r2 = _mm_loadu_ps(k2);
                __m128 _r3 = _mm_loadu_ps(k3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                __m256 _r01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_r0), _r1, 1);
                __m256 _r23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_r2), _r3, 1);
                __m128i _r01_fp16 = _mm256_cvtps_ph(_r01, _MM_FROUND_TRUNC);
                __m128i _r23_fp16 = _mm256_cvtps_ph(_r23, _MM_FROUND_TRUNC);
                _mm_storeu_si128((__m128i*)g0, _r01_fp16);
                _mm_storeu_si128((__m128i*)(g0 + 8), _r23_fp16);

                k0 += 4;
                k1 += 4;
                k2 += 4;
                k3 += 4;
                g0 += 16;
            }
            for (; p < num_input; p++)
            {
                g0[0] = float32_to_float16(*k0++);
                g0[1] = float32_to_float16(*k1++);
                g0[2] = float32_to_float16(*k2++);
                g0[3] = float32_to_float16(*k3++);
                g0 += 4;
            }
        }
    }

    if (out_elempack == 1)
    {
        Mat weight_data_r2 = weight_data.reshape(num_input, num_output);
        ncnn::cast_float32_to_float16(weight_data_r2, weight_data_tm, opt);
    }
#else  // __F16C__
    (void)weight_data;
    (void)weight_data_tm;
    (void)num_input;
    (void)num_output;
    (void)opt;
#endif // __F16C__
}